

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8_fp16.h
# Opt level: O0

void ncnn::conv2x2s1_fp16_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  __m256 _v;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 (*pauVar99) [16];
  Mat *in_RCX;
  long in_RSI;
  long in_RDI;
  undefined1 auVar100 [32];
  __m256 _k17_1;
  __m256 _k16_1;
  __m256 _k15_1;
  __m256 _k14_1;
  __m256 _k13_1;
  __m256 _k12_1;
  __m256 _k11_1;
  __m256 _k10_1;
  __m256 _r17_1;
  __m256 _r16_1;
  __m256 _r15_1;
  __m256 _r14_1;
  __m256 _r13_1;
  __m256 _r12_1;
  __m256 _r11_1;
  __m256 _r10_1;
  __m256 _k07_1;
  __m256 _k06_1;
  __m256 _k05_1;
  __m256 _k04_1;
  __m256 _k03_1;
  __m256 _k02_1;
  __m256 _k01_1;
  __m256 _k00_1;
  __m256 _r07_1;
  __m256 _r06_1;
  __m256 _r05_1;
  __m256 _r04_1;
  __m256 _r03_1;
  __m256 _r02_1;
  __m256 _r01_1;
  __m256 _r00_1;
  __m256 _sum;
  __m256 _k17;
  __m256 _k16;
  __m256 _k15;
  __m256 _k14;
  __m256 _k13;
  __m256 _k12;
  __m256 _k11;
  __m256 _k10;
  __m256 _r17;
  __m256 _r16;
  __m256 _r15;
  __m256 _r14;
  __m256 _r13;
  __m256 _r12;
  __m256 _r11;
  __m256 _r10;
  __m256 _k07;
  __m256 _k06;
  __m256 _k05;
  __m256 _k04;
  __m256 _k03;
  __m256 _k02;
  __m256 _k01;
  __m256 _k00;
  __m256 _r07;
  __m256 _r06;
  __m256 _r05;
  __m256 _r04;
  __m256 _r03;
  __m256 _r02;
  __m256 _r01;
  __m256 _r00;
  __m256 _sum1;
  __m256 _sum0;
  int j;
  int i;
  unsigned_short *kptr;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  int q;
  __m256 _bias0;
  Mat out0;
  int p;
  float *bias;
  int outch;
  int outh;
  int outw;
  int inch;
  undefined8 local_8e40;
  undefined8 uStack_8e38;
  undefined8 in_stack_ffffffffffff71d8;
  undefined8 in_stack_ffffffffffff71e0;
  undefined4 in_stack_ffffffffffff71e8;
  int in_stack_ffffffffffff71ec;
  Mat *in_stack_ffffffffffff71f0;
  undefined8 local_8e00;
  undefined8 uStack_8df8;
  Mat *this;
  undefined8 local_8de0;
  undefined8 uStack_8dd8;
  undefined8 local_8dc0;
  undefined8 uStack_8db8;
  undefined8 uStack_8db0;
  undefined8 uStack_8da8;
  undefined8 local_8da0;
  undefined8 uStack_8d98;
  undefined8 uStack_8d90;
  undefined8 uStack_8d88;
  undefined8 local_8d80;
  undefined8 uStack_8d78;
  undefined8 uStack_8d70;
  undefined8 uStack_8d68;
  undefined8 local_8d60;
  undefined8 uStack_8d58;
  undefined8 uStack_8d50;
  undefined8 uStack_8d48;
  undefined8 local_8d40;
  undefined8 uStack_8d38;
  undefined8 local_8d20;
  undefined8 uStack_8d18;
  undefined8 local_8d00;
  undefined8 uStack_8cf8;
  undefined8 local_8ce0;
  undefined8 uStack_8cd8;
  undefined8 local_8cc0;
  undefined8 uStack_8cb8;
  undefined8 uStack_8cb0;
  undefined8 uStack_8ca8;
  undefined8 local_8ca0;
  undefined8 uStack_8c98;
  undefined8 uStack_8c90;
  undefined8 uStack_8c88;
  undefined8 local_8c80;
  undefined8 uStack_8c78;
  undefined8 uStack_8c70;
  undefined8 uStack_8c68;
  undefined8 local_8c60;
  undefined8 uStack_8c58;
  undefined8 uStack_8c50;
  undefined8 uStack_8c48;
  undefined8 local_8b40;
  undefined8 uStack_8b38;
  undefined8 local_8b20;
  undefined8 uStack_8b18;
  undefined8 local_8b00;
  undefined8 uStack_8af8;
  undefined8 local_8ae0;
  undefined8 uStack_8ad8;
  undefined8 local_8ac0;
  undefined8 uStack_8ab8;
  undefined8 uStack_8ab0;
  undefined8 uStack_8aa8;
  undefined8 local_8aa0;
  undefined8 uStack_8a98;
  undefined8 uStack_8a90;
  undefined8 uStack_8a88;
  undefined8 local_8a80;
  undefined8 uStack_8a78;
  undefined8 uStack_8a70;
  undefined8 uStack_8a68;
  undefined8 local_8a60;
  undefined8 uStack_8a58;
  undefined8 uStack_8a50;
  undefined8 uStack_8a48;
  undefined8 local_8a40;
  undefined8 uStack_8a38;
  undefined8 local_8a20;
  undefined8 uStack_8a18;
  undefined8 local_8a00;
  undefined8 uStack_89f8;
  undefined8 local_89e0;
  undefined8 uStack_89d8;
  undefined8 local_89c0;
  undefined8 uStack_89b8;
  undefined8 uStack_89b0;
  undefined8 uStack_89a8;
  undefined8 local_89a0;
  undefined8 uStack_8998;
  undefined8 uStack_8990;
  undefined8 uStack_8988;
  undefined8 local_8980;
  undefined8 uStack_8978;
  undefined8 uStack_8970;
  undefined8 uStack_8968;
  undefined8 local_8960;
  undefined8 uStack_8958;
  undefined8 uStack_8950;
  undefined8 uStack_8948;
  undefined8 local_8840;
  undefined8 uStack_8838;
  undefined8 local_8820;
  undefined8 uStack_8818;
  undefined8 local_8800;
  undefined8 uStack_87f8;
  undefined8 local_87e0;
  undefined8 uStack_87d8;
  undefined8 local_87c0;
  undefined8 uStack_87b8;
  undefined8 uStack_87b0;
  undefined8 uStack_87a8;
  undefined8 local_87a0;
  undefined8 uStack_8798;
  undefined8 uStack_8790;
  undefined8 uStack_8788;
  undefined8 local_8780;
  undefined8 uStack_8778;
  undefined8 uStack_8770;
  undefined8 uStack_8768;
  undefined8 local_8760;
  undefined8 uStack_8758;
  undefined8 uStack_8750;
  undefined8 uStack_8748;
  undefined8 local_8740;
  undefined8 uStack_8738;
  undefined8 local_8720;
  undefined8 uStack_8718;
  undefined8 local_8700;
  undefined8 uStack_86f8;
  undefined8 local_86e0;
  undefined8 uStack_86d8;
  undefined8 local_86c0;
  undefined8 uStack_86b8;
  undefined8 uStack_86b0;
  undefined8 uStack_86a8;
  undefined8 local_86a0;
  undefined8 uStack_8698;
  undefined8 uStack_8690;
  undefined8 uStack_8688;
  undefined8 local_8680;
  undefined8 uStack_8678;
  undefined8 uStack_8670;
  undefined8 uStack_8668;
  undefined8 local_8660;
  undefined8 uStack_8658;
  undefined8 uStack_8650;
  undefined8 uStack_8648;
  undefined8 local_8540;
  undefined8 uStack_8538;
  undefined8 local_8520;
  undefined8 uStack_8518;
  undefined8 local_8500;
  undefined8 uStack_84f8;
  undefined8 local_84e0;
  undefined8 uStack_84d8;
  undefined8 local_84c0;
  undefined8 uStack_84b8;
  undefined8 uStack_84b0;
  undefined8 uStack_84a8;
  undefined8 local_84a0;
  undefined8 uStack_8498;
  undefined8 uStack_8490;
  undefined8 uStack_8488;
  undefined8 local_8480;
  undefined8 uStack_8478;
  undefined8 uStack_8470;
  undefined8 uStack_8468;
  undefined8 local_8460;
  undefined8 uStack_8458;
  undefined8 uStack_8450;
  undefined8 uStack_8448;
  undefined8 local_8440;
  undefined8 uStack_8438;
  undefined8 local_8420;
  undefined8 uStack_8418;
  undefined8 local_8400;
  undefined8 uStack_83f8;
  undefined8 local_83e0;
  undefined8 uStack_83d8;
  undefined8 local_83c0;
  undefined8 uStack_83b8;
  undefined8 uStack_83b0;
  undefined8 uStack_83a8;
  undefined8 local_83a0;
  undefined8 uStack_8398;
  undefined8 uStack_8390;
  undefined8 uStack_8388;
  undefined8 local_8380;
  undefined8 uStack_8378;
  undefined8 uStack_8370;
  undefined8 uStack_8368;
  undefined8 local_8360;
  undefined8 uStack_8358;
  undefined8 uStack_8350;
  undefined8 uStack_8348;
  undefined8 local_8220;
  undefined8 uStack_8218;
  undefined8 local_8200;
  undefined8 uStack_81f8;
  undefined8 local_81e0;
  undefined8 uStack_81d8;
  undefined8 local_81c0;
  undefined8 uStack_81b8;
  undefined8 local_81a0;
  undefined8 uStack_8198;
  undefined8 local_8180;
  undefined8 uStack_8178;
  undefined8 local_8160;
  undefined8 uStack_8158;
  undefined8 local_8140;
  undefined8 uStack_8138;
  undefined8 local_8020;
  undefined8 uStack_8018;
  undefined8 local_8000;
  undefined8 uStack_7ff8;
  undefined8 local_7fe0;
  undefined8 uStack_7fd8;
  undefined8 local_7fc0;
  undefined8 uStack_7fb8;
  undefined8 local_7fa0;
  undefined8 uStack_7f98;
  undefined8 uStack_7f90;
  undefined8 uStack_7f88;
  undefined8 local_7f80;
  undefined8 uStack_7f78;
  undefined8 uStack_7f70;
  undefined8 uStack_7f68;
  undefined8 local_7f60;
  undefined8 uStack_7f58;
  undefined8 uStack_7f50;
  undefined8 uStack_7f48;
  undefined8 local_7f40;
  undefined8 uStack_7f38;
  undefined8 uStack_7f30;
  undefined8 uStack_7f28;
  undefined8 local_7f20;
  undefined8 uStack_7f18;
  undefined8 local_7f00;
  undefined8 uStack_7ef8;
  undefined8 local_7ee0;
  undefined8 uStack_7ed8;
  undefined8 local_7ec0;
  undefined8 uStack_7eb8;
  undefined8 local_7ea0;
  undefined8 uStack_7e98;
  undefined8 uStack_7e90;
  undefined8 uStack_7e88;
  undefined8 local_7e80;
  undefined8 uStack_7e78;
  undefined8 uStack_7e70;
  undefined8 uStack_7e68;
  undefined8 local_7e60;
  undefined8 uStack_7e58;
  undefined8 uStack_7e50;
  undefined8 uStack_7e48;
  undefined8 local_7e40;
  undefined8 uStack_7e38;
  undefined8 uStack_7e30;
  undefined8 uStack_7e28;
  undefined8 local_7e20;
  undefined8 uStack_7e18;
  undefined8 local_7e00;
  undefined8 uStack_7df8;
  undefined8 local_7de0;
  undefined8 uStack_7dd8;
  undefined8 local_7dc0;
  undefined8 uStack_7db8;
  undefined8 local_7da0;
  undefined8 uStack_7d98;
  undefined8 local_7d80;
  undefined8 uStack_7d78;
  undefined8 local_7d60;
  undefined8 uStack_7d58;
  undefined8 local_7d40;
  undefined8 uStack_7d38;
  undefined8 local_7c20;
  undefined8 uStack_7c18;
  undefined8 local_7c00;
  undefined8 uStack_7bf8;
  undefined8 local_7be0;
  undefined8 uStack_7bd8;
  undefined8 local_7bc0;
  undefined8 uStack_7bb8;
  undefined8 local_7ba0;
  undefined8 uStack_7b98;
  undefined8 uStack_7b90;
  undefined8 uStack_7b88;
  undefined8 local_7b80;
  undefined8 uStack_7b78;
  undefined8 uStack_7b70;
  undefined8 uStack_7b68;
  undefined8 local_7b60;
  undefined8 uStack_7b58;
  undefined8 uStack_7b50;
  undefined8 uStack_7b48;
  undefined8 local_7b40;
  undefined8 uStack_7b38;
  undefined8 uStack_7b30;
  undefined8 uStack_7b28;
  undefined8 local_7b20;
  undefined8 uStack_7b18;
  undefined8 local_7b00;
  undefined8 uStack_7af8;
  undefined8 local_7ae0;
  undefined8 uStack_7ad8;
  undefined8 local_7ac0;
  undefined8 uStack_7ab8;
  undefined8 local_7aa0;
  undefined8 uStack_7a98;
  undefined8 uStack_7a90;
  undefined8 uStack_7a88;
  undefined8 local_7a80;
  undefined8 uStack_7a78;
  undefined8 uStack_7a70;
  undefined8 uStack_7a68;
  undefined8 local_7a60;
  undefined8 uStack_7a58;
  undefined8 uStack_7a50;
  undefined8 uStack_7a48;
  undefined8 local_7a40;
  undefined8 uStack_7a38;
  undefined8 uStack_7a30;
  undefined8 uStack_7a28;
  undefined8 local_7920;
  undefined8 uStack_7918;
  undefined8 local_7900;
  undefined8 uStack_78f8;
  undefined8 local_78e0;
  undefined8 uStack_78d8;
  undefined8 local_78c0;
  undefined8 uStack_78b8;
  undefined8 local_78a0;
  undefined8 uStack_7898;
  undefined8 local_7880;
  undefined8 uStack_7878;
  undefined8 local_7860;
  undefined8 uStack_7858;
  undefined8 local_7840;
  undefined8 uStack_7838;
  undefined8 local_7720;
  undefined8 uStack_7718;
  undefined8 local_7700;
  undefined8 uStack_76f8;
  undefined8 local_76e0;
  undefined8 uStack_76d8;
  undefined8 local_76c0;
  undefined8 uStack_76b8;
  undefined8 local_76a0;
  undefined8 uStack_7698;
  undefined8 uStack_7690;
  undefined8 uStack_7688;
  undefined8 local_7680;
  undefined8 uStack_7678;
  undefined8 uStack_7670;
  undefined8 uStack_7668;
  undefined8 local_7660;
  undefined8 uStack_7658;
  undefined8 uStack_7650;
  undefined8 uStack_7648;
  undefined8 local_7640;
  undefined8 uStack_7638;
  undefined8 uStack_7630;
  undefined8 uStack_7628;
  undefined8 local_7620;
  undefined8 uStack_7618;
  undefined8 local_7600;
  undefined8 uStack_75f8;
  undefined8 local_75e0;
  undefined8 uStack_75d8;
  undefined8 local_75c0;
  undefined8 uStack_75b8;
  undefined8 local_75a0;
  undefined8 uStack_7598;
  undefined8 uStack_7590;
  undefined8 uStack_7588;
  undefined8 local_7580;
  undefined8 uStack_7578;
  undefined8 uStack_7570;
  undefined8 uStack_7568;
  undefined8 local_7560;
  undefined8 uStack_7558;
  undefined8 uStack_7550;
  undefined8 uStack_7548;
  undefined8 local_7540;
  undefined8 uStack_7538;
  undefined8 uStack_7530;
  undefined8 uStack_7528;
  undefined8 local_7520;
  undefined8 uStack_7518;
  undefined8 local_7500;
  undefined8 uStack_74f8;
  undefined8 local_74e0;
  undefined8 uStack_74d8;
  undefined8 local_74c0;
  undefined8 uStack_74b8;
  undefined8 local_74a0;
  undefined8 uStack_7498;
  undefined8 local_7480;
  undefined8 uStack_7478;
  undefined8 local_7460;
  undefined8 uStack_7458;
  undefined8 local_7440;
  undefined8 uStack_7438;
  undefined8 local_7320;
  undefined8 uStack_7318;
  undefined8 local_7300;
  undefined8 uStack_72f8;
  undefined8 local_72e0;
  undefined8 uStack_72d8;
  undefined8 local_72c0;
  undefined8 uStack_72b8;
  undefined8 local_72a0;
  undefined8 uStack_7298;
  undefined8 uStack_7290;
  undefined8 uStack_7288;
  undefined8 local_7280;
  undefined8 uStack_7278;
  undefined8 uStack_7270;
  undefined8 uStack_7268;
  undefined8 local_7260;
  undefined8 uStack_7258;
  undefined8 uStack_7250;
  undefined8 uStack_7248;
  undefined8 local_7240;
  undefined8 uStack_7238;
  undefined8 uStack_7230;
  undefined8 uStack_7228;
  undefined8 local_7220;
  undefined8 uStack_7218;
  undefined8 local_7200;
  undefined8 uStack_71f8;
  undefined8 local_71e0;
  undefined8 uStack_71d8;
  undefined8 local_71c0;
  undefined8 uStack_71b8;
  undefined8 local_71a0;
  undefined8 uStack_7198;
  undefined8 uStack_7190;
  undefined8 uStack_7188;
  undefined8 local_7180;
  undefined8 uStack_7178;
  undefined8 uStack_7170;
  undefined8 uStack_7168;
  undefined8 local_7160;
  undefined8 uStack_7158;
  undefined8 uStack_7150;
  undefined8 uStack_7148;
  undefined8 local_7140;
  undefined8 uStack_7138;
  undefined8 uStack_7130;
  undefined8 uStack_7128;
  undefined8 local_6fa0;
  undefined8 uStack_6f98;
  undefined8 uStack_6f90;
  undefined8 uStack_6f88;
  int local_66e8;
  int local_66e4;
  Mat local_66e0;
  undefined1 (*local_6698) [16];
  float *local_6690;
  float *local_6688;
  Mat local_6680;
  undefined1 (*local_6638) [32];
  int local_6630;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 uStack_6610;
  undefined8 uStack_6608;
  Mat local_65f8;
  int local_65ac;
  float *local_65a8;
  int local_65a0;
  int local_659c;
  int local_6598;
  int local_6594;
  undefined4 local_6564;
  undefined1 (*local_6560) [32];
  undefined1 (*local_6558) [32];
  undefined1 (*local_6550) [32];
  float *local_6548;
  float local_6540;
  float fStack_653c;
  float fStack_6538;
  float fStack_6534;
  float fStack_6530;
  float fStack_652c;
  float fStack_6528;
  float fStack_6524;
  float local_650c;
  float *local_6508;
  float local_6500;
  float fStack_64fc;
  float fStack_64f8;
  float fStack_64f4;
  float fStack_64f0;
  float fStack_64ec;
  float fStack_64e8;
  float fStack_64e4;
  float local_64cc;
  float *local_64c8;
  float local_64c0;
  float fStack_64bc;
  float fStack_64b8;
  float fStack_64b4;
  float fStack_64b0;
  float fStack_64ac;
  float fStack_64a8;
  float fStack_64a4;
  float local_648c;
  float *local_6488;
  float local_6480;
  float fStack_647c;
  float fStack_6478;
  float fStack_6474;
  float fStack_6470;
  float fStack_646c;
  float fStack_6468;
  float fStack_6464;
  float local_644c;
  float *local_6448;
  float local_6440;
  float fStack_643c;
  float fStack_6438;
  float fStack_6434;
  float fStack_6430;
  float fStack_642c;
  float fStack_6428;
  float fStack_6424;
  float local_640c;
  float *local_6408;
  float local_6400;
  float fStack_63fc;
  float fStack_63f8;
  float fStack_63f4;
  float fStack_63f0;
  float fStack_63ec;
  float fStack_63e8;
  float fStack_63e4;
  float local_63cc;
  float *local_63c8;
  float local_63c0;
  float fStack_63bc;
  float fStack_63b8;
  float fStack_63b4;
  float fStack_63b0;
  float fStack_63ac;
  float fStack_63a8;
  float fStack_63a4;
  float local_638c;
  float *local_6388;
  float local_6380;
  float fStack_637c;
  float fStack_6378;
  float fStack_6374;
  float fStack_6370;
  float fStack_636c;
  float fStack_6368;
  float fStack_6364;
  float local_634c;
  float *local_6348;
  float local_6340;
  float fStack_633c;
  float fStack_6338;
  float fStack_6334;
  float fStack_6330;
  float fStack_632c;
  float fStack_6328;
  float fStack_6324;
  float local_630c;
  float *local_6308;
  float local_6300;
  float fStack_62fc;
  float fStack_62f8;
  float fStack_62f4;
  float fStack_62f0;
  float fStack_62ec;
  float fStack_62e8;
  float fStack_62e4;
  float local_62cc;
  float *local_62c8;
  float local_62c0;
  float fStack_62bc;
  float fStack_62b8;
  float fStack_62b4;
  float fStack_62b0;
  float fStack_62ac;
  float fStack_62a8;
  float fStack_62a4;
  float local_628c;
  float *local_6288;
  float local_6280;
  float fStack_627c;
  float fStack_6278;
  float fStack_6274;
  float fStack_6270;
  float fStack_626c;
  float fStack_6268;
  float fStack_6264;
  float local_624c;
  float *local_6248;
  float local_6240;
  float fStack_623c;
  float fStack_6238;
  float fStack_6234;
  float fStack_6230;
  float fStack_622c;
  float fStack_6228;
  float fStack_6224;
  float local_620c;
  float *local_6208;
  float local_6200;
  float fStack_61fc;
  float fStack_61f8;
  float fStack_61f4;
  float fStack_61f0;
  float fStack_61ec;
  float fStack_61e8;
  float fStack_61e4;
  float local_61cc;
  float *local_61c8;
  float local_61c0;
  float fStack_61bc;
  float fStack_61b8;
  float fStack_61b4;
  float fStack_61b0;
  float fStack_61ac;
  float fStack_61a8;
  float fStack_61a4;
  float local_618c;
  float *local_6188;
  float local_6180;
  float fStack_617c;
  float fStack_6178;
  float fStack_6174;
  float fStack_6170;
  float fStack_616c;
  float fStack_6168;
  float fStack_6164;
  float local_614c;
  float *local_6148;
  float local_6140;
  float fStack_613c;
  float fStack_6138;
  float fStack_6134;
  float fStack_6130;
  float fStack_612c;
  float fStack_6128;
  float fStack_6124;
  float local_610c;
  float *local_6108;
  float local_6100;
  float fStack_60fc;
  float fStack_60f8;
  float fStack_60f4;
  float fStack_60f0;
  float fStack_60ec;
  float fStack_60e8;
  float fStack_60e4;
  float local_60cc;
  float *local_60c8;
  float local_60c0;
  float fStack_60bc;
  float fStack_60b8;
  float fStack_60b4;
  float fStack_60b0;
  float fStack_60ac;
  float fStack_60a8;
  float fStack_60a4;
  float local_608c;
  float *local_6088;
  float local_6080;
  float fStack_607c;
  float fStack_6078;
  float fStack_6074;
  float fStack_6070;
  float fStack_606c;
  float fStack_6068;
  float fStack_6064;
  float local_604c;
  float *local_6048;
  float local_6040;
  float fStack_603c;
  float fStack_6038;
  float fStack_6034;
  float fStack_6030;
  float fStack_602c;
  float fStack_6028;
  float fStack_6024;
  float local_600c;
  float *local_6008;
  float local_6000;
  float fStack_5ffc;
  float fStack_5ff8;
  float fStack_5ff4;
  float fStack_5ff0;
  float fStack_5fec;
  float fStack_5fe8;
  float fStack_5fe4;
  float local_5fcc;
  float *local_5fc8;
  float local_5fc0;
  float fStack_5fbc;
  float fStack_5fb8;
  float fStack_5fb4;
  float fStack_5fb0;
  float fStack_5fac;
  float fStack_5fa8;
  float fStack_5fa4;
  float local_5f8c;
  float *local_5f88;
  float local_5f80;
  float fStack_5f7c;
  float fStack_5f78;
  float fStack_5f74;
  float fStack_5f70;
  float fStack_5f6c;
  float fStack_5f68;
  float fStack_5f64;
  float local_5f4c;
  float *local_5f48;
  float local_5f40;
  float fStack_5f3c;
  float fStack_5f38;
  float fStack_5f34;
  float fStack_5f30;
  float fStack_5f2c;
  float fStack_5f28;
  float fStack_5f24;
  float local_5f0c;
  float *local_5f08;
  float local_5f00;
  float fStack_5efc;
  float fStack_5ef8;
  float fStack_5ef4;
  float fStack_5ef0;
  float fStack_5eec;
  float fStack_5ee8;
  float fStack_5ee4;
  float local_5ecc;
  float *local_5ec8;
  float local_5ec0;
  float fStack_5ebc;
  float fStack_5eb8;
  float fStack_5eb4;
  float fStack_5eb0;
  float fStack_5eac;
  float fStack_5ea8;
  float fStack_5ea4;
  float local_5e8c;
  float *local_5e88;
  float local_5e80;
  float fStack_5e7c;
  float fStack_5e78;
  float fStack_5e74;
  float fStack_5e70;
  float fStack_5e6c;
  float fStack_5e68;
  float fStack_5e64;
  float local_5e4c;
  float *local_5e48;
  float local_5e40;
  float fStack_5e3c;
  float fStack_5e38;
  float fStack_5e34;
  float fStack_5e30;
  float fStack_5e2c;
  float fStack_5e28;
  float fStack_5e24;
  float local_5e0c;
  float *local_5e08;
  float local_5e00;
  float fStack_5dfc;
  float fStack_5df8;
  float fStack_5df4;
  float fStack_5df0;
  float fStack_5dec;
  float fStack_5de8;
  float fStack_5de4;
  float local_5dcc;
  float *local_5dc8;
  float local_5dc0;
  float fStack_5dbc;
  float fStack_5db8;
  float fStack_5db4;
  float fStack_5db0;
  float fStack_5dac;
  float fStack_5da8;
  float fStack_5da4;
  float local_5d8c;
  float *local_5d88;
  float local_5d80;
  float fStack_5d7c;
  float fStack_5d78;
  float fStack_5d74;
  float fStack_5d70;
  float fStack_5d6c;
  float fStack_5d68;
  float fStack_5d64;
  float local_5d4c;
  float *local_5d48;
  float local_5d40;
  float fStack_5d3c;
  float fStack_5d38;
  float fStack_5d34;
  float fStack_5d30;
  float fStack_5d2c;
  float fStack_5d28;
  float fStack_5d24;
  float local_5d0c;
  float *local_5d08;
  float local_5d00;
  float fStack_5cfc;
  float fStack_5cf8;
  float fStack_5cf4;
  float fStack_5cf0;
  float fStack_5cec;
  float fStack_5ce8;
  float fStack_5ce4;
  float local_5ccc;
  float *local_5cc8;
  float local_5cc0;
  float fStack_5cbc;
  float fStack_5cb8;
  float fStack_5cb4;
  float fStack_5cb0;
  float fStack_5cac;
  float fStack_5ca8;
  float fStack_5ca4;
  float local_5c8c;
  float *local_5c88;
  float local_5c80;
  float fStack_5c7c;
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  float local_5c4c;
  float *local_5c48;
  float local_5c40;
  float fStack_5c3c;
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  float local_5c0c;
  float *local_5c08;
  float local_5c00;
  float fStack_5bfc;
  float fStack_5bf8;
  float fStack_5bf4;
  float fStack_5bf0;
  float fStack_5bec;
  float fStack_5be8;
  float fStack_5be4;
  float local_5bcc;
  float *local_5bc8;
  float local_5bc0;
  float fStack_5bbc;
  float fStack_5bb8;
  float fStack_5bb4;
  float fStack_5bb0;
  float fStack_5bac;
  float fStack_5ba8;
  float fStack_5ba4;
  float local_5b8c;
  float *local_5b88;
  float local_5b80;
  float fStack_5b7c;
  float fStack_5b78;
  float fStack_5b74;
  float fStack_5b70;
  float fStack_5b6c;
  float fStack_5b68;
  float fStack_5b64;
  float local_5b4c;
  float *local_5b48;
  float local_5b40;
  float fStack_5b3c;
  float fStack_5b38;
  float fStack_5b34;
  float fStack_5b30;
  float fStack_5b2c;
  float fStack_5b28;
  float fStack_5b24;
  float local_5b0c;
  float *local_5b08;
  float local_5b00;
  float fStack_5afc;
  float fStack_5af8;
  float fStack_5af4;
  float fStack_5af0;
  float fStack_5aec;
  float fStack_5ae8;
  float fStack_5ae4;
  float local_5acc;
  float *local_5ac8;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5a8c;
  float *local_5a88;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a4c;
  float *local_5a48;
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a0c;
  float *local_5a08;
  float local_5a00;
  float fStack_59fc;
  float fStack_59f8;
  float fStack_59f4;
  float fStack_59f0;
  float fStack_59ec;
  float fStack_59e8;
  float fStack_59e4;
  float local_59cc;
  float *local_59c8;
  float local_59c0;
  float fStack_59bc;
  float fStack_59b8;
  float fStack_59b4;
  float fStack_59b0;
  float fStack_59ac;
  float fStack_59a8;
  float fStack_59a4;
  float local_598c;
  float *local_5988;
  float local_5980;
  float fStack_597c;
  float fStack_5978;
  float fStack_5974;
  float fStack_5970;
  float fStack_596c;
  float fStack_5968;
  float fStack_5964;
  float local_594c;
  float *local_5948;
  float local_5940;
  float fStack_593c;
  float fStack_5938;
  float fStack_5934;
  float fStack_5930;
  float fStack_592c;
  float fStack_5928;
  float fStack_5924;
  float local_590c;
  float *local_5908;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  float fStack_58e4;
  float local_58cc;
  float *local_58c8;
  float local_58c0;
  float fStack_58bc;
  float fStack_58b8;
  float fStack_58b4;
  float fStack_58b0;
  float fStack_58ac;
  float fStack_58a8;
  float fStack_58a4;
  float local_588c;
  float *local_5888;
  float local_5880;
  float fStack_587c;
  float fStack_5878;
  float fStack_5874;
  float fStack_5870;
  float fStack_586c;
  float fStack_5868;
  float fStack_5864;
  float local_584c;
  float *local_5848;
  float local_5840;
  float fStack_583c;
  float fStack_5838;
  float fStack_5834;
  float fStack_5830;
  float fStack_582c;
  float fStack_5828;
  float fStack_5824;
  float local_580c;
  float *local_5808;
  float local_5800;
  float fStack_57fc;
  float fStack_57f8;
  float fStack_57f4;
  float fStack_57f0;
  float fStack_57ec;
  float fStack_57e8;
  float fStack_57e4;
  float local_57cc;
  float *local_57c8;
  float local_57c0;
  float fStack_57bc;
  float fStack_57b8;
  float fStack_57b4;
  float fStack_57b0;
  float fStack_57ac;
  float fStack_57a8;
  float fStack_57a4;
  float local_578c;
  float *local_5788;
  float local_5780;
  float fStack_577c;
  float fStack_5778;
  float fStack_5774;
  float fStack_5770;
  float fStack_576c;
  float fStack_5768;
  float fStack_5764;
  float local_574c;
  float *local_5748;
  float local_5740;
  float fStack_573c;
  float fStack_5738;
  float fStack_5734;
  float fStack_5730;
  float fStack_572c;
  float fStack_5728;
  float fStack_5724;
  float local_570c;
  float *local_5708;
  float local_5700;
  float fStack_56fc;
  float fStack_56f8;
  float fStack_56f4;
  float fStack_56f0;
  float fStack_56ec;
  float fStack_56e8;
  float fStack_56e4;
  float local_56cc;
  float *local_56c8;
  float local_56c0;
  float fStack_56bc;
  float fStack_56b8;
  float fStack_56b4;
  float fStack_56b0;
  float fStack_56ac;
  float fStack_56a8;
  float fStack_56a4;
  float local_568c;
  float *local_5688;
  float local_5680;
  float fStack_567c;
  float fStack_5678;
  float fStack_5674;
  float fStack_5670;
  float fStack_566c;
  float fStack_5668;
  float fStack_5664;
  float local_564c;
  float *local_5648;
  float local_5640;
  float fStack_563c;
  float fStack_5638;
  float fStack_5634;
  float fStack_5630;
  float fStack_562c;
  float fStack_5628;
  float fStack_5624;
  float local_560c;
  float *local_5608;
  float local_5600;
  float fStack_55fc;
  float fStack_55f8;
  float fStack_55f4;
  float fStack_55f0;
  float fStack_55ec;
  float fStack_55e8;
  float fStack_55e4;
  float local_55cc;
  float *local_55c8;
  float local_55c0;
  float fStack_55bc;
  float fStack_55b8;
  float fStack_55b4;
  float fStack_55b0;
  float fStack_55ac;
  float fStack_55a8;
  float fStack_55a4;
  float local_558c;
  float *local_5588;
  float local_5580;
  float fStack_557c;
  float fStack_5578;
  float fStack_5574;
  float fStack_5570;
  float fStack_556c;
  float fStack_5568;
  float fStack_5564;
  float local_554c;
  float *local_5548;
  float local_5540;
  float fStack_553c;
  float fStack_5538;
  float fStack_5534;
  float fStack_5530;
  float fStack_552c;
  float fStack_5528;
  float fStack_5524;
  float local_550c;
  float *local_5508;
  float local_5500;
  float fStack_54fc;
  float fStack_54f8;
  float fStack_54f4;
  float fStack_54f0;
  float fStack_54ec;
  float fStack_54e8;
  float fStack_54e4;
  float local_54cc;
  float *local_54c8;
  float local_54c0;
  float fStack_54bc;
  float fStack_54b8;
  float fStack_54b4;
  float fStack_54b0;
  float fStack_54ac;
  float fStack_54a8;
  float fStack_54a4;
  float local_548c;
  float *local_5488;
  float local_5480;
  float fStack_547c;
  float fStack_5478;
  float fStack_5474;
  float fStack_5470;
  float fStack_546c;
  float fStack_5468;
  float fStack_5464;
  float local_544c;
  float *local_5448;
  float local_5440;
  float fStack_543c;
  float fStack_5438;
  float fStack_5434;
  float fStack_5430;
  float fStack_542c;
  float fStack_5428;
  float fStack_5424;
  float local_540c;
  float *local_5408;
  float local_5400;
  float fStack_53fc;
  float fStack_53f8;
  float fStack_53f4;
  float fStack_53f0;
  float fStack_53ec;
  float fStack_53e8;
  float fStack_53e4;
  float local_53cc;
  float *local_53c8;
  float local_53c0;
  float fStack_53bc;
  float fStack_53b8;
  float fStack_53b4;
  float fStack_53b0;
  float fStack_53ac;
  float fStack_53a8;
  float fStack_53a4;
  float local_538c;
  float *local_5388;
  float local_5380;
  float fStack_537c;
  float fStack_5378;
  float fStack_5374;
  float fStack_5370;
  float fStack_536c;
  float fStack_5368;
  float fStack_5364;
  float local_534c;
  float *local_5348;
  float local_5340;
  float fStack_533c;
  float fStack_5338;
  float fStack_5334;
  float fStack_5330;
  float fStack_532c;
  float fStack_5328;
  float fStack_5324;
  float local_530c;
  float *local_5308;
  float local_5300;
  float fStack_52fc;
  float fStack_52f8;
  float fStack_52f4;
  float fStack_52f0;
  float fStack_52ec;
  float fStack_52e8;
  float fStack_52e4;
  float local_52cc;
  float *local_52c8;
  float local_52c0;
  float fStack_52bc;
  float fStack_52b8;
  float fStack_52b4;
  float fStack_52b0;
  float fStack_52ac;
  float fStack_52a8;
  float fStack_52a4;
  float local_528c;
  float *local_5288;
  float local_5280;
  float fStack_527c;
  float fStack_5278;
  float fStack_5274;
  float fStack_5270;
  float fStack_526c;
  float fStack_5268;
  float fStack_5264;
  float local_524c;
  float *local_5248;
  float local_5240;
  float fStack_523c;
  float fStack_5238;
  float fStack_5234;
  float fStack_5230;
  float fStack_522c;
  float fStack_5228;
  float fStack_5224;
  float local_520c;
  float *local_5208;
  float local_5200;
  float fStack_51fc;
  float fStack_51f8;
  float fStack_51f4;
  float fStack_51f0;
  float fStack_51ec;
  float fStack_51e8;
  float fStack_51e4;
  float local_51cc;
  float *local_51c8;
  float local_51c0;
  float fStack_51bc;
  float fStack_51b8;
  float fStack_51b4;
  float fStack_51b0;
  float fStack_51ac;
  float fStack_51a8;
  float fStack_51a4;
  float local_518c;
  float *local_5188;
  float local_5180;
  float fStack_517c;
  float fStack_5178;
  float fStack_5174;
  float fStack_5170;
  float fStack_516c;
  float fStack_5168;
  float fStack_5164;
  float local_514c;
  float *local_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined1 (*local_5108) [32];
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined1 (*local_50c8) [32];
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined1 (*local_5088) [32];
  undefined8 local_5080;
  undefined8 uStack_5078;
  undefined8 uStack_5070;
  undefined8 uStack_5068;
  undefined8 local_5060;
  undefined8 uStack_5058;
  undefined8 uStack_5050;
  undefined8 uStack_5048;
  undefined8 local_5040;
  undefined8 uStack_5038;
  undefined8 uStack_5030;
  undefined8 uStack_5028;
  undefined8 local_5020;
  undefined8 uStack_5018;
  undefined8 uStack_5010;
  undefined8 uStack_5008;
  undefined8 local_5000;
  undefined8 uStack_4ff8;
  undefined8 uStack_4ff0;
  undefined8 uStack_4fe8;
  undefined8 local_4fe0;
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined8 local_4fc0;
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined8 local_4fa0;
  undefined8 uStack_4f98;
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  undefined8 local_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 local_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 local_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 local_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined8 local_47a0;
  undefined8 uStack_4798;
  undefined8 uStack_4790;
  undefined8 uStack_4788;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 local_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 local_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 local_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined8 local_4560;
  undefined8 uStack_4558;
  undefined8 uStack_4550;
  undefined8 uStack_4548;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 local_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined8 local_4480;
  undefined8 uStack_4478;
  undefined8 uStack_4470;
  undefined8 uStack_4468;
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 local_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 local_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined8 local_4300;
  undefined8 uStack_42f8;
  undefined8 uStack_42f0;
  undefined8 uStack_42e8;
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 local_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 local_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 local_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined8 local_3cc0;
  undefined8 uStack_3cb8;
  undefined8 uStack_3cb0;
  undefined8 uStack_3ca8;
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c60;
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined8 local_3000;
  undefined8 uStack_2ff8;
  undefined8 uStack_2ff0;
  undefined8 uStack_2fe8;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined1 (*local_2c80) [16];
  undefined1 (*local_2c78) [16];
  undefined1 (*local_2c70) [16];
  undefined1 (*local_2c68) [16];
  undefined1 (*local_2c60) [16];
  undefined1 (*local_2c58) [16];
  undefined1 (*local_2c50) [16];
  undefined1 (*local_2c48) [16];
  undefined1 (*local_2c40) [16];
  undefined1 (*local_2c38) [16];
  undefined1 (*local_2c30) [16];
  undefined1 (*local_2c28) [16];
  undefined1 (*local_2c20) [16];
  undefined1 (*local_2c18) [16];
  undefined1 (*local_2c10) [16];
  undefined1 (*local_2c08) [16];
  undefined1 (*local_2c00) [16];
  undefined1 (*local_2bf8) [16];
  undefined1 (*local_2bf0) [16];
  undefined1 (*local_2be8) [16];
  undefined1 (*local_2be0) [16];
  undefined1 (*local_2bd8) [16];
  undefined1 (*local_2bd0) [16];
  undefined1 (*local_2bc8) [16];
  undefined1 (*local_2bc0) [16];
  undefined1 (*local_2bb8) [16];
  undefined1 (*local_2bb0) [16];
  undefined1 (*local_2ba8) [16];
  undefined1 (*local_2ba0) [16];
  undefined1 (*local_2b98) [16];
  undefined1 (*local_2b90) [16];
  undefined1 (*local_2b88) [16];
  undefined1 (*local_2b80) [16];
  undefined1 (*local_2b78) [16];
  undefined1 (*local_2b70) [16];
  undefined1 (*local_2b68) [16];
  undefined1 (*local_2b60) [16];
  undefined1 (*local_2b58) [16];
  undefined1 (*local_2b50) [16];
  undefined1 (*local_2b48) [16];
  undefined1 (*local_2b40) [16];
  undefined1 (*local_2b38) [16];
  undefined1 (*local_2b30) [16];
  undefined1 (*local_2b28) [16];
  undefined1 (*local_2b20) [16];
  undefined1 (*local_2b18) [16];
  undefined1 (*local_2b10) [16];
  undefined1 (*local_2b08) [16];
  undefined1 (*local_2b00) [16];
  undefined1 (*local_2af8) [16];
  undefined1 (*local_2af0) [16];
  undefined1 (*local_2ae8) [16];
  undefined1 (*local_2ae0) [16];
  undefined1 (*local_2ad8) [16];
  undefined1 (*local_2ad0) [16];
  undefined1 (*local_2ac8) [16];
  undefined1 (*local_2ac0) [16];
  undefined1 (*local_2ab8) [16];
  undefined1 (*local_2ab0) [16];
  undefined1 (*local_2aa8) [16];
  undefined1 (*local_2aa0) [16];
  undefined1 (*local_2a98) [16];
  undefined1 (*local_2a90) [16];
  undefined1 (*local_2a88) [16];
  undefined1 local_2a80 [16];
  undefined1 local_2a70 [16];
  undefined1 local_2a60 [16];
  undefined1 local_2a50 [16];
  undefined1 local_2a40 [16];
  undefined1 local_2a30 [16];
  undefined1 local_2a20 [16];
  undefined1 local_2a10 [16];
  undefined1 local_2a00 [16];
  undefined1 local_29f0 [16];
  undefined1 local_29e0 [16];
  undefined1 local_29d0 [16];
  undefined1 local_29c0 [16];
  undefined1 local_29b0 [16];
  undefined1 local_29a0 [16];
  undefined1 local_2990 [16];
  undefined1 local_2980 [16];
  undefined1 local_2970 [16];
  undefined1 local_2960 [16];
  undefined1 local_2950 [16];
  undefined1 local_2940 [16];
  undefined1 local_2930 [16];
  undefined1 local_2920 [16];
  undefined1 local_2910 [16];
  undefined1 local_2900 [16];
  undefined1 local_28f0 [16];
  undefined1 local_28e0 [16];
  undefined1 local_28d0 [16];
  undefined1 local_28c0 [16];
  undefined1 local_28b0 [16];
  undefined1 local_28a0 [16];
  undefined1 local_2890 [16];
  undefined1 local_2880 [16];
  undefined1 local_2870 [16];
  undefined1 local_2860 [16];
  undefined1 local_2850 [16];
  undefined1 local_2840 [16];
  undefined1 local_2830 [16];
  undefined1 local_2820 [16];
  undefined1 local_2810 [16];
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [16];
  undefined1 local_27d0 [16];
  undefined1 local_27c0 [16];
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [16];
  undefined1 local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  undefined1 local_2760 [16];
  undefined1 local_2750 [16];
  undefined1 local_2740 [16];
  undefined1 local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined1 local_26f0 [16];
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  undefined1 local_26c0 [16];
  undefined1 local_26b0 [16];
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined1 (*local_2680) [16];
  undefined1 (*local_2678) [16];
  undefined1 (*local_2670) [16];
  undefined1 (*local_2668) [16];
  undefined1 (*local_2660) [16];
  undefined1 (*local_2658) [16];
  undefined1 (*local_2650) [16];
  undefined1 (*local_2648) [16];
  undefined1 (*local_2640) [16];
  undefined1 (*local_2638) [16];
  undefined1 (*local_2630) [16];
  undefined1 (*local_2628) [16];
  undefined1 (*local_2620) [16];
  undefined1 (*local_2618) [16];
  undefined1 (*local_2610) [16];
  undefined1 (*local_2608) [16];
  undefined1 (*local_2600) [16];
  undefined1 (*local_25f8) [16];
  undefined1 (*local_25f0) [16];
  undefined1 (*local_25e8) [16];
  undefined1 (*local_25e0) [16];
  undefined1 (*local_25d8) [16];
  undefined1 (*local_25d0) [16];
  undefined1 (*local_25c8) [16];
  undefined1 (*local_25c0) [16];
  undefined1 (*local_25b8) [16];
  undefined1 (*local_25b0) [16];
  undefined1 (*local_25a8) [16];
  undefined1 (*local_25a0) [16];
  undefined1 (*local_2598) [16];
  undefined1 (*local_2590) [16];
  undefined1 (*local_2588) [16];
  undefined1 (*local_2580) [16];
  undefined1 (*local_2578) [16];
  undefined1 (*local_2570) [16];
  undefined1 (*local_2568) [16];
  undefined1 (*local_2560) [16];
  undefined1 (*local_2558) [16];
  undefined1 (*local_2550) [16];
  undefined1 (*local_2548) [16];
  undefined1 (*local_2540) [16];
  undefined1 (*local_2538) [16];
  undefined1 (*local_2530) [16];
  undefined1 (*local_2528) [16];
  undefined1 (*local_2520) [16];
  undefined1 (*local_2518) [16];
  undefined1 (*local_2510) [16];
  undefined1 (*local_2508) [16];
  undefined1 (*local_2500) [16];
  undefined1 (*local_24f8) [16];
  undefined1 (*local_24f0) [16];
  undefined1 (*local_24e8) [16];
  undefined1 (*local_24e0) [16];
  undefined1 (*local_24d8) [16];
  undefined1 (*local_24d0) [16];
  undefined1 (*local_24c8) [16];
  undefined1 (*local_24c0) [16];
  undefined1 (*local_24b8) [16];
  undefined1 (*local_24b0) [16];
  undefined1 (*local_24a8) [16];
  undefined1 (*local_24a0) [16];
  undefined1 (*local_2498) [16];
  undefined1 (*local_2490) [16];
  undefined1 (*local_2488) [16];
  undefined1 local_2480 [32];
  undefined4 local_2460;
  undefined4 local_245c;
  undefined4 local_2458;
  undefined4 local_2454;
  undefined4 local_2450;
  undefined4 local_244c;
  undefined4 local_2448;
  undefined4 local_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_6594 = *(int *)(in_RDI + 0x38);
  local_6598 = *(int *)(in_RSI + 0x2c);
  local_659c = *(int *)(in_RSI + 0x30);
  local_65a0 = *(int *)(in_RSI + 0x38);
  local_65a8 = Mat::operator_cast_to_float_(in_RCX);
  for (local_65ac = 0; local_65ac < local_65a0; local_65ac = local_65ac + 1) {
    Mat::channel(in_stack_ffffffffffff71f0,in_stack_ffffffffffff71ec);
    if (local_65a8 == (float *)0x0) {
      local_6564 = 0;
      local_2444 = 0;
      local_2448 = 0;
      local_244c = 0;
      local_2450 = 0;
      local_2454 = 0;
      local_2458 = 0;
      local_245c = 0;
      local_2460 = 0;
      auVar8 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0),0x30);
      auVar100._16_16_ = auVar8;
      auVar100._0_16_ = auVar9;
      local_2480._0_8_ = auVar9._0_8_;
      local_2480._8_8_ = auVar9._8_8_;
      local_2480._16_8_ = auVar8._0_8_;
      local_2480._24_8_ = auVar8._8_8_;
      local_6fa0 = local_2480._0_8_;
      uStack_6f98 = local_2480._8_8_;
      uStack_6f90 = local_2480._16_8_;
      uStack_6f88 = local_2480._24_8_;
      local_2480 = auVar100;
    }
    else {
      local_6548 = local_65a8 + (local_65ac << 3);
      local_6fa0 = *(undefined8 *)local_6548;
      uStack_6f98 = *(undefined8 *)(local_6548 + 2);
      uStack_6f90 = *(undefined8 *)(local_6548 + 4);
      uStack_6f88 = *(undefined8 *)(local_6548 + 6);
    }
    local_6620 = local_6fa0;
    uStack_6618 = uStack_6f98;
    uStack_6610 = uStack_6f90;
    uStack_6608 = uStack_6f88;
    _v[2] = (float)(int)in_stack_ffffffffffff71e0;
    _v[3] = (float)(int)((ulong)in_stack_ffffffffffff71e0 >> 0x20);
    _v[0] = (float)(int)in_stack_ffffffffffff71d8;
    _v[1] = (float)(int)((ulong)in_stack_ffffffffffff71d8 >> 0x20);
    _v[4] = (float)in_stack_ffffffffffff71e8;
    _v[5] = (float)in_stack_ffffffffffff71ec;
    _v._24_8_ = in_stack_ffffffffffff71f0;
    Mat::fill(this,_v);
    for (local_6630 = 0; local_6630 < local_6594; local_6630 = local_6630 + 1) {
      local_6638 = (undefined1 (*) [32])Mat::row(&local_65f8,0);
      Mat::channel(in_stack_ffffffffffff71f0,in_stack_ffffffffffff71ec);
      local_6688 = Mat::row(&local_6680,0);
      local_6690 = Mat::row(&local_6680,1);
      Mat::channel(in_stack_ffffffffffff71f0,in_stack_ffffffffffff71ec);
      pauVar99 = (undefined1 (*) [16])Mat::row(&local_66e0,local_6630);
      Mat::~Mat((Mat *)0x24d623);
      for (local_66e4 = 0; local_66e4 < local_659c; local_66e4 = local_66e4 + 1) {
        for (local_66e8 = 0; auVar100 = _local_8e00, local_66e8 + 1 < local_6598;
            local_66e8 = local_66e8 + 2) {
          local_6550 = local_6638;
          local_2ce0 = *(undefined8 *)*local_6638;
          uStack_2cd8 = *(undefined8 *)(*local_6638 + 8);
          uStack_2cd0 = *(undefined8 *)(*local_6638 + 0x10);
          uStack_2cc8 = *(undefined8 *)(*local_6638 + 0x18);
          local_6558 = local_6638 + 1;
          local_2fe0 = *(undefined8 *)*local_6558;
          uStack_2fd8 = *(undefined8 *)(local_6638[1] + 8);
          uStack_2fd0 = *(undefined8 *)(local_6638[1] + 0x10);
          uStack_2fc8 = *(undefined8 *)(local_6638[1] + 0x18);
          local_5148 = local_6688;
          local_5180 = *local_6688;
          local_2cc0 = CONCAT44(local_5180,local_5180);
          uStack_2cb8 = CONCAT44(local_5180,local_5180);
          uStack_2cb0 = CONCAT44(local_5180,local_5180);
          uStack_2ca8 = CONCAT44(local_5180,local_5180);
          local_5188 = local_6688 + 1;
          local_51c0 = *local_5188;
          local_2d20 = CONCAT44(local_51c0,local_51c0);
          uStack_2d18 = CONCAT44(local_51c0,local_51c0);
          uStack_2d10 = CONCAT44(local_51c0,local_51c0);
          uStack_2d08 = CONCAT44(local_51c0,local_51c0);
          local_51c8 = local_6688 + 2;
          local_5200 = *local_51c8;
          local_2d80 = CONCAT44(local_5200,local_5200);
          uStack_2d78 = CONCAT44(local_5200,local_5200);
          uStack_2d70 = CONCAT44(local_5200,local_5200);
          uStack_2d68 = CONCAT44(local_5200,local_5200);
          local_5208 = local_6688 + 3;
          local_5240 = *local_5208;
          local_2de0 = CONCAT44(local_5240,local_5240);
          uStack_2dd8 = CONCAT44(local_5240,local_5240);
          uStack_2dd0 = CONCAT44(local_5240,local_5240);
          uStack_2dc8 = CONCAT44(local_5240,local_5240);
          local_5248 = local_6688 + 4;
          local_5280 = *local_5248;
          local_2e40 = CONCAT44(local_5280,local_5280);
          uStack_2e38 = CONCAT44(local_5280,local_5280);
          uStack_2e30 = CONCAT44(local_5280,local_5280);
          uStack_2e28 = CONCAT44(local_5280,local_5280);
          local_5288 = local_6688 + 5;
          local_52c0 = *local_5288;
          local_2ea0 = CONCAT44(local_52c0,local_52c0);
          uStack_2e98 = CONCAT44(local_52c0,local_52c0);
          uStack_2e90 = CONCAT44(local_52c0,local_52c0);
          uStack_2e88 = CONCAT44(local_52c0,local_52c0);
          local_52c8 = local_6688 + 6;
          local_5300 = *local_52c8;
          local_2f00 = CONCAT44(local_5300,local_5300);
          uStack_2ef8 = CONCAT44(local_5300,local_5300);
          uStack_2ef0 = CONCAT44(local_5300,local_5300);
          uStack_2ee8 = CONCAT44(local_5300,local_5300);
          local_5308 = local_6688 + 7;
          local_5340 = *local_5308;
          local_2f60 = CONCAT44(local_5340,local_5340);
          uStack_2f58 = CONCAT44(local_5340,local_5340);
          uStack_2f50 = CONCAT44(local_5340,local_5340);
          uStack_2f48 = CONCAT44(local_5340,local_5340);
          local_5348 = local_6688 + 8;
          local_2a80 = vlddqu_avx(*pauVar99);
          auVar100 = vcvtph2ps_f16c(local_2a80);
          local_7140 = auVar100._0_8_;
          uStack_7138 = auVar100._8_8_;
          uStack_7130 = auVar100._16_8_;
          uStack_7128 = auVar100._24_8_;
          local_2a90 = pauVar99 + 1;
          local_2a70 = vlddqu_avx(*local_2a90);
          auVar1 = vcvtph2ps_f16c(local_2a70);
          local_7160 = auVar1._0_8_;
          uStack_7158 = auVar1._8_8_;
          uStack_7150 = auVar1._16_8_;
          uStack_7148 = auVar1._24_8_;
          local_2a98 = pauVar99 + 2;
          local_2a60 = vlddqu_avx(*local_2a98);
          auVar2 = vcvtph2ps_f16c(local_2a60);
          local_7180 = auVar2._0_8_;
          uStack_7178 = auVar2._8_8_;
          uStack_7170 = auVar2._16_8_;
          uStack_7168 = auVar2._24_8_;
          local_2aa0 = pauVar99 + 3;
          local_2a50 = vlddqu_avx(*local_2aa0);
          auVar3 = vcvtph2ps_f16c(local_2a50);
          local_71a0 = auVar3._0_8_;
          uStack_7198 = auVar3._8_8_;
          uStack_7190 = auVar3._16_8_;
          uStack_7188 = auVar3._24_8_;
          local_2aa8 = pauVar99 + 4;
          local_2ca0 = local_7140;
          uStack_2c98 = uStack_7138;
          uStack_2c90 = uStack_7130;
          uStack_2c88 = uStack_7128;
          local_2400 = local_7140;
          uStack_23f8 = uStack_7138;
          uStack_23f0 = uStack_7130;
          uStack_23e8 = uStack_7128;
          auVar4._8_8_ = uStack_2cb8;
          auVar4._0_8_ = local_2cc0;
          auVar4._16_8_ = uStack_2cb0;
          auVar4._24_8_ = uStack_2ca8;
          auVar8 = vfmadd213ps_fma(auVar4,auVar100,*local_6638);
          local_71c0 = auVar8._0_8_;
          uStack_71b8 = auVar8._8_8_;
          local_2d00 = local_7160;
          uStack_2cf8 = uStack_7158;
          uStack_2cf0 = uStack_7150;
          uStack_2ce8 = uStack_7148;
          local_2d40 = local_71c0;
          uStack_2d38 = uStack_71b8;
          uStack_2d30 = 0;
          uStack_2d28 = 0;
          local_23a0 = local_7160;
          uStack_2398 = uStack_7158;
          uStack_2390 = uStack_7150;
          uStack_2388 = uStack_7148;
          local_23e0 = local_71c0;
          uStack_23d8 = uStack_71b8;
          uStack_23d0 = 0;
          uStack_23c8 = 0;
          auVar5._8_8_ = uStack_2d18;
          auVar5._0_8_ = local_2d20;
          auVar5._16_8_ = uStack_2d10;
          auVar5._24_8_ = uStack_2d08;
          auVar8 = vfmadd213ps_fma(auVar5,auVar1,ZEXT1632(auVar8));
          local_71e0 = auVar8._0_8_;
          uStack_71d8 = auVar8._8_8_;
          local_2d60 = local_7180;
          uStack_2d58 = uStack_7178;
          uStack_2d50 = uStack_7170;
          uStack_2d48 = uStack_7168;
          local_2da0 = local_71e0;
          uStack_2d98 = uStack_71d8;
          uStack_2d90 = 0;
          uStack_2d88 = 0;
          local_2340 = local_7180;
          uStack_2338 = uStack_7178;
          uStack_2330 = uStack_7170;
          uStack_2328 = uStack_7168;
          local_2380 = local_71e0;
          uStack_2378 = uStack_71d8;
          uStack_2370 = 0;
          uStack_2368 = 0;
          auVar6._8_8_ = uStack_2d78;
          auVar6._0_8_ = local_2d80;
          auVar6._16_8_ = uStack_2d70;
          auVar6._24_8_ = uStack_2d68;
          auVar8 = vfmadd213ps_fma(auVar6,auVar2,ZEXT1632(auVar8));
          local_7200 = auVar8._0_8_;
          uStack_71f8 = auVar8._8_8_;
          local_2dc0 = local_71a0;
          uStack_2db8 = uStack_7198;
          uStack_2db0 = uStack_7190;
          uStack_2da8 = uStack_7188;
          local_2e00 = local_7200;
          uStack_2df8 = uStack_71f8;
          uStack_2df0 = 0;
          uStack_2de8 = 0;
          local_22e0 = local_71a0;
          uStack_22d8 = uStack_7198;
          uStack_22d0 = uStack_7190;
          uStack_22c8 = uStack_7188;
          local_2320 = local_7200;
          uStack_2318 = uStack_71f8;
          uStack_2310 = 0;
          uStack_2308 = 0;
          auVar7._8_8_ = uStack_2dd8;
          auVar7._0_8_ = local_2de0;
          auVar7._16_8_ = uStack_2dd0;
          auVar7._24_8_ = uStack_2dc8;
          auVar8 = vfmadd213ps_fma(auVar7,auVar3,ZEXT1632(auVar8));
          local_7220 = auVar8._0_8_;
          uStack_7218 = auVar8._8_8_;
          local_2a40 = vlddqu_avx(*local_2aa8);
          auVar4 = vcvtph2ps_f16c(local_2a40);
          local_7240 = auVar4._0_8_;
          uStack_7238 = auVar4._8_8_;
          uStack_7230 = auVar4._16_8_;
          uStack_7228 = auVar4._24_8_;
          local_2ab0 = pauVar99 + 5;
          local_2a30 = vlddqu_avx(*local_2ab0);
          auVar5 = vcvtph2ps_f16c(local_2a30);
          local_7260 = auVar5._0_8_;
          uStack_7258 = auVar5._8_8_;
          uStack_7250 = auVar5._16_8_;
          uStack_7248 = auVar5._24_8_;
          local_2ab8 = pauVar99 + 6;
          local_2a20 = vlddqu_avx(*local_2ab8);
          auVar6 = vcvtph2ps_f16c(local_2a20);
          local_7280 = auVar6._0_8_;
          uStack_7278 = auVar6._8_8_;
          uStack_7270 = auVar6._16_8_;
          uStack_7268 = auVar6._24_8_;
          local_2ac0 = pauVar99 + 7;
          local_2a10 = vlddqu_avx(*local_2ac0);
          auVar7 = vcvtph2ps_f16c(local_2a10);
          local_72a0 = auVar7._0_8_;
          uStack_7298 = auVar7._8_8_;
          uStack_7290 = auVar7._16_8_;
          uStack_7288 = auVar7._24_8_;
          local_2ac8 = pauVar99 + 8;
          local_2e20 = local_7240;
          uStack_2e18 = uStack_7238;
          uStack_2e10 = uStack_7230;
          uStack_2e08 = uStack_7228;
          local_2e60 = local_7220;
          uStack_2e58 = uStack_7218;
          uStack_2e50 = 0;
          uStack_2e48 = 0;
          local_2280 = local_7240;
          uStack_2278 = uStack_7238;
          uStack_2270 = uStack_7230;
          uStack_2268 = uStack_7228;
          local_22c0 = local_7220;
          uStack_22b8 = uStack_7218;
          uStack_22b0 = 0;
          uStack_22a8 = 0;
          auVar10._8_8_ = uStack_2e38;
          auVar10._0_8_ = local_2e40;
          auVar10._16_8_ = uStack_2e30;
          auVar10._24_8_ = uStack_2e28;
          auVar8 = vfmadd213ps_fma(auVar10,auVar4,ZEXT1632(auVar8));
          local_72c0 = auVar8._0_8_;
          uStack_72b8 = auVar8._8_8_;
          local_2e80 = local_7260;
          uStack_2e78 = uStack_7258;
          uStack_2e70 = uStack_7250;
          uStack_2e68 = uStack_7248;
          local_2ec0 = local_72c0;
          uStack_2eb8 = uStack_72b8;
          uStack_2eb0 = 0;
          uStack_2ea8 = 0;
          local_2220 = local_7260;
          uStack_2218 = uStack_7258;
          uStack_2210 = uStack_7250;
          uStack_2208 = uStack_7248;
          local_2260 = local_72c0;
          uStack_2258 = uStack_72b8;
          uStack_2250 = 0;
          uStack_2248 = 0;
          auVar11._8_8_ = uStack_2e98;
          auVar11._0_8_ = local_2ea0;
          auVar11._16_8_ = uStack_2e90;
          auVar11._24_8_ = uStack_2e88;
          auVar8 = vfmadd213ps_fma(auVar11,auVar5,ZEXT1632(auVar8));
          local_72e0 = auVar8._0_8_;
          uStack_72d8 = auVar8._8_8_;
          local_2ee0 = local_7280;
          uStack_2ed8 = uStack_7278;
          uStack_2ed0 = uStack_7270;
          uStack_2ec8 = uStack_7268;
          local_2f20 = local_72e0;
          uStack_2f18 = uStack_72d8;
          uStack_2f10 = 0;
          uStack_2f08 = 0;
          local_21c0 = local_7280;
          uStack_21b8 = uStack_7278;
          uStack_21b0 = uStack_7270;
          uStack_21a8 = uStack_7268;
          local_2200 = local_72e0;
          uStack_21f8 = uStack_72d8;
          uStack_21f0 = 0;
          uStack_21e8 = 0;
          auVar12._8_8_ = uStack_2ef8;
          auVar12._0_8_ = local_2f00;
          auVar12._16_8_ = uStack_2ef0;
          auVar12._24_8_ = uStack_2ee8;
          auVar8 = vfmadd213ps_fma(auVar12,auVar6,ZEXT1632(auVar8));
          local_7300 = auVar8._0_8_;
          uStack_72f8 = auVar8._8_8_;
          local_2f40 = local_72a0;
          uStack_2f38 = uStack_7298;
          uStack_2f30 = uStack_7290;
          uStack_2f28 = uStack_7288;
          local_2f80 = local_7300;
          uStack_2f78 = uStack_72f8;
          uStack_2f70 = 0;
          uStack_2f68 = 0;
          local_2160 = local_72a0;
          uStack_2158 = uStack_7298;
          uStack_2150 = uStack_7290;
          uStack_2148 = uStack_7288;
          local_21a0 = local_7300;
          uStack_2198 = uStack_72f8;
          uStack_2190 = 0;
          uStack_2188 = 0;
          auVar13._8_8_ = uStack_2f58;
          auVar13._0_8_ = local_2f60;
          auVar13._16_8_ = uStack_2f50;
          auVar13._24_8_ = uStack_2f48;
          auVar8 = vfmadd213ps_fma(auVar13,auVar7,ZEXT1632(auVar8));
          local_7320 = auVar8._0_8_;
          uStack_7318 = auVar8._8_8_;
          local_5380 = *local_5348;
          local_32c0 = CONCAT44(local_5380,local_5380);
          uStack_32b8 = CONCAT44(local_5380,local_5380);
          uStack_32b0 = CONCAT44(local_5380,local_5380);
          uStack_32a8 = CONCAT44(local_5380,local_5380);
          local_5388 = local_6688 + 9;
          local_53c0 = *local_5388;
          local_3320 = CONCAT44(local_53c0,local_53c0);
          uStack_3318 = CONCAT44(local_53c0,local_53c0);
          uStack_3310 = CONCAT44(local_53c0,local_53c0);
          uStack_3308 = CONCAT44(local_53c0,local_53c0);
          local_53c8 = local_6688 + 10;
          local_5400 = *local_53c8;
          local_3380 = CONCAT44(local_5400,local_5400);
          uStack_3378 = CONCAT44(local_5400,local_5400);
          uStack_3370 = CONCAT44(local_5400,local_5400);
          uStack_3368 = CONCAT44(local_5400,local_5400);
          local_5408 = local_6688 + 0xb;
          local_5440 = *local_5408;
          local_33e0 = CONCAT44(local_5440,local_5440);
          uStack_33d8 = CONCAT44(local_5440,local_5440);
          uStack_33d0 = CONCAT44(local_5440,local_5440);
          uStack_33c8 = CONCAT44(local_5440,local_5440);
          local_5448 = local_6688 + 0xc;
          local_5480 = *local_5448;
          local_3440 = CONCAT44(local_5480,local_5480);
          uStack_3438 = CONCAT44(local_5480,local_5480);
          uStack_3430 = CONCAT44(local_5480,local_5480);
          uStack_3428 = CONCAT44(local_5480,local_5480);
          local_5488 = local_6688 + 0xd;
          local_54c0 = *local_5488;
          local_34a0 = CONCAT44(local_54c0,local_54c0);
          uStack_3498 = CONCAT44(local_54c0,local_54c0);
          uStack_3490 = CONCAT44(local_54c0,local_54c0);
          uStack_3488 = CONCAT44(local_54c0,local_54c0);
          local_54c8 = local_6688 + 0xe;
          local_5500 = *local_54c8;
          local_3500 = CONCAT44(local_5500,local_5500);
          uStack_34f8 = CONCAT44(local_5500,local_5500);
          uStack_34f0 = CONCAT44(local_5500,local_5500);
          uStack_34e8 = CONCAT44(local_5500,local_5500);
          local_5508 = local_6688 + 0xf;
          local_5540 = *local_5508;
          local_3560 = CONCAT44(local_5540,local_5540);
          uStack_3558 = CONCAT44(local_5540,local_5540);
          uStack_3550 = CONCAT44(local_5540,local_5540);
          uStack_3548 = CONCAT44(local_5540,local_5540);
          local_5548 = local_6688 + 0x10;
          local_2fa0 = local_7140;
          uStack_2f98 = uStack_7138;
          uStack_2f90 = uStack_7130;
          uStack_2f88 = uStack_7128;
          local_2100 = local_7140;
          uStack_20f8 = uStack_7138;
          uStack_20f0 = uStack_7130;
          uStack_20e8 = uStack_7128;
          auVar14._8_8_ = uStack_32b8;
          auVar14._0_8_ = local_32c0;
          auVar14._16_8_ = uStack_32b0;
          auVar14._24_8_ = uStack_32a8;
          auVar9 = vfmadd213ps_fma(auVar14,auVar100,*local_6558);
          local_7440 = auVar9._0_8_;
          uStack_7438 = auVar9._8_8_;
          local_3000 = local_7160;
          uStack_2ff8 = uStack_7158;
          uStack_2ff0 = uStack_7150;
          uStack_2fe8 = uStack_7148;
          local_3040 = local_7440;
          uStack_3038 = uStack_7438;
          uStack_3030 = 0;
          uStack_3028 = 0;
          local_20a0 = local_7160;
          uStack_2098 = uStack_7158;
          uStack_2090 = uStack_7150;
          uStack_2088 = uStack_7148;
          local_20e0 = local_7440;
          uStack_20d8 = uStack_7438;
          uStack_20d0 = 0;
          uStack_20c8 = 0;
          auVar15._8_8_ = uStack_3318;
          auVar15._0_8_ = local_3320;
          auVar15._16_8_ = uStack_3310;
          auVar15._24_8_ = uStack_3308;
          auVar9 = vfmadd213ps_fma(auVar15,auVar1,ZEXT1632(auVar9));
          local_7460 = auVar9._0_8_;
          uStack_7458 = auVar9._8_8_;
          local_3060 = local_7180;
          uStack_3058 = uStack_7178;
          uStack_3050 = uStack_7170;
          uStack_3048 = uStack_7168;
          local_30a0 = local_7460;
          uStack_3098 = uStack_7458;
          uStack_3090 = 0;
          uStack_3088 = 0;
          local_2040 = local_7180;
          uStack_2038 = uStack_7178;
          uStack_2030 = uStack_7170;
          uStack_2028 = uStack_7168;
          local_2080 = local_7460;
          uStack_2078 = uStack_7458;
          uStack_2070 = 0;
          uStack_2068 = 0;
          auVar1._8_8_ = uStack_3378;
          auVar1._0_8_ = local_3380;
          auVar1._16_8_ = uStack_3370;
          auVar1._24_8_ = uStack_3368;
          auVar9 = vfmadd213ps_fma(auVar1,auVar2,ZEXT1632(auVar9));
          local_7480 = auVar9._0_8_;
          uStack_7478 = auVar9._8_8_;
          local_30c0 = local_71a0;
          uStack_30b8 = uStack_7198;
          uStack_30b0 = uStack_7190;
          uStack_30a8 = uStack_7188;
          local_3100 = local_7480;
          uStack_30f8 = uStack_7478;
          uStack_30f0 = 0;
          uStack_30e8 = 0;
          local_1fe0 = local_71a0;
          uStack_1fd8 = uStack_7198;
          uStack_1fd0 = uStack_7190;
          uStack_1fc8 = uStack_7188;
          local_2020 = local_7480;
          uStack_2018 = uStack_7478;
          uStack_2010 = 0;
          uStack_2008 = 0;
          auVar2._8_8_ = uStack_33d8;
          auVar2._0_8_ = local_33e0;
          auVar2._16_8_ = uStack_33d0;
          auVar2._24_8_ = uStack_33c8;
          auVar9 = vfmadd213ps_fma(auVar2,auVar3,ZEXT1632(auVar9));
          local_74a0 = auVar9._0_8_;
          uStack_7498 = auVar9._8_8_;
          local_3120 = local_7240;
          uStack_3118 = uStack_7238;
          uStack_3110 = uStack_7230;
          uStack_3108 = uStack_7228;
          local_3160 = local_74a0;
          uStack_3158 = uStack_7498;
          uStack_3150 = 0;
          uStack_3148 = 0;
          local_1f80 = local_7240;
          uStack_1f78 = uStack_7238;
          uStack_1f70 = uStack_7230;
          uStack_1f68 = uStack_7228;
          local_1fc0 = local_74a0;
          uStack_1fb8 = uStack_7498;
          uStack_1fb0 = 0;
          uStack_1fa8 = 0;
          auVar3._8_8_ = uStack_3438;
          auVar3._0_8_ = local_3440;
          auVar3._16_8_ = uStack_3430;
          auVar3._24_8_ = uStack_3428;
          auVar9 = vfmadd213ps_fma(auVar3,auVar4,ZEXT1632(auVar9));
          local_74c0 = auVar9._0_8_;
          uStack_74b8 = auVar9._8_8_;
          local_3180 = local_7260;
          uStack_3178 = uStack_7258;
          uStack_3170 = uStack_7250;
          uStack_3168 = uStack_7248;
          local_31c0 = local_74c0;
          uStack_31b8 = uStack_74b8;
          uStack_31b0 = 0;
          uStack_31a8 = 0;
          local_1f20 = local_7260;
          uStack_1f18 = uStack_7258;
          uStack_1f10 = uStack_7250;
          uStack_1f08 = uStack_7248;
          local_1f60 = local_74c0;
          uStack_1f58 = uStack_74b8;
          uStack_1f50 = 0;
          uStack_1f48 = 0;
          auVar16._8_8_ = uStack_3498;
          auVar16._0_8_ = local_34a0;
          auVar16._16_8_ = uStack_3490;
          auVar16._24_8_ = uStack_3488;
          auVar9 = vfmadd213ps_fma(auVar16,auVar5,ZEXT1632(auVar9));
          local_74e0 = auVar9._0_8_;
          uStack_74d8 = auVar9._8_8_;
          local_31e0 = local_7280;
          uStack_31d8 = uStack_7278;
          uStack_31d0 = uStack_7270;
          uStack_31c8 = uStack_7268;
          local_3220 = local_74e0;
          uStack_3218 = uStack_74d8;
          uStack_3210 = 0;
          uStack_3208 = 0;
          local_1ec0 = local_7280;
          uStack_1eb8 = uStack_7278;
          uStack_1eb0 = uStack_7270;
          uStack_1ea8 = uStack_7268;
          local_1f00 = local_74e0;
          uStack_1ef8 = uStack_74d8;
          uStack_1ef0 = 0;
          uStack_1ee8 = 0;
          auVar17._8_8_ = uStack_34f8;
          auVar17._0_8_ = local_3500;
          auVar17._16_8_ = uStack_34f0;
          auVar17._24_8_ = uStack_34e8;
          auVar9 = vfmadd213ps_fma(auVar17,auVar6,ZEXT1632(auVar9));
          local_7500 = auVar9._0_8_;
          uStack_74f8 = auVar9._8_8_;
          local_3240 = local_72a0;
          uStack_3238 = uStack_7298;
          uStack_3230 = uStack_7290;
          uStack_3228 = uStack_7288;
          local_3280 = local_7500;
          uStack_3278 = uStack_74f8;
          uStack_3270 = 0;
          uStack_3268 = 0;
          local_1e60 = local_72a0;
          uStack_1e58 = uStack_7298;
          uStack_1e50 = uStack_7290;
          uStack_1e48 = uStack_7288;
          local_1ea0 = local_7500;
          uStack_1e98 = uStack_74f8;
          uStack_1e90 = 0;
          uStack_1e88 = 0;
          auVar18._8_8_ = uStack_3558;
          auVar18._0_8_ = local_3560;
          auVar18._16_8_ = uStack_3550;
          auVar18._24_8_ = uStack_3548;
          auVar9 = vfmadd213ps_fma(auVar18,auVar7,ZEXT1632(auVar9));
          local_7520 = auVar9._0_8_;
          uStack_7518 = auVar9._8_8_;
          local_2a00 = vlddqu_avx(*local_2ac8);
          auVar100 = vcvtph2ps_f16c(local_2a00);
          local_7540 = auVar100._0_8_;
          uStack_7538 = auVar100._8_8_;
          uStack_7530 = auVar100._16_8_;
          uStack_7528 = auVar100._24_8_;
          local_2ad0 = pauVar99 + 9;
          local_29f0 = vlddqu_avx(*local_2ad0);
          auVar1 = vcvtph2ps_f16c(local_29f0);
          local_7560 = auVar1._0_8_;
          uStack_7558 = auVar1._8_8_;
          uStack_7550 = auVar1._16_8_;
          uStack_7548 = auVar1._24_8_;
          local_2ad8 = pauVar99 + 10;
          local_29e0 = vlddqu_avx(*local_2ad8);
          auVar2 = vcvtph2ps_f16c(local_29e0);
          local_7580 = auVar2._0_8_;
          uStack_7578 = auVar2._8_8_;
          uStack_7570 = auVar2._16_8_;
          uStack_7568 = auVar2._24_8_;
          local_2ae0 = pauVar99 + 0xb;
          local_29d0 = vlddqu_avx(*local_2ae0);
          auVar3 = vcvtph2ps_f16c(local_29d0);
          local_75a0 = auVar3._0_8_;
          uStack_7598 = auVar3._8_8_;
          uStack_7590 = auVar3._16_8_;
          uStack_7588 = auVar3._24_8_;
          local_2ae8 = pauVar99 + 0xc;
          local_32a0 = local_7540;
          uStack_3298 = uStack_7538;
          uStack_3290 = uStack_7530;
          uStack_3288 = uStack_7528;
          local_32e0 = local_7320;
          uStack_32d8 = uStack_7318;
          uStack_32d0 = 0;
          uStack_32c8 = 0;
          local_1e00 = local_7540;
          uStack_1df8 = uStack_7538;
          uStack_1df0 = uStack_7530;
          uStack_1de8 = uStack_7528;
          local_1e40 = local_7320;
          uStack_1e38 = uStack_7318;
          uStack_1e30 = 0;
          uStack_1e28 = 0;
          auVar19._8_8_ = uStack_32b8;
          auVar19._0_8_ = local_32c0;
          auVar19._16_8_ = uStack_32b0;
          auVar19._24_8_ = uStack_32a8;
          auVar8 = vfmadd213ps_fma(auVar19,auVar100,ZEXT1632(auVar8));
          local_75c0 = auVar8._0_8_;
          uStack_75b8 = auVar8._8_8_;
          local_3300 = local_7560;
          uStack_32f8 = uStack_7558;
          uStack_32f0 = uStack_7550;
          uStack_32e8 = uStack_7548;
          local_3340 = local_75c0;
          uStack_3338 = uStack_75b8;
          uStack_3330 = 0;
          uStack_3328 = 0;
          local_1da0 = local_7560;
          uStack_1d98 = uStack_7558;
          uStack_1d90 = uStack_7550;
          uStack_1d88 = uStack_7548;
          local_1de0 = local_75c0;
          uStack_1dd8 = uStack_75b8;
          uStack_1dd0 = 0;
          uStack_1dc8 = 0;
          auVar20._8_8_ = uStack_3318;
          auVar20._0_8_ = local_3320;
          auVar20._16_8_ = uStack_3310;
          auVar20._24_8_ = uStack_3308;
          auVar8 = vfmadd213ps_fma(auVar20,auVar1,ZEXT1632(auVar8));
          local_75e0 = auVar8._0_8_;
          uStack_75d8 = auVar8._8_8_;
          local_3360 = local_7580;
          uStack_3358 = uStack_7578;
          uStack_3350 = uStack_7570;
          uStack_3348 = uStack_7568;
          local_33a0 = local_75e0;
          uStack_3398 = uStack_75d8;
          uStack_3390 = 0;
          uStack_3388 = 0;
          local_1d40 = local_7580;
          uStack_1d38 = uStack_7578;
          uStack_1d30 = uStack_7570;
          uStack_1d28 = uStack_7568;
          local_1d80 = local_75e0;
          uStack_1d78 = uStack_75d8;
          uStack_1d70 = 0;
          uStack_1d68 = 0;
          auVar21._8_8_ = uStack_3378;
          auVar21._0_8_ = local_3380;
          auVar21._16_8_ = uStack_3370;
          auVar21._24_8_ = uStack_3368;
          auVar8 = vfmadd213ps_fma(auVar21,auVar2,ZEXT1632(auVar8));
          local_7600 = auVar8._0_8_;
          uStack_75f8 = auVar8._8_8_;
          local_33c0 = local_75a0;
          uStack_33b8 = uStack_7598;
          uStack_33b0 = uStack_7590;
          uStack_33a8 = uStack_7588;
          local_3400 = local_7600;
          uStack_33f8 = uStack_75f8;
          uStack_33f0 = 0;
          uStack_33e8 = 0;
          local_1ce0 = local_75a0;
          uStack_1cd8 = uStack_7598;
          uStack_1cd0 = uStack_7590;
          uStack_1cc8 = uStack_7588;
          local_1d20 = local_7600;
          uStack_1d18 = uStack_75f8;
          uStack_1d10 = 0;
          uStack_1d08 = 0;
          auVar22._8_8_ = uStack_33d8;
          auVar22._0_8_ = local_33e0;
          auVar22._16_8_ = uStack_33d0;
          auVar22._24_8_ = uStack_33c8;
          auVar8 = vfmadd213ps_fma(auVar22,auVar3,ZEXT1632(auVar8));
          local_7620 = auVar8._0_8_;
          uStack_7618 = auVar8._8_8_;
          local_29c0 = vlddqu_avx(*local_2ae8);
          auVar4 = vcvtph2ps_f16c(local_29c0);
          local_7640 = auVar4._0_8_;
          uStack_7638 = auVar4._8_8_;
          uStack_7630 = auVar4._16_8_;
          uStack_7628 = auVar4._24_8_;
          local_2af0 = pauVar99 + 0xd;
          local_29b0 = vlddqu_avx(*local_2af0);
          auVar5 = vcvtph2ps_f16c(local_29b0);
          local_7660 = auVar5._0_8_;
          uStack_7658 = auVar5._8_8_;
          uStack_7650 = auVar5._16_8_;
          uStack_7648 = auVar5._24_8_;
          local_2af8 = pauVar99 + 0xe;
          local_29a0 = vlddqu_avx(*local_2af8);
          auVar6 = vcvtph2ps_f16c(local_29a0);
          local_7680 = auVar6._0_8_;
          uStack_7678 = auVar6._8_8_;
          uStack_7670 = auVar6._16_8_;
          uStack_7668 = auVar6._24_8_;
          local_2b00 = pauVar99 + 0xf;
          local_2990 = vlddqu_avx(*local_2b00);
          auVar7 = vcvtph2ps_f16c(local_2990);
          local_76a0 = auVar7._0_8_;
          uStack_7698 = auVar7._8_8_;
          uStack_7690 = auVar7._16_8_;
          uStack_7688 = auVar7._24_8_;
          local_2b08 = pauVar99 + 0x10;
          local_3420 = local_7640;
          uStack_3418 = uStack_7638;
          uStack_3410 = uStack_7630;
          uStack_3408 = uStack_7628;
          local_3460 = local_7620;
          uStack_3458 = uStack_7618;
          uStack_3450 = 0;
          uStack_3448 = 0;
          local_1c80 = local_7640;
          uStack_1c78 = uStack_7638;
          uStack_1c70 = uStack_7630;
          uStack_1c68 = uStack_7628;
          local_1cc0 = local_7620;
          uStack_1cb8 = uStack_7618;
          uStack_1cb0 = 0;
          uStack_1ca8 = 0;
          auVar23._8_8_ = uStack_3438;
          auVar23._0_8_ = local_3440;
          auVar23._16_8_ = uStack_3430;
          auVar23._24_8_ = uStack_3428;
          auVar8 = vfmadd213ps_fma(auVar23,auVar4,ZEXT1632(auVar8));
          local_76c0 = auVar8._0_8_;
          uStack_76b8 = auVar8._8_8_;
          local_3480 = local_7660;
          uStack_3478 = uStack_7658;
          uStack_3470 = uStack_7650;
          uStack_3468 = uStack_7648;
          local_34c0 = local_76c0;
          uStack_34b8 = uStack_76b8;
          uStack_34b0 = 0;
          uStack_34a8 = 0;
          local_1c20 = local_7660;
          uStack_1c18 = uStack_7658;
          uStack_1c10 = uStack_7650;
          uStack_1c08 = uStack_7648;
          local_1c60 = local_76c0;
          uStack_1c58 = uStack_76b8;
          uStack_1c50 = 0;
          uStack_1c48 = 0;
          auVar24._8_8_ = uStack_3498;
          auVar24._0_8_ = local_34a0;
          auVar24._16_8_ = uStack_3490;
          auVar24._24_8_ = uStack_3488;
          auVar8 = vfmadd213ps_fma(auVar24,auVar5,ZEXT1632(auVar8));
          local_76e0 = auVar8._0_8_;
          uStack_76d8 = auVar8._8_8_;
          local_34e0 = local_7680;
          uStack_34d8 = uStack_7678;
          uStack_34d0 = uStack_7670;
          uStack_34c8 = uStack_7668;
          local_3520 = local_76e0;
          uStack_3518 = uStack_76d8;
          uStack_3510 = 0;
          uStack_3508 = 0;
          local_1bc0 = local_7680;
          uStack_1bb8 = uStack_7678;
          uStack_1bb0 = uStack_7670;
          uStack_1ba8 = uStack_7668;
          local_1c00 = local_76e0;
          uStack_1bf8 = uStack_76d8;
          uStack_1bf0 = 0;
          uStack_1be8 = 0;
          auVar25._8_8_ = uStack_34f8;
          auVar25._0_8_ = local_3500;
          auVar25._16_8_ = uStack_34f0;
          auVar25._24_8_ = uStack_34e8;
          auVar8 = vfmadd213ps_fma(auVar25,auVar6,ZEXT1632(auVar8));
          local_7700 = auVar8._0_8_;
          uStack_76f8 = auVar8._8_8_;
          local_3540 = local_76a0;
          uStack_3538 = uStack_7698;
          uStack_3530 = uStack_7690;
          uStack_3528 = uStack_7688;
          local_3580 = local_7700;
          uStack_3578 = uStack_76f8;
          uStack_3570 = 0;
          uStack_3568 = 0;
          local_1b60 = local_76a0;
          uStack_1b58 = uStack_7698;
          uStack_1b50 = uStack_7690;
          uStack_1b48 = uStack_7688;
          local_1ba0 = local_7700;
          uStack_1b98 = uStack_76f8;
          uStack_1b90 = 0;
          uStack_1b88 = 0;
          auVar26._8_8_ = uStack_3558;
          auVar26._0_8_ = local_3560;
          auVar26._16_8_ = uStack_3550;
          auVar26._24_8_ = uStack_3548;
          auVar8 = vfmadd213ps_fma(auVar26,auVar7,ZEXT1632(auVar8));
          local_7720 = auVar8._0_8_;
          uStack_7718 = auVar8._8_8_;
          local_5580 = *local_5548;
          local_35c0 = CONCAT44(local_5580,local_5580);
          uStack_35b8 = CONCAT44(local_5580,local_5580);
          uStack_35b0 = CONCAT44(local_5580,local_5580);
          uStack_35a8 = CONCAT44(local_5580,local_5580);
          local_5588 = local_6688 + 0x11;
          local_55c0 = *local_5588;
          local_3620 = CONCAT44(local_55c0,local_55c0);
          uStack_3618 = CONCAT44(local_55c0,local_55c0);
          uStack_3610 = CONCAT44(local_55c0,local_55c0);
          uStack_3608 = CONCAT44(local_55c0,local_55c0);
          local_55c8 = local_6688 + 0x12;
          local_5600 = *local_55c8;
          local_3680 = CONCAT44(local_5600,local_5600);
          uStack_3678 = CONCAT44(local_5600,local_5600);
          uStack_3670 = CONCAT44(local_5600,local_5600);
          uStack_3668 = CONCAT44(local_5600,local_5600);
          local_5608 = local_6688 + 0x13;
          local_5640 = *local_5608;
          local_36e0 = CONCAT44(local_5640,local_5640);
          uStack_36d8 = CONCAT44(local_5640,local_5640);
          uStack_36d0 = CONCAT44(local_5640,local_5640);
          uStack_36c8 = CONCAT44(local_5640,local_5640);
          local_5648 = local_6688 + 0x14;
          local_5680 = *local_5648;
          local_3740 = CONCAT44(local_5680,local_5680);
          uStack_3738 = CONCAT44(local_5680,local_5680);
          uStack_3730 = CONCAT44(local_5680,local_5680);
          uStack_3728 = CONCAT44(local_5680,local_5680);
          local_5688 = local_6688 + 0x15;
          local_56c0 = *local_5688;
          local_37a0 = CONCAT44(local_56c0,local_56c0);
          uStack_3798 = CONCAT44(local_56c0,local_56c0);
          uStack_3790 = CONCAT44(local_56c0,local_56c0);
          uStack_3788 = CONCAT44(local_56c0,local_56c0);
          local_56c8 = local_6688 + 0x16;
          local_5700 = *local_56c8;
          local_3800 = CONCAT44(local_5700,local_5700);
          uStack_37f8 = CONCAT44(local_5700,local_5700);
          uStack_37f0 = CONCAT44(local_5700,local_5700);
          uStack_37e8 = CONCAT44(local_5700,local_5700);
          local_5708 = local_6688 + 0x17;
          local_5740 = *local_5708;
          local_3860 = CONCAT44(local_5740,local_5740);
          uStack_3858 = CONCAT44(local_5740,local_5740);
          uStack_3850 = CONCAT44(local_5740,local_5740);
          uStack_3848 = CONCAT44(local_5740,local_5740);
          local_35a0 = local_7540;
          uStack_3598 = uStack_7538;
          uStack_3590 = uStack_7530;
          uStack_3588 = uStack_7528;
          local_35e0 = local_7520;
          uStack_35d8 = uStack_7518;
          uStack_35d0 = 0;
          uStack_35c8 = 0;
          local_1b00 = local_7540;
          uStack_1af8 = uStack_7538;
          uStack_1af0 = uStack_7530;
          uStack_1ae8 = uStack_7528;
          local_1b40 = local_7520;
          uStack_1b38 = uStack_7518;
          uStack_1b30 = 0;
          uStack_1b28 = 0;
          auVar27._8_8_ = uStack_35b8;
          auVar27._0_8_ = local_35c0;
          auVar27._16_8_ = uStack_35b0;
          auVar27._24_8_ = uStack_35a8;
          auVar9 = vfmadd213ps_fma(auVar27,auVar100,ZEXT1632(auVar9));
          local_7840 = auVar9._0_8_;
          uStack_7838 = auVar9._8_8_;
          local_3600 = local_7560;
          uStack_35f8 = uStack_7558;
          uStack_35f0 = uStack_7550;
          uStack_35e8 = uStack_7548;
          local_3640 = local_7840;
          uStack_3638 = uStack_7838;
          uStack_3630 = 0;
          uStack_3628 = 0;
          local_1aa0 = local_7560;
          uStack_1a98 = uStack_7558;
          uStack_1a90 = uStack_7550;
          uStack_1a88 = uStack_7548;
          local_1ae0 = local_7840;
          uStack_1ad8 = uStack_7838;
          uStack_1ad0 = 0;
          uStack_1ac8 = 0;
          auVar28._8_8_ = uStack_3618;
          auVar28._0_8_ = local_3620;
          auVar28._16_8_ = uStack_3610;
          auVar28._24_8_ = uStack_3608;
          auVar9 = vfmadd213ps_fma(auVar28,auVar1,ZEXT1632(auVar9));
          local_7860 = auVar9._0_8_;
          uStack_7858 = auVar9._8_8_;
          local_3660 = local_7580;
          uStack_3658 = uStack_7578;
          uStack_3650 = uStack_7570;
          uStack_3648 = uStack_7568;
          local_36a0 = local_7860;
          uStack_3698 = uStack_7858;
          uStack_3690 = 0;
          uStack_3688 = 0;
          local_1a40 = local_7580;
          uStack_1a38 = uStack_7578;
          uStack_1a30 = uStack_7570;
          uStack_1a28 = uStack_7568;
          local_1a80 = local_7860;
          uStack_1a78 = uStack_7858;
          uStack_1a70 = 0;
          uStack_1a68 = 0;
          auVar29._8_8_ = uStack_3678;
          auVar29._0_8_ = local_3680;
          auVar29._16_8_ = uStack_3670;
          auVar29._24_8_ = uStack_3668;
          auVar9 = vfmadd213ps_fma(auVar29,auVar2,ZEXT1632(auVar9));
          local_7880 = auVar9._0_8_;
          uStack_7878 = auVar9._8_8_;
          local_36c0 = local_75a0;
          uStack_36b8 = uStack_7598;
          uStack_36b0 = uStack_7590;
          uStack_36a8 = uStack_7588;
          local_3700 = local_7880;
          uStack_36f8 = uStack_7878;
          uStack_36f0 = 0;
          uStack_36e8 = 0;
          local_19e0 = local_75a0;
          uStack_19d8 = uStack_7598;
          uStack_19d0 = uStack_7590;
          uStack_19c8 = uStack_7588;
          local_1a20 = local_7880;
          uStack_1a18 = uStack_7878;
          uStack_1a10 = 0;
          uStack_1a08 = 0;
          auVar30._8_8_ = uStack_36d8;
          auVar30._0_8_ = local_36e0;
          auVar30._16_8_ = uStack_36d0;
          auVar30._24_8_ = uStack_36c8;
          auVar9 = vfmadd213ps_fma(auVar30,auVar3,ZEXT1632(auVar9));
          local_78a0 = auVar9._0_8_;
          uStack_7898 = auVar9._8_8_;
          local_3720 = local_7640;
          uStack_3718 = uStack_7638;
          uStack_3710 = uStack_7630;
          uStack_3708 = uStack_7628;
          local_3760 = local_78a0;
          uStack_3758 = uStack_7898;
          uStack_3750 = 0;
          uStack_3748 = 0;
          local_1980 = local_7640;
          uStack_1978 = uStack_7638;
          uStack_1970 = uStack_7630;
          uStack_1968 = uStack_7628;
          local_19c0 = local_78a0;
          uStack_19b8 = uStack_7898;
          uStack_19b0 = 0;
          uStack_19a8 = 0;
          auVar31._8_8_ = uStack_3738;
          auVar31._0_8_ = local_3740;
          auVar31._16_8_ = uStack_3730;
          auVar31._24_8_ = uStack_3728;
          auVar9 = vfmadd213ps_fma(auVar31,auVar4,ZEXT1632(auVar9));
          local_78c0 = auVar9._0_8_;
          uStack_78b8 = auVar9._8_8_;
          local_3780 = local_7660;
          uStack_3778 = uStack_7658;
          uStack_3770 = uStack_7650;
          uStack_3768 = uStack_7648;
          local_37c0 = local_78c0;
          uStack_37b8 = uStack_78b8;
          uStack_37b0 = 0;
          uStack_37a8 = 0;
          local_1920 = local_7660;
          uStack_1918 = uStack_7658;
          uStack_1910 = uStack_7650;
          uStack_1908 = uStack_7648;
          local_1960 = local_78c0;
          uStack_1958 = uStack_78b8;
          uStack_1950 = 0;
          uStack_1948 = 0;
          auVar32._8_8_ = uStack_3798;
          auVar32._0_8_ = local_37a0;
          auVar32._16_8_ = uStack_3790;
          auVar32._24_8_ = uStack_3788;
          auVar9 = vfmadd213ps_fma(auVar32,auVar5,ZEXT1632(auVar9));
          local_78e0 = auVar9._0_8_;
          uStack_78d8 = auVar9._8_8_;
          local_37e0 = local_7680;
          uStack_37d8 = uStack_7678;
          uStack_37d0 = uStack_7670;
          uStack_37c8 = uStack_7668;
          local_3820 = local_78e0;
          uStack_3818 = uStack_78d8;
          uStack_3810 = 0;
          uStack_3808 = 0;
          local_18c0 = local_7680;
          uStack_18b8 = uStack_7678;
          uStack_18b0 = uStack_7670;
          uStack_18a8 = uStack_7668;
          local_1900 = local_78e0;
          uStack_18f8 = uStack_78d8;
          uStack_18f0 = 0;
          uStack_18e8 = 0;
          auVar33._8_8_ = uStack_37f8;
          auVar33._0_8_ = local_3800;
          auVar33._16_8_ = uStack_37f0;
          auVar33._24_8_ = uStack_37e8;
          auVar9 = vfmadd213ps_fma(auVar33,auVar6,ZEXT1632(auVar9));
          local_7900 = auVar9._0_8_;
          uStack_78f8 = auVar9._8_8_;
          local_3840 = local_76a0;
          uStack_3838 = uStack_7698;
          uStack_3830 = uStack_7690;
          uStack_3828 = uStack_7688;
          local_3880 = local_7900;
          uStack_3878 = uStack_78f8;
          uStack_3870 = 0;
          uStack_3868 = 0;
          local_1860 = local_76a0;
          uStack_1858 = uStack_7698;
          uStack_1850 = uStack_7690;
          uStack_1848 = uStack_7688;
          local_18a0 = local_7900;
          uStack_1898 = uStack_78f8;
          uStack_1890 = 0;
          uStack_1888 = 0;
          auVar34._8_8_ = uStack_3858;
          auVar34._0_8_ = local_3860;
          auVar34._16_8_ = uStack_3850;
          auVar34._24_8_ = uStack_3848;
          auVar9 = vfmadd213ps_fma(auVar34,auVar7,ZEXT1632(auVar9));
          local_7920 = auVar9._0_8_;
          uStack_7918 = auVar9._8_8_;
          local_5748 = local_6690;
          local_5780 = *local_6690;
          local_38c0 = CONCAT44(local_5780,local_5780);
          uStack_38b8 = CONCAT44(local_5780,local_5780);
          uStack_38b0 = CONCAT44(local_5780,local_5780);
          uStack_38a8 = CONCAT44(local_5780,local_5780);
          local_5788 = local_6690 + 1;
          local_57c0 = *local_5788;
          local_3920 = CONCAT44(local_57c0,local_57c0);
          uStack_3918 = CONCAT44(local_57c0,local_57c0);
          uStack_3910 = CONCAT44(local_57c0,local_57c0);
          uStack_3908 = CONCAT44(local_57c0,local_57c0);
          local_57c8 = local_6690 + 2;
          local_5800 = *local_57c8;
          local_3980 = CONCAT44(local_5800,local_5800);
          uStack_3978 = CONCAT44(local_5800,local_5800);
          uStack_3970 = CONCAT44(local_5800,local_5800);
          uStack_3968 = CONCAT44(local_5800,local_5800);
          local_5808 = local_6690 + 3;
          local_5840 = *local_5808;
          local_39e0 = CONCAT44(local_5840,local_5840);
          uStack_39d8 = CONCAT44(local_5840,local_5840);
          uStack_39d0 = CONCAT44(local_5840,local_5840);
          uStack_39c8 = CONCAT44(local_5840,local_5840);
          local_5848 = local_6690 + 4;
          local_5880 = *local_5848;
          local_3a40 = CONCAT44(local_5880,local_5880);
          uStack_3a38 = CONCAT44(local_5880,local_5880);
          uStack_3a30 = CONCAT44(local_5880,local_5880);
          uStack_3a28 = CONCAT44(local_5880,local_5880);
          local_5888 = local_6690 + 5;
          local_58c0 = *local_5888;
          local_3aa0 = CONCAT44(local_58c0,local_58c0);
          uStack_3a98 = CONCAT44(local_58c0,local_58c0);
          uStack_3a90 = CONCAT44(local_58c0,local_58c0);
          uStack_3a88 = CONCAT44(local_58c0,local_58c0);
          local_58c8 = local_6690 + 6;
          local_5900 = *local_58c8;
          local_3b00 = CONCAT44(local_5900,local_5900);
          uStack_3af8 = CONCAT44(local_5900,local_5900);
          uStack_3af0 = CONCAT44(local_5900,local_5900);
          uStack_3ae8 = CONCAT44(local_5900,local_5900);
          local_5908 = local_6690 + 7;
          local_5940 = *local_5908;
          local_3b60 = CONCAT44(local_5940,local_5940);
          uStack_3b58 = CONCAT44(local_5940,local_5940);
          uStack_3b50 = CONCAT44(local_5940,local_5940);
          uStack_3b48 = CONCAT44(local_5940,local_5940);
          local_2980 = vlddqu_avx(*local_2b08);
          auVar100 = vcvtph2ps_f16c(local_2980);
          local_7a40 = auVar100._0_8_;
          uStack_7a38 = auVar100._8_8_;
          uStack_7a30 = auVar100._16_8_;
          uStack_7a28 = auVar100._24_8_;
          local_2b10 = pauVar99 + 0x11;
          local_2970 = vlddqu_avx(*local_2b10);
          auVar1 = vcvtph2ps_f16c(local_2970);
          local_7a60 = auVar1._0_8_;
          uStack_7a58 = auVar1._8_8_;
          uStack_7a50 = auVar1._16_8_;
          uStack_7a48 = auVar1._24_8_;
          local_2b18 = pauVar99 + 0x12;
          local_2960 = vlddqu_avx(*local_2b18);
          auVar2 = vcvtph2ps_f16c(local_2960);
          local_7a80 = auVar2._0_8_;
          uStack_7a78 = auVar2._8_8_;
          uStack_7a70 = auVar2._16_8_;
          uStack_7a68 = auVar2._24_8_;
          local_2b20 = pauVar99 + 0x13;
          local_2950 = vlddqu_avx(*local_2b20);
          auVar3 = vcvtph2ps_f16c(local_2950);
          local_7aa0 = auVar3._0_8_;
          uStack_7a98 = auVar3._8_8_;
          uStack_7a90 = auVar3._16_8_;
          uStack_7a88 = auVar3._24_8_;
          local_2b28 = pauVar99 + 0x14;
          local_38a0 = local_7a40;
          uStack_3898 = uStack_7a38;
          uStack_3890 = uStack_7a30;
          uStack_3888 = uStack_7a28;
          local_38e0 = local_7720;
          uStack_38d8 = uStack_7718;
          uStack_38d0 = 0;
          uStack_38c8 = 0;
          local_1800 = local_7a40;
          uStack_17f8 = uStack_7a38;
          uStack_17f0 = uStack_7a30;
          uStack_17e8 = uStack_7a28;
          local_1840 = local_7720;
          uStack_1838 = uStack_7718;
          uStack_1830 = 0;
          uStack_1828 = 0;
          auVar35._8_8_ = uStack_38b8;
          auVar35._0_8_ = local_38c0;
          auVar35._16_8_ = uStack_38b0;
          auVar35._24_8_ = uStack_38a8;
          auVar8 = vfmadd213ps_fma(auVar35,auVar100,ZEXT1632(auVar8));
          local_7ac0 = auVar8._0_8_;
          uStack_7ab8 = auVar8._8_8_;
          local_3900 = local_7a60;
          uStack_38f8 = uStack_7a58;
          uStack_38f0 = uStack_7a50;
          uStack_38e8 = uStack_7a48;
          local_3940 = local_7ac0;
          uStack_3938 = uStack_7ab8;
          uStack_3930 = 0;
          uStack_3928 = 0;
          local_17a0 = local_7a60;
          uStack_1798 = uStack_7a58;
          uStack_1790 = uStack_7a50;
          uStack_1788 = uStack_7a48;
          local_17e0 = local_7ac0;
          uStack_17d8 = uStack_7ab8;
          uStack_17d0 = 0;
          uStack_17c8 = 0;
          auVar36._8_8_ = uStack_3918;
          auVar36._0_8_ = local_3920;
          auVar36._16_8_ = uStack_3910;
          auVar36._24_8_ = uStack_3908;
          auVar8 = vfmadd213ps_fma(auVar36,auVar1,ZEXT1632(auVar8));
          local_7ae0 = auVar8._0_8_;
          uStack_7ad8 = auVar8._8_8_;
          local_3960 = local_7a80;
          uStack_3958 = uStack_7a78;
          uStack_3950 = uStack_7a70;
          uStack_3948 = uStack_7a68;
          local_39a0 = local_7ae0;
          uStack_3998 = uStack_7ad8;
          uStack_3990 = 0;
          uStack_3988 = 0;
          local_1740 = local_7a80;
          uStack_1738 = uStack_7a78;
          uStack_1730 = uStack_7a70;
          uStack_1728 = uStack_7a68;
          local_1780 = local_7ae0;
          uStack_1778 = uStack_7ad8;
          uStack_1770 = 0;
          uStack_1768 = 0;
          auVar37._8_8_ = uStack_3978;
          auVar37._0_8_ = local_3980;
          auVar37._16_8_ = uStack_3970;
          auVar37._24_8_ = uStack_3968;
          auVar8 = vfmadd213ps_fma(auVar37,auVar2,ZEXT1632(auVar8));
          local_7b00 = auVar8._0_8_;
          uStack_7af8 = auVar8._8_8_;
          local_39c0 = local_7aa0;
          uStack_39b8 = uStack_7a98;
          uStack_39b0 = uStack_7a90;
          uStack_39a8 = uStack_7a88;
          local_3a00 = local_7b00;
          uStack_39f8 = uStack_7af8;
          uStack_39f0 = 0;
          uStack_39e8 = 0;
          local_16e0 = local_7aa0;
          uStack_16d8 = uStack_7a98;
          uStack_16d0 = uStack_7a90;
          uStack_16c8 = uStack_7a88;
          local_1720 = local_7b00;
          uStack_1718 = uStack_7af8;
          uStack_1710 = 0;
          uStack_1708 = 0;
          auVar38._8_8_ = uStack_39d8;
          auVar38._0_8_ = local_39e0;
          auVar38._16_8_ = uStack_39d0;
          auVar38._24_8_ = uStack_39c8;
          auVar8 = vfmadd213ps_fma(auVar38,auVar3,ZEXT1632(auVar8));
          local_7b20 = auVar8._0_8_;
          uStack_7b18 = auVar8._8_8_;
          local_2940 = vlddqu_avx(*local_2b28);
          auVar4 = vcvtph2ps_f16c(local_2940);
          local_7b40 = auVar4._0_8_;
          uStack_7b38 = auVar4._8_8_;
          uStack_7b30 = auVar4._16_8_;
          uStack_7b28 = auVar4._24_8_;
          local_2b30 = pauVar99 + 0x15;
          local_2930 = vlddqu_avx(*local_2b30);
          auVar5 = vcvtph2ps_f16c(local_2930);
          local_7b60 = auVar5._0_8_;
          uStack_7b58 = auVar5._8_8_;
          uStack_7b50 = auVar5._16_8_;
          uStack_7b48 = auVar5._24_8_;
          local_2b38 = pauVar99 + 0x16;
          local_2920 = vlddqu_avx(*local_2b38);
          auVar6 = vcvtph2ps_f16c(local_2920);
          local_7b80 = auVar6._0_8_;
          uStack_7b78 = auVar6._8_8_;
          uStack_7b70 = auVar6._16_8_;
          uStack_7b68 = auVar6._24_8_;
          local_2b40 = pauVar99 + 0x17;
          local_2910 = vlddqu_avx(*local_2b40);
          auVar7 = vcvtph2ps_f16c(local_2910);
          local_7ba0 = auVar7._0_8_;
          uStack_7b98 = auVar7._8_8_;
          uStack_7b90 = auVar7._16_8_;
          uStack_7b88 = auVar7._24_8_;
          local_2b48 = pauVar99 + 0x18;
          local_3a20 = local_7b40;
          uStack_3a18 = uStack_7b38;
          uStack_3a10 = uStack_7b30;
          uStack_3a08 = uStack_7b28;
          local_3a60 = local_7b20;
          uStack_3a58 = uStack_7b18;
          uStack_3a50 = 0;
          uStack_3a48 = 0;
          local_1680 = local_7b40;
          uStack_1678 = uStack_7b38;
          uStack_1670 = uStack_7b30;
          uStack_1668 = uStack_7b28;
          local_16c0 = local_7b20;
          uStack_16b8 = uStack_7b18;
          uStack_16b0 = 0;
          uStack_16a8 = 0;
          auVar39._8_8_ = uStack_3a38;
          auVar39._0_8_ = local_3a40;
          auVar39._16_8_ = uStack_3a30;
          auVar39._24_8_ = uStack_3a28;
          auVar8 = vfmadd213ps_fma(auVar39,auVar4,ZEXT1632(auVar8));
          local_7bc0 = auVar8._0_8_;
          uStack_7bb8 = auVar8._8_8_;
          local_3a80 = local_7b60;
          uStack_3a78 = uStack_7b58;
          uStack_3a70 = uStack_7b50;
          uStack_3a68 = uStack_7b48;
          local_3ac0 = local_7bc0;
          uStack_3ab8 = uStack_7bb8;
          uStack_3ab0 = 0;
          uStack_3aa8 = 0;
          local_1620 = local_7b60;
          uStack_1618 = uStack_7b58;
          uStack_1610 = uStack_7b50;
          uStack_1608 = uStack_7b48;
          local_1660 = local_7bc0;
          uStack_1658 = uStack_7bb8;
          uStack_1650 = 0;
          uStack_1648 = 0;
          auVar40._8_8_ = uStack_3a98;
          auVar40._0_8_ = local_3aa0;
          auVar40._16_8_ = uStack_3a90;
          auVar40._24_8_ = uStack_3a88;
          auVar8 = vfmadd213ps_fma(auVar40,auVar5,ZEXT1632(auVar8));
          local_7be0 = auVar8._0_8_;
          uStack_7bd8 = auVar8._8_8_;
          local_3ae0 = local_7b80;
          uStack_3ad8 = uStack_7b78;
          uStack_3ad0 = uStack_7b70;
          uStack_3ac8 = uStack_7b68;
          local_3b20 = local_7be0;
          uStack_3b18 = uStack_7bd8;
          uStack_3b10 = 0;
          uStack_3b08 = 0;
          local_15c0 = local_7b80;
          uStack_15b8 = uStack_7b78;
          uStack_15b0 = uStack_7b70;
          uStack_15a8 = uStack_7b68;
          local_1600 = local_7be0;
          uStack_15f8 = uStack_7bd8;
          uStack_15f0 = 0;
          uStack_15e8 = 0;
          auVar41._8_8_ = uStack_3af8;
          auVar41._0_8_ = local_3b00;
          auVar41._16_8_ = uStack_3af0;
          auVar41._24_8_ = uStack_3ae8;
          auVar8 = vfmadd213ps_fma(auVar41,auVar6,ZEXT1632(auVar8));
          local_7c00 = auVar8._0_8_;
          uStack_7bf8 = auVar8._8_8_;
          local_3b40 = local_7ba0;
          uStack_3b38 = uStack_7b98;
          uStack_3b30 = uStack_7b90;
          uStack_3b28 = uStack_7b88;
          local_3b80 = local_7c00;
          uStack_3b78 = uStack_7bf8;
          uStack_3b70 = 0;
          uStack_3b68 = 0;
          local_1560 = local_7ba0;
          uStack_1558 = uStack_7b98;
          uStack_1550 = uStack_7b90;
          uStack_1548 = uStack_7b88;
          local_15a0 = local_7c00;
          uStack_1598 = uStack_7bf8;
          uStack_1590 = 0;
          uStack_1588 = 0;
          auVar42._8_8_ = uStack_3b58;
          auVar42._0_8_ = local_3b60;
          auVar42._16_8_ = uStack_3b50;
          auVar42._24_8_ = uStack_3b48;
          auVar8 = vfmadd213ps_fma(auVar42,auVar7,ZEXT1632(auVar8));
          local_7c20 = auVar8._0_8_;
          uStack_7c18 = auVar8._8_8_;
          local_5948 = local_6690 + 8;
          local_5980 = *local_5948;
          local_3ec0 = CONCAT44(local_5980,local_5980);
          uStack_3eb8 = CONCAT44(local_5980,local_5980);
          uStack_3eb0 = CONCAT44(local_5980,local_5980);
          uStack_3ea8 = CONCAT44(local_5980,local_5980);
          local_5988 = local_6690 + 9;
          local_59c0 = *local_5988;
          local_3f20 = CONCAT44(local_59c0,local_59c0);
          uStack_3f18 = CONCAT44(local_59c0,local_59c0);
          uStack_3f10 = CONCAT44(local_59c0,local_59c0);
          uStack_3f08 = CONCAT44(local_59c0,local_59c0);
          local_59c8 = local_6690 + 10;
          local_5a00 = *local_59c8;
          local_3f80 = CONCAT44(local_5a00,local_5a00);
          uStack_3f78 = CONCAT44(local_5a00,local_5a00);
          uStack_3f70 = CONCAT44(local_5a00,local_5a00);
          uStack_3f68 = CONCAT44(local_5a00,local_5a00);
          local_5a08 = local_6690 + 0xb;
          local_5a40 = *local_5a08;
          local_3fe0 = CONCAT44(local_5a40,local_5a40);
          uStack_3fd8 = CONCAT44(local_5a40,local_5a40);
          uStack_3fd0 = CONCAT44(local_5a40,local_5a40);
          uStack_3fc8 = CONCAT44(local_5a40,local_5a40);
          local_5a48 = local_6690 + 0xc;
          local_5a80 = *local_5a48;
          local_4040 = CONCAT44(local_5a80,local_5a80);
          uStack_4038 = CONCAT44(local_5a80,local_5a80);
          uStack_4030 = CONCAT44(local_5a80,local_5a80);
          uStack_4028 = CONCAT44(local_5a80,local_5a80);
          local_5a88 = local_6690 + 0xd;
          local_5ac0 = *local_5a88;
          local_40a0 = CONCAT44(local_5ac0,local_5ac0);
          uStack_4098 = CONCAT44(local_5ac0,local_5ac0);
          uStack_4090 = CONCAT44(local_5ac0,local_5ac0);
          uStack_4088 = CONCAT44(local_5ac0,local_5ac0);
          local_5ac8 = local_6690 + 0xe;
          local_5b00 = *local_5ac8;
          local_4100 = CONCAT44(local_5b00,local_5b00);
          uStack_40f8 = CONCAT44(local_5b00,local_5b00);
          uStack_40f0 = CONCAT44(local_5b00,local_5b00);
          uStack_40e8 = CONCAT44(local_5b00,local_5b00);
          local_5b08 = local_6690 + 0xf;
          local_5b40 = *local_5b08;
          local_4160 = CONCAT44(local_5b40,local_5b40);
          uStack_4158 = CONCAT44(local_5b40,local_5b40);
          uStack_4150 = CONCAT44(local_5b40,local_5b40);
          uStack_4148 = CONCAT44(local_5b40,local_5b40);
          local_3ba0 = local_7a40;
          uStack_3b98 = uStack_7a38;
          uStack_3b90 = uStack_7a30;
          uStack_3b88 = uStack_7a28;
          local_3be0 = local_7920;
          uStack_3bd8 = uStack_7918;
          uStack_3bd0 = 0;
          uStack_3bc8 = 0;
          local_1500 = local_7a40;
          uStack_14f8 = uStack_7a38;
          uStack_14f0 = uStack_7a30;
          uStack_14e8 = uStack_7a28;
          local_1540 = local_7920;
          uStack_1538 = uStack_7918;
          uStack_1530 = 0;
          uStack_1528 = 0;
          auVar43._8_8_ = uStack_3eb8;
          auVar43._0_8_ = local_3ec0;
          auVar43._16_8_ = uStack_3eb0;
          auVar43._24_8_ = uStack_3ea8;
          auVar9 = vfmadd213ps_fma(auVar43,auVar100,ZEXT1632(auVar9));
          local_7d40 = auVar9._0_8_;
          uStack_7d38 = auVar9._8_8_;
          local_3c00 = local_7a60;
          uStack_3bf8 = uStack_7a58;
          uStack_3bf0 = uStack_7a50;
          uStack_3be8 = uStack_7a48;
          local_3c40 = local_7d40;
          uStack_3c38 = uStack_7d38;
          uStack_3c30 = 0;
          uStack_3c28 = 0;
          local_14a0 = local_7a60;
          uStack_1498 = uStack_7a58;
          uStack_1490 = uStack_7a50;
          uStack_1488 = uStack_7a48;
          local_14e0 = local_7d40;
          uStack_14d8 = uStack_7d38;
          uStack_14d0 = 0;
          uStack_14c8 = 0;
          auVar44._8_8_ = uStack_3f18;
          auVar44._0_8_ = local_3f20;
          auVar44._16_8_ = uStack_3f10;
          auVar44._24_8_ = uStack_3f08;
          auVar9 = vfmadd213ps_fma(auVar44,auVar1,ZEXT1632(auVar9));
          local_7d60 = auVar9._0_8_;
          uStack_7d58 = auVar9._8_8_;
          local_3c60 = local_7a80;
          uStack_3c58 = uStack_7a78;
          uStack_3c50 = uStack_7a70;
          uStack_3c48 = uStack_7a68;
          local_3ca0 = local_7d60;
          uStack_3c98 = uStack_7d58;
          uStack_3c90 = 0;
          uStack_3c88 = 0;
          local_1440 = local_7a80;
          uStack_1438 = uStack_7a78;
          uStack_1430 = uStack_7a70;
          uStack_1428 = uStack_7a68;
          local_1480 = local_7d60;
          uStack_1478 = uStack_7d58;
          uStack_1470 = 0;
          uStack_1468 = 0;
          auVar45._8_8_ = uStack_3f78;
          auVar45._0_8_ = local_3f80;
          auVar45._16_8_ = uStack_3f70;
          auVar45._24_8_ = uStack_3f68;
          auVar9 = vfmadd213ps_fma(auVar45,auVar2,ZEXT1632(auVar9));
          local_7d80 = auVar9._0_8_;
          uStack_7d78 = auVar9._8_8_;
          local_3cc0 = local_7aa0;
          uStack_3cb8 = uStack_7a98;
          uStack_3cb0 = uStack_7a90;
          uStack_3ca8 = uStack_7a88;
          local_3d00 = local_7d80;
          uStack_3cf8 = uStack_7d78;
          uStack_3cf0 = 0;
          uStack_3ce8 = 0;
          local_13e0 = local_7aa0;
          uStack_13d8 = uStack_7a98;
          uStack_13d0 = uStack_7a90;
          uStack_13c8 = uStack_7a88;
          local_1420 = local_7d80;
          uStack_1418 = uStack_7d78;
          uStack_1410 = 0;
          uStack_1408 = 0;
          auVar46._8_8_ = uStack_3fd8;
          auVar46._0_8_ = local_3fe0;
          auVar46._16_8_ = uStack_3fd0;
          auVar46._24_8_ = uStack_3fc8;
          auVar9 = vfmadd213ps_fma(auVar46,auVar3,ZEXT1632(auVar9));
          local_7da0 = auVar9._0_8_;
          uStack_7d98 = auVar9._8_8_;
          local_3d20 = local_7b40;
          uStack_3d18 = uStack_7b38;
          uStack_3d10 = uStack_7b30;
          uStack_3d08 = uStack_7b28;
          local_3d60 = local_7da0;
          uStack_3d58 = uStack_7d98;
          uStack_3d50 = 0;
          uStack_3d48 = 0;
          local_1380 = local_7b40;
          uStack_1378 = uStack_7b38;
          uStack_1370 = uStack_7b30;
          uStack_1368 = uStack_7b28;
          local_13c0 = local_7da0;
          uStack_13b8 = uStack_7d98;
          uStack_13b0 = 0;
          uStack_13a8 = 0;
          auVar47._8_8_ = uStack_4038;
          auVar47._0_8_ = local_4040;
          auVar47._16_8_ = uStack_4030;
          auVar47._24_8_ = uStack_4028;
          auVar9 = vfmadd213ps_fma(auVar47,auVar4,ZEXT1632(auVar9));
          local_7dc0 = auVar9._0_8_;
          uStack_7db8 = auVar9._8_8_;
          local_3d80 = local_7b60;
          uStack_3d78 = uStack_7b58;
          uStack_3d70 = uStack_7b50;
          uStack_3d68 = uStack_7b48;
          local_3dc0 = local_7dc0;
          uStack_3db8 = uStack_7db8;
          uStack_3db0 = 0;
          uStack_3da8 = 0;
          local_1320 = local_7b60;
          uStack_1318 = uStack_7b58;
          uStack_1310 = uStack_7b50;
          uStack_1308 = uStack_7b48;
          local_1360 = local_7dc0;
          uStack_1358 = uStack_7db8;
          uStack_1350 = 0;
          uStack_1348 = 0;
          auVar48._8_8_ = uStack_4098;
          auVar48._0_8_ = local_40a0;
          auVar48._16_8_ = uStack_4090;
          auVar48._24_8_ = uStack_4088;
          auVar9 = vfmadd213ps_fma(auVar48,auVar5,ZEXT1632(auVar9));
          local_7de0 = auVar9._0_8_;
          uStack_7dd8 = auVar9._8_8_;
          local_3de0 = local_7b80;
          uStack_3dd8 = uStack_7b78;
          uStack_3dd0 = uStack_7b70;
          uStack_3dc8 = uStack_7b68;
          local_3e20 = local_7de0;
          uStack_3e18 = uStack_7dd8;
          uStack_3e10 = 0;
          uStack_3e08 = 0;
          local_12c0 = local_7b80;
          uStack_12b8 = uStack_7b78;
          uStack_12b0 = uStack_7b70;
          uStack_12a8 = uStack_7b68;
          local_1300 = local_7de0;
          uStack_12f8 = uStack_7dd8;
          uStack_12f0 = 0;
          uStack_12e8 = 0;
          auVar49._8_8_ = uStack_40f8;
          auVar49._0_8_ = local_4100;
          auVar49._16_8_ = uStack_40f0;
          auVar49._24_8_ = uStack_40e8;
          auVar9 = vfmadd213ps_fma(auVar49,auVar6,ZEXT1632(auVar9));
          local_7e00 = auVar9._0_8_;
          uStack_7df8 = auVar9._8_8_;
          local_3e40 = local_7ba0;
          uStack_3e38 = uStack_7b98;
          uStack_3e30 = uStack_7b90;
          uStack_3e28 = uStack_7b88;
          local_3e80 = local_7e00;
          uStack_3e78 = uStack_7df8;
          uStack_3e70 = 0;
          uStack_3e68 = 0;
          local_1260 = local_7ba0;
          uStack_1258 = uStack_7b98;
          uStack_1250 = uStack_7b90;
          uStack_1248 = uStack_7b88;
          local_12a0 = local_7e00;
          uStack_1298 = uStack_7df8;
          uStack_1290 = 0;
          uStack_1288 = 0;
          auVar50._8_8_ = uStack_4158;
          auVar50._0_8_ = local_4160;
          auVar50._16_8_ = uStack_4150;
          auVar50._24_8_ = uStack_4148;
          auVar9 = vfmadd213ps_fma(auVar50,auVar7,ZEXT1632(auVar9));
          local_7e20 = auVar9._0_8_;
          uStack_7e18 = auVar9._8_8_;
          local_2900 = vlddqu_avx(*local_2b48);
          auVar100 = vcvtph2ps_f16c(local_2900);
          local_7e40 = auVar100._0_8_;
          uStack_7e38 = auVar100._8_8_;
          uStack_7e30 = auVar100._16_8_;
          uStack_7e28 = auVar100._24_8_;
          local_2b50 = pauVar99 + 0x19;
          local_28f0 = vlddqu_avx(*local_2b50);
          auVar1 = vcvtph2ps_f16c(local_28f0);
          local_7e60 = auVar1._0_8_;
          uStack_7e58 = auVar1._8_8_;
          uStack_7e50 = auVar1._16_8_;
          uStack_7e48 = auVar1._24_8_;
          local_2b58 = pauVar99 + 0x1a;
          local_28e0 = vlddqu_avx(*local_2b58);
          auVar2 = vcvtph2ps_f16c(local_28e0);
          local_7e80 = auVar2._0_8_;
          uStack_7e78 = auVar2._8_8_;
          uStack_7e70 = auVar2._16_8_;
          uStack_7e68 = auVar2._24_8_;
          local_2b60 = pauVar99 + 0x1b;
          local_28d0 = vlddqu_avx(*local_2b60);
          auVar3 = vcvtph2ps_f16c(local_28d0);
          local_7ea0 = auVar3._0_8_;
          uStack_7e98 = auVar3._8_8_;
          uStack_7e90 = auVar3._16_8_;
          uStack_7e88 = auVar3._24_8_;
          local_2b68 = pauVar99 + 0x1c;
          local_3ea0 = local_7e40;
          uStack_3e98 = uStack_7e38;
          uStack_3e90 = uStack_7e30;
          uStack_3e88 = uStack_7e28;
          local_3ee0 = local_7c20;
          uStack_3ed8 = uStack_7c18;
          uStack_3ed0 = 0;
          uStack_3ec8 = 0;
          local_1200 = local_7e40;
          uStack_11f8 = uStack_7e38;
          uStack_11f0 = uStack_7e30;
          uStack_11e8 = uStack_7e28;
          local_1240 = local_7c20;
          uStack_1238 = uStack_7c18;
          uStack_1230 = 0;
          uStack_1228 = 0;
          auVar51._8_8_ = uStack_3eb8;
          auVar51._0_8_ = local_3ec0;
          auVar51._16_8_ = uStack_3eb0;
          auVar51._24_8_ = uStack_3ea8;
          auVar8 = vfmadd213ps_fma(auVar51,auVar100,ZEXT1632(auVar8));
          local_7ec0 = auVar8._0_8_;
          uStack_7eb8 = auVar8._8_8_;
          local_3f00 = local_7e60;
          uStack_3ef8 = uStack_7e58;
          uStack_3ef0 = uStack_7e50;
          uStack_3ee8 = uStack_7e48;
          local_3f40 = local_7ec0;
          uStack_3f38 = uStack_7eb8;
          uStack_3f30 = 0;
          uStack_3f28 = 0;
          local_11a0 = local_7e60;
          uStack_1198 = uStack_7e58;
          uStack_1190 = uStack_7e50;
          uStack_1188 = uStack_7e48;
          local_11e0 = local_7ec0;
          uStack_11d8 = uStack_7eb8;
          uStack_11d0 = 0;
          uStack_11c8 = 0;
          auVar52._8_8_ = uStack_3f18;
          auVar52._0_8_ = local_3f20;
          auVar52._16_8_ = uStack_3f10;
          auVar52._24_8_ = uStack_3f08;
          auVar8 = vfmadd213ps_fma(auVar52,auVar1,ZEXT1632(auVar8));
          local_7ee0 = auVar8._0_8_;
          uStack_7ed8 = auVar8._8_8_;
          local_3f60 = local_7e80;
          uStack_3f58 = uStack_7e78;
          uStack_3f50 = uStack_7e70;
          uStack_3f48 = uStack_7e68;
          local_3fa0 = local_7ee0;
          uStack_3f98 = uStack_7ed8;
          uStack_3f90 = 0;
          uStack_3f88 = 0;
          local_1140 = local_7e80;
          uStack_1138 = uStack_7e78;
          uStack_1130 = uStack_7e70;
          uStack_1128 = uStack_7e68;
          local_1180 = local_7ee0;
          uStack_1178 = uStack_7ed8;
          uStack_1170 = 0;
          uStack_1168 = 0;
          auVar53._8_8_ = uStack_3f78;
          auVar53._0_8_ = local_3f80;
          auVar53._16_8_ = uStack_3f70;
          auVar53._24_8_ = uStack_3f68;
          auVar8 = vfmadd213ps_fma(auVar53,auVar2,ZEXT1632(auVar8));
          local_7f00 = auVar8._0_8_;
          uStack_7ef8 = auVar8._8_8_;
          local_3fc0 = local_7ea0;
          uStack_3fb8 = uStack_7e98;
          uStack_3fb0 = uStack_7e90;
          uStack_3fa8 = uStack_7e88;
          local_4000 = local_7f00;
          uStack_3ff8 = uStack_7ef8;
          uStack_3ff0 = 0;
          uStack_3fe8 = 0;
          local_10e0 = local_7ea0;
          uStack_10d8 = uStack_7e98;
          uStack_10d0 = uStack_7e90;
          uStack_10c8 = uStack_7e88;
          local_1120 = local_7f00;
          uStack_1118 = uStack_7ef8;
          uStack_1110 = 0;
          uStack_1108 = 0;
          auVar54._8_8_ = uStack_3fd8;
          auVar54._0_8_ = local_3fe0;
          auVar54._16_8_ = uStack_3fd0;
          auVar54._24_8_ = uStack_3fc8;
          auVar8 = vfmadd213ps_fma(auVar54,auVar3,ZEXT1632(auVar8));
          local_7f20 = auVar8._0_8_;
          uStack_7f18 = auVar8._8_8_;
          local_28c0 = vlddqu_avx(*local_2b68);
          auVar4 = vcvtph2ps_f16c(local_28c0);
          local_7f40 = auVar4._0_8_;
          uStack_7f38 = auVar4._8_8_;
          uStack_7f30 = auVar4._16_8_;
          uStack_7f28 = auVar4._24_8_;
          local_2b70 = pauVar99 + 0x1d;
          local_28b0 = vlddqu_avx(*local_2b70);
          auVar5 = vcvtph2ps_f16c(local_28b0);
          local_7f60 = auVar5._0_8_;
          uStack_7f58 = auVar5._8_8_;
          uStack_7f50 = auVar5._16_8_;
          uStack_7f48 = auVar5._24_8_;
          local_2b78 = pauVar99 + 0x1e;
          local_28a0 = vlddqu_avx(*local_2b78);
          auVar6 = vcvtph2ps_f16c(local_28a0);
          local_7f80 = auVar6._0_8_;
          uStack_7f78 = auVar6._8_8_;
          uStack_7f70 = auVar6._16_8_;
          uStack_7f68 = auVar6._24_8_;
          local_2b80 = pauVar99 + 0x1f;
          local_2890 = vlddqu_avx(*local_2b80);
          auVar7 = vcvtph2ps_f16c(local_2890);
          local_7fa0 = auVar7._0_8_;
          uStack_7f98 = auVar7._8_8_;
          uStack_7f90 = auVar7._16_8_;
          uStack_7f88 = auVar7._24_8_;
          local_4020 = local_7f40;
          uStack_4018 = uStack_7f38;
          uStack_4010 = uStack_7f30;
          uStack_4008 = uStack_7f28;
          local_4060 = local_7f20;
          uStack_4058 = uStack_7f18;
          uStack_4050 = 0;
          uStack_4048 = 0;
          local_1080 = local_7f40;
          uStack_1078 = uStack_7f38;
          uStack_1070 = uStack_7f30;
          uStack_1068 = uStack_7f28;
          local_10c0 = local_7f20;
          uStack_10b8 = uStack_7f18;
          uStack_10b0 = 0;
          uStack_10a8 = 0;
          auVar55._8_8_ = uStack_4038;
          auVar55._0_8_ = local_4040;
          auVar55._16_8_ = uStack_4030;
          auVar55._24_8_ = uStack_4028;
          auVar8 = vfmadd213ps_fma(auVar55,auVar4,ZEXT1632(auVar8));
          local_7fc0 = auVar8._0_8_;
          uStack_7fb8 = auVar8._8_8_;
          local_4080 = local_7f60;
          uStack_4078 = uStack_7f58;
          uStack_4070 = uStack_7f50;
          uStack_4068 = uStack_7f48;
          local_40c0 = local_7fc0;
          uStack_40b8 = uStack_7fb8;
          uStack_40b0 = 0;
          uStack_40a8 = 0;
          local_1020 = local_7f60;
          uStack_1018 = uStack_7f58;
          uStack_1010 = uStack_7f50;
          uStack_1008 = uStack_7f48;
          local_1060 = local_7fc0;
          uStack_1058 = uStack_7fb8;
          uStack_1050 = 0;
          uStack_1048 = 0;
          auVar56._8_8_ = uStack_4098;
          auVar56._0_8_ = local_40a0;
          auVar56._16_8_ = uStack_4090;
          auVar56._24_8_ = uStack_4088;
          auVar8 = vfmadd213ps_fma(auVar56,auVar5,ZEXT1632(auVar8));
          local_7fe0 = auVar8._0_8_;
          uStack_7fd8 = auVar8._8_8_;
          local_40e0 = local_7f80;
          uStack_40d8 = uStack_7f78;
          uStack_40d0 = uStack_7f70;
          uStack_40c8 = uStack_7f68;
          local_4120 = local_7fe0;
          uStack_4118 = uStack_7fd8;
          uStack_4110 = 0;
          uStack_4108 = 0;
          local_fc0 = local_7f80;
          uStack_fb8 = uStack_7f78;
          uStack_fb0 = uStack_7f70;
          uStack_fa8 = uStack_7f68;
          local_1000 = local_7fe0;
          uStack_ff8 = uStack_7fd8;
          uStack_ff0 = 0;
          uStack_fe8 = 0;
          auVar57._8_8_ = uStack_40f8;
          auVar57._0_8_ = local_4100;
          auVar57._16_8_ = uStack_40f0;
          auVar57._24_8_ = uStack_40e8;
          auVar8 = vfmadd213ps_fma(auVar57,auVar6,ZEXT1632(auVar8));
          local_8000 = auVar8._0_8_;
          uStack_7ff8 = auVar8._8_8_;
          local_4140 = local_7fa0;
          uStack_4138 = uStack_7f98;
          uStack_4130 = uStack_7f90;
          uStack_4128 = uStack_7f88;
          local_4180 = local_8000;
          uStack_4178 = uStack_7ff8;
          uStack_4170 = 0;
          uStack_4168 = 0;
          local_f60 = local_7fa0;
          uStack_f58 = uStack_7f98;
          uStack_f50 = uStack_7f90;
          uStack_f48 = uStack_7f88;
          local_fa0 = local_8000;
          uStack_f98 = uStack_7ff8;
          uStack_f90 = 0;
          uStack_f88 = 0;
          auVar58._8_8_ = uStack_4158;
          auVar58._0_8_ = local_4160;
          auVar58._16_8_ = uStack_4150;
          auVar58._24_8_ = uStack_4148;
          auVar8 = vfmadd213ps_fma(auVar58,auVar7,ZEXT1632(auVar8));
          local_8020 = auVar8._0_8_;
          uStack_8018 = auVar8._8_8_;
          local_5b48 = local_6690 + 0x10;
          local_5b80 = *local_5b48;
          local_41c0 = CONCAT44(local_5b80,local_5b80);
          uStack_41b8 = CONCAT44(local_5b80,local_5b80);
          uStack_41b0 = CONCAT44(local_5b80,local_5b80);
          uStack_41a8 = CONCAT44(local_5b80,local_5b80);
          local_5b88 = local_6690 + 0x11;
          local_5bc0 = *local_5b88;
          local_4220 = CONCAT44(local_5bc0,local_5bc0);
          uStack_4218 = CONCAT44(local_5bc0,local_5bc0);
          uStack_4210 = CONCAT44(local_5bc0,local_5bc0);
          uStack_4208 = CONCAT44(local_5bc0,local_5bc0);
          local_5bc8 = local_6690 + 0x12;
          local_5c00 = *local_5bc8;
          local_4280 = CONCAT44(local_5c00,local_5c00);
          uStack_4278 = CONCAT44(local_5c00,local_5c00);
          uStack_4270 = CONCAT44(local_5c00,local_5c00);
          uStack_4268 = CONCAT44(local_5c00,local_5c00);
          local_5c08 = local_6690 + 0x13;
          local_5c40 = *local_5c08;
          local_42e0 = CONCAT44(local_5c40,local_5c40);
          uStack_42d8 = CONCAT44(local_5c40,local_5c40);
          uStack_42d0 = CONCAT44(local_5c40,local_5c40);
          uStack_42c8 = CONCAT44(local_5c40,local_5c40);
          local_5c48 = local_6690 + 0x14;
          local_5c80 = *local_5c48;
          local_4340 = CONCAT44(local_5c80,local_5c80);
          uStack_4338 = CONCAT44(local_5c80,local_5c80);
          uStack_4330 = CONCAT44(local_5c80,local_5c80);
          uStack_4328 = CONCAT44(local_5c80,local_5c80);
          local_5c88 = local_6690 + 0x15;
          local_5cc0 = *local_5c88;
          local_43a0 = CONCAT44(local_5cc0,local_5cc0);
          uStack_4398 = CONCAT44(local_5cc0,local_5cc0);
          uStack_4390 = CONCAT44(local_5cc0,local_5cc0);
          uStack_4388 = CONCAT44(local_5cc0,local_5cc0);
          local_5cc8 = local_6690 + 0x16;
          local_5d00 = *local_5cc8;
          local_4400 = CONCAT44(local_5d00,local_5d00);
          uStack_43f8 = CONCAT44(local_5d00,local_5d00);
          uStack_43f0 = CONCAT44(local_5d00,local_5d00);
          uStack_43e8 = CONCAT44(local_5d00,local_5d00);
          local_5d08 = local_6690 + 0x17;
          local_5d40 = *local_5d08;
          local_4460 = CONCAT44(local_5d40,local_5d40);
          uStack_4458 = CONCAT44(local_5d40,local_5d40);
          uStack_4450 = CONCAT44(local_5d40,local_5d40);
          uStack_4448 = CONCAT44(local_5d40,local_5d40);
          local_41a0 = local_7e40;
          uStack_4198 = uStack_7e38;
          uStack_4190 = uStack_7e30;
          uStack_4188 = uStack_7e28;
          local_41e0 = local_7e20;
          uStack_41d8 = uStack_7e18;
          uStack_41d0 = 0;
          uStack_41c8 = 0;
          local_f00 = local_7e40;
          uStack_ef8 = uStack_7e38;
          uStack_ef0 = uStack_7e30;
          uStack_ee8 = uStack_7e28;
          local_f40 = local_7e20;
          uStack_f38 = uStack_7e18;
          uStack_f30 = 0;
          uStack_f28 = 0;
          auVar59._8_8_ = uStack_41b8;
          auVar59._0_8_ = local_41c0;
          auVar59._16_8_ = uStack_41b0;
          auVar59._24_8_ = uStack_41a8;
          auVar8 = vfmadd213ps_fma(auVar59,auVar100,ZEXT1632(auVar9));
          local_8140 = auVar8._0_8_;
          uStack_8138 = auVar8._8_8_;
          local_4200 = local_7e60;
          uStack_41f8 = uStack_7e58;
          uStack_41f0 = uStack_7e50;
          uStack_41e8 = uStack_7e48;
          local_4240 = local_8140;
          uStack_4238 = uStack_8138;
          uStack_4230 = 0;
          uStack_4228 = 0;
          local_ea0 = local_7e60;
          uStack_e98 = uStack_7e58;
          uStack_e90 = uStack_7e50;
          uStack_e88 = uStack_7e48;
          local_ee0 = local_8140;
          uStack_ed8 = uStack_8138;
          uStack_ed0 = 0;
          uStack_ec8 = 0;
          auVar60._8_8_ = uStack_4218;
          auVar60._0_8_ = local_4220;
          auVar60._16_8_ = uStack_4210;
          auVar60._24_8_ = uStack_4208;
          auVar8 = vfmadd213ps_fma(auVar60,auVar1,ZEXT1632(auVar8));
          local_8160 = auVar8._0_8_;
          uStack_8158 = auVar8._8_8_;
          local_4260 = local_7e80;
          uStack_4258 = uStack_7e78;
          uStack_4250 = uStack_7e70;
          uStack_4248 = uStack_7e68;
          local_42a0 = local_8160;
          uStack_4298 = uStack_8158;
          uStack_4290 = 0;
          uStack_4288 = 0;
          local_e40 = local_7e80;
          uStack_e38 = uStack_7e78;
          uStack_e30 = uStack_7e70;
          uStack_e28 = uStack_7e68;
          local_e80 = local_8160;
          uStack_e78 = uStack_8158;
          uStack_e70 = 0;
          uStack_e68 = 0;
          auVar61._8_8_ = uStack_4278;
          auVar61._0_8_ = local_4280;
          auVar61._16_8_ = uStack_4270;
          auVar61._24_8_ = uStack_4268;
          auVar8 = vfmadd213ps_fma(auVar61,auVar2,ZEXT1632(auVar8));
          local_8180 = auVar8._0_8_;
          uStack_8178 = auVar8._8_8_;
          local_42c0 = local_7ea0;
          uStack_42b8 = uStack_7e98;
          uStack_42b0 = uStack_7e90;
          uStack_42a8 = uStack_7e88;
          local_4300 = local_8180;
          uStack_42f8 = uStack_8178;
          uStack_42f0 = 0;
          uStack_42e8 = 0;
          local_de0 = local_7ea0;
          uStack_dd8 = uStack_7e98;
          uStack_dd0 = uStack_7e90;
          uStack_dc8 = uStack_7e88;
          local_e20 = local_8180;
          uStack_e18 = uStack_8178;
          uStack_e10 = 0;
          uStack_e08 = 0;
          auVar62._8_8_ = uStack_42d8;
          auVar62._0_8_ = local_42e0;
          auVar62._16_8_ = uStack_42d0;
          auVar62._24_8_ = uStack_42c8;
          auVar8 = vfmadd213ps_fma(auVar62,auVar3,ZEXT1632(auVar8));
          local_81a0 = auVar8._0_8_;
          uStack_8198 = auVar8._8_8_;
          local_4320 = local_7f40;
          uStack_4318 = uStack_7f38;
          uStack_4310 = uStack_7f30;
          uStack_4308 = uStack_7f28;
          local_4360 = local_81a0;
          uStack_4358 = uStack_8198;
          uStack_4350 = 0;
          uStack_4348 = 0;
          local_d80 = local_7f40;
          uStack_d78 = uStack_7f38;
          uStack_d70 = uStack_7f30;
          uStack_d68 = uStack_7f28;
          local_dc0 = local_81a0;
          uStack_db8 = uStack_8198;
          uStack_db0 = 0;
          uStack_da8 = 0;
          auVar63._8_8_ = uStack_4338;
          auVar63._0_8_ = local_4340;
          auVar63._16_8_ = uStack_4330;
          auVar63._24_8_ = uStack_4328;
          auVar8 = vfmadd213ps_fma(auVar63,auVar4,ZEXT1632(auVar8));
          local_81c0 = auVar8._0_8_;
          uStack_81b8 = auVar8._8_8_;
          local_4380 = local_7f60;
          uStack_4378 = uStack_7f58;
          uStack_4370 = uStack_7f50;
          uStack_4368 = uStack_7f48;
          local_43c0 = local_81c0;
          uStack_43b8 = uStack_81b8;
          uStack_43b0 = 0;
          uStack_43a8 = 0;
          local_d20 = local_7f60;
          uStack_d18 = uStack_7f58;
          uStack_d10 = uStack_7f50;
          uStack_d08 = uStack_7f48;
          local_d60 = local_81c0;
          uStack_d58 = uStack_81b8;
          uStack_d50 = 0;
          uStack_d48 = 0;
          auVar64._8_8_ = uStack_4398;
          auVar64._0_8_ = local_43a0;
          auVar64._16_8_ = uStack_4390;
          auVar64._24_8_ = uStack_4388;
          auVar8 = vfmadd213ps_fma(auVar64,auVar5,ZEXT1632(auVar8));
          local_81e0 = auVar8._0_8_;
          uStack_81d8 = auVar8._8_8_;
          local_43e0 = local_7f80;
          uStack_43d8 = uStack_7f78;
          uStack_43d0 = uStack_7f70;
          uStack_43c8 = uStack_7f68;
          local_4420 = local_81e0;
          uStack_4418 = uStack_81d8;
          uStack_4410 = 0;
          uStack_4408 = 0;
          local_cc0 = local_7f80;
          uStack_cb8 = uStack_7f78;
          uStack_cb0 = uStack_7f70;
          uStack_ca8 = uStack_7f68;
          local_d00 = local_81e0;
          uStack_cf8 = uStack_81d8;
          uStack_cf0 = 0;
          uStack_ce8 = 0;
          auVar65._8_8_ = uStack_43f8;
          auVar65._0_8_ = local_4400;
          auVar65._16_8_ = uStack_43f0;
          auVar65._24_8_ = uStack_43e8;
          auVar8 = vfmadd213ps_fma(auVar65,auVar6,ZEXT1632(auVar8));
          local_8200 = auVar8._0_8_;
          uStack_81f8 = auVar8._8_8_;
          local_4440 = local_7fa0;
          uStack_4438 = uStack_7f98;
          uStack_4430 = uStack_7f90;
          uStack_4428 = uStack_7f88;
          local_4480 = local_8200;
          uStack_4478 = uStack_81f8;
          uStack_4470 = 0;
          uStack_4468 = 0;
          local_c60 = local_7fa0;
          uStack_c58 = uStack_7f98;
          uStack_c50 = uStack_7f90;
          uStack_c48 = uStack_7f88;
          local_ca0 = local_8200;
          uStack_c98 = uStack_81f8;
          uStack_c90 = 0;
          uStack_c88 = 0;
          auVar66._8_8_ = uStack_4458;
          auVar66._0_8_ = local_4460;
          auVar66._16_8_ = uStack_4450;
          auVar66._24_8_ = uStack_4448;
          auVar8 = vfmadd213ps_fma(auVar66,auVar7,ZEXT1632(auVar8));
          local_8220 = auVar8._0_8_;
          uStack_8218 = auVar8._8_8_;
          local_5088 = local_6638;
          local_50c0 = local_8020;
          uStack_50b8 = uStack_8018;
          uStack_50b0 = 0;
          uStack_50a8 = 0;
          *(undefined8 *)*local_6638 = local_8020;
          *(undefined8 *)(*local_6638 + 8) = uStack_8018;
          *(undefined8 *)(*local_6638 + 0x10) = 0;
          *(undefined8 *)(*local_6638 + 0x18) = 0;
          local_50c8 = local_6638 + 1;
          local_5100 = local_8220;
          uStack_50f8 = uStack_8218;
          uStack_50f0 = 0;
          uStack_50e8 = 0;
          *local_50c8 = ZEXT1632(auVar8);
          local_6638 = local_6638 + 2;
          local_6690 = local_5b48;
          local_6688 = local_5548;
          fStack_5d3c = local_5d40;
          fStack_5d38 = local_5d40;
          fStack_5d34 = local_5d40;
          fStack_5d30 = local_5d40;
          fStack_5d2c = local_5d40;
          fStack_5d28 = local_5d40;
          fStack_5d24 = local_5d40;
          local_5d0c = local_5d40;
          fStack_5cfc = local_5d00;
          fStack_5cf8 = local_5d00;
          fStack_5cf4 = local_5d00;
          fStack_5cf0 = local_5d00;
          fStack_5cec = local_5d00;
          fStack_5ce8 = local_5d00;
          fStack_5ce4 = local_5d00;
          local_5ccc = local_5d00;
          fStack_5cbc = local_5cc0;
          fStack_5cb8 = local_5cc0;
          fStack_5cb4 = local_5cc0;
          fStack_5cb0 = local_5cc0;
          fStack_5cac = local_5cc0;
          fStack_5ca8 = local_5cc0;
          fStack_5ca4 = local_5cc0;
          local_5c8c = local_5cc0;
          fStack_5c7c = local_5c80;
          fStack_5c78 = local_5c80;
          fStack_5c74 = local_5c80;
          fStack_5c70 = local_5c80;
          fStack_5c6c = local_5c80;
          fStack_5c68 = local_5c80;
          fStack_5c64 = local_5c80;
          local_5c4c = local_5c80;
          fStack_5c3c = local_5c40;
          fStack_5c38 = local_5c40;
          fStack_5c34 = local_5c40;
          fStack_5c30 = local_5c40;
          fStack_5c2c = local_5c40;
          fStack_5c28 = local_5c40;
          fStack_5c24 = local_5c40;
          local_5c0c = local_5c40;
          fStack_5bfc = local_5c00;
          fStack_5bf8 = local_5c00;
          fStack_5bf4 = local_5c00;
          fStack_5bf0 = local_5c00;
          fStack_5bec = local_5c00;
          fStack_5be8 = local_5c00;
          fStack_5be4 = local_5c00;
          local_5bcc = local_5c00;
          fStack_5bbc = local_5bc0;
          fStack_5bb8 = local_5bc0;
          fStack_5bb4 = local_5bc0;
          fStack_5bb0 = local_5bc0;
          fStack_5bac = local_5bc0;
          fStack_5ba8 = local_5bc0;
          fStack_5ba4 = local_5bc0;
          local_5b8c = local_5bc0;
          fStack_5b7c = local_5b80;
          fStack_5b78 = local_5b80;
          fStack_5b74 = local_5b80;
          fStack_5b70 = local_5b80;
          fStack_5b6c = local_5b80;
          fStack_5b68 = local_5b80;
          fStack_5b64 = local_5b80;
          local_5b4c = local_5b80;
          fStack_5b3c = local_5b40;
          fStack_5b38 = local_5b40;
          fStack_5b34 = local_5b40;
          fStack_5b30 = local_5b40;
          fStack_5b2c = local_5b40;
          fStack_5b28 = local_5b40;
          fStack_5b24 = local_5b40;
          local_5b0c = local_5b40;
          fStack_5afc = local_5b00;
          fStack_5af8 = local_5b00;
          fStack_5af4 = local_5b00;
          fStack_5af0 = local_5b00;
          fStack_5aec = local_5b00;
          fStack_5ae8 = local_5b00;
          fStack_5ae4 = local_5b00;
          local_5acc = local_5b00;
          fStack_5abc = local_5ac0;
          fStack_5ab8 = local_5ac0;
          fStack_5ab4 = local_5ac0;
          fStack_5ab0 = local_5ac0;
          fStack_5aac = local_5ac0;
          fStack_5aa8 = local_5ac0;
          fStack_5aa4 = local_5ac0;
          local_5a8c = local_5ac0;
          fStack_5a7c = local_5a80;
          fStack_5a78 = local_5a80;
          fStack_5a74 = local_5a80;
          fStack_5a70 = local_5a80;
          fStack_5a6c = local_5a80;
          fStack_5a68 = local_5a80;
          fStack_5a64 = local_5a80;
          local_5a4c = local_5a80;
          fStack_5a3c = local_5a40;
          fStack_5a38 = local_5a40;
          fStack_5a34 = local_5a40;
          fStack_5a30 = local_5a40;
          fStack_5a2c = local_5a40;
          fStack_5a28 = local_5a40;
          fStack_5a24 = local_5a40;
          local_5a0c = local_5a40;
          fStack_59fc = local_5a00;
          fStack_59f8 = local_5a00;
          fStack_59f4 = local_5a00;
          fStack_59f0 = local_5a00;
          fStack_59ec = local_5a00;
          fStack_59e8 = local_5a00;
          fStack_59e4 = local_5a00;
          local_59cc = local_5a00;
          fStack_59bc = local_59c0;
          fStack_59b8 = local_59c0;
          fStack_59b4 = local_59c0;
          fStack_59b0 = local_59c0;
          fStack_59ac = local_59c0;
          fStack_59a8 = local_59c0;
          fStack_59a4 = local_59c0;
          local_598c = local_59c0;
          fStack_597c = local_5980;
          fStack_5978 = local_5980;
          fStack_5974 = local_5980;
          fStack_5970 = local_5980;
          fStack_596c = local_5980;
          fStack_5968 = local_5980;
          fStack_5964 = local_5980;
          local_594c = local_5980;
          fStack_593c = local_5940;
          fStack_5938 = local_5940;
          fStack_5934 = local_5940;
          fStack_5930 = local_5940;
          fStack_592c = local_5940;
          fStack_5928 = local_5940;
          fStack_5924 = local_5940;
          local_590c = local_5940;
          fStack_58fc = local_5900;
          fStack_58f8 = local_5900;
          fStack_58f4 = local_5900;
          fStack_58f0 = local_5900;
          fStack_58ec = local_5900;
          fStack_58e8 = local_5900;
          fStack_58e4 = local_5900;
          local_58cc = local_5900;
          fStack_58bc = local_58c0;
          fStack_58b8 = local_58c0;
          fStack_58b4 = local_58c0;
          fStack_58b0 = local_58c0;
          fStack_58ac = local_58c0;
          fStack_58a8 = local_58c0;
          fStack_58a4 = local_58c0;
          local_588c = local_58c0;
          fStack_587c = local_5880;
          fStack_5878 = local_5880;
          fStack_5874 = local_5880;
          fStack_5870 = local_5880;
          fStack_586c = local_5880;
          fStack_5868 = local_5880;
          fStack_5864 = local_5880;
          local_584c = local_5880;
          fStack_583c = local_5840;
          fStack_5838 = local_5840;
          fStack_5834 = local_5840;
          fStack_5830 = local_5840;
          fStack_582c = local_5840;
          fStack_5828 = local_5840;
          fStack_5824 = local_5840;
          local_580c = local_5840;
          fStack_57fc = local_5800;
          fStack_57f8 = local_5800;
          fStack_57f4 = local_5800;
          fStack_57f0 = local_5800;
          fStack_57ec = local_5800;
          fStack_57e8 = local_5800;
          fStack_57e4 = local_5800;
          local_57cc = local_5800;
          fStack_57bc = local_57c0;
          fStack_57b8 = local_57c0;
          fStack_57b4 = local_57c0;
          fStack_57b0 = local_57c0;
          fStack_57ac = local_57c0;
          fStack_57a8 = local_57c0;
          fStack_57a4 = local_57c0;
          local_578c = local_57c0;
          fStack_577c = local_5780;
          fStack_5778 = local_5780;
          fStack_5774 = local_5780;
          fStack_5770 = local_5780;
          fStack_576c = local_5780;
          fStack_5768 = local_5780;
          fStack_5764 = local_5780;
          local_574c = local_5780;
          fStack_573c = local_5740;
          fStack_5738 = local_5740;
          fStack_5734 = local_5740;
          fStack_5730 = local_5740;
          fStack_572c = local_5740;
          fStack_5728 = local_5740;
          fStack_5724 = local_5740;
          local_570c = local_5740;
          fStack_56fc = local_5700;
          fStack_56f8 = local_5700;
          fStack_56f4 = local_5700;
          fStack_56f0 = local_5700;
          fStack_56ec = local_5700;
          fStack_56e8 = local_5700;
          fStack_56e4 = local_5700;
          local_56cc = local_5700;
          fStack_56bc = local_56c0;
          fStack_56b8 = local_56c0;
          fStack_56b4 = local_56c0;
          fStack_56b0 = local_56c0;
          fStack_56ac = local_56c0;
          fStack_56a8 = local_56c0;
          fStack_56a4 = local_56c0;
          local_568c = local_56c0;
          fStack_567c = local_5680;
          fStack_5678 = local_5680;
          fStack_5674 = local_5680;
          fStack_5670 = local_5680;
          fStack_566c = local_5680;
          fStack_5668 = local_5680;
          fStack_5664 = local_5680;
          local_564c = local_5680;
          fStack_563c = local_5640;
          fStack_5638 = local_5640;
          fStack_5634 = local_5640;
          fStack_5630 = local_5640;
          fStack_562c = local_5640;
          fStack_5628 = local_5640;
          fStack_5624 = local_5640;
          local_560c = local_5640;
          fStack_55fc = local_5600;
          fStack_55f8 = local_5600;
          fStack_55f4 = local_5600;
          fStack_55f0 = local_5600;
          fStack_55ec = local_5600;
          fStack_55e8 = local_5600;
          fStack_55e4 = local_5600;
          local_55cc = local_5600;
          fStack_55bc = local_55c0;
          fStack_55b8 = local_55c0;
          fStack_55b4 = local_55c0;
          fStack_55b0 = local_55c0;
          fStack_55ac = local_55c0;
          fStack_55a8 = local_55c0;
          fStack_55a4 = local_55c0;
          local_558c = local_55c0;
          fStack_557c = local_5580;
          fStack_5578 = local_5580;
          fStack_5574 = local_5580;
          fStack_5570 = local_5580;
          fStack_556c = local_5580;
          fStack_5568 = local_5580;
          fStack_5564 = local_5580;
          local_554c = local_5580;
          fStack_553c = local_5540;
          fStack_5538 = local_5540;
          fStack_5534 = local_5540;
          fStack_5530 = local_5540;
          fStack_552c = local_5540;
          fStack_5528 = local_5540;
          fStack_5524 = local_5540;
          local_550c = local_5540;
          fStack_54fc = local_5500;
          fStack_54f8 = local_5500;
          fStack_54f4 = local_5500;
          fStack_54f0 = local_5500;
          fStack_54ec = local_5500;
          fStack_54e8 = local_5500;
          fStack_54e4 = local_5500;
          local_54cc = local_5500;
          fStack_54bc = local_54c0;
          fStack_54b8 = local_54c0;
          fStack_54b4 = local_54c0;
          fStack_54b0 = local_54c0;
          fStack_54ac = local_54c0;
          fStack_54a8 = local_54c0;
          fStack_54a4 = local_54c0;
          local_548c = local_54c0;
          fStack_547c = local_5480;
          fStack_5478 = local_5480;
          fStack_5474 = local_5480;
          fStack_5470 = local_5480;
          fStack_546c = local_5480;
          fStack_5468 = local_5480;
          fStack_5464 = local_5480;
          local_544c = local_5480;
          fStack_543c = local_5440;
          fStack_5438 = local_5440;
          fStack_5434 = local_5440;
          fStack_5430 = local_5440;
          fStack_542c = local_5440;
          fStack_5428 = local_5440;
          fStack_5424 = local_5440;
          local_540c = local_5440;
          fStack_53fc = local_5400;
          fStack_53f8 = local_5400;
          fStack_53f4 = local_5400;
          fStack_53f0 = local_5400;
          fStack_53ec = local_5400;
          fStack_53e8 = local_5400;
          fStack_53e4 = local_5400;
          local_53cc = local_5400;
          fStack_53bc = local_53c0;
          fStack_53b8 = local_53c0;
          fStack_53b4 = local_53c0;
          fStack_53b0 = local_53c0;
          fStack_53ac = local_53c0;
          fStack_53a8 = local_53c0;
          fStack_53a4 = local_53c0;
          local_538c = local_53c0;
          fStack_537c = local_5380;
          fStack_5378 = local_5380;
          fStack_5374 = local_5380;
          fStack_5370 = local_5380;
          fStack_536c = local_5380;
          fStack_5368 = local_5380;
          fStack_5364 = local_5380;
          local_534c = local_5380;
          fStack_533c = local_5340;
          fStack_5338 = local_5340;
          fStack_5334 = local_5340;
          fStack_5330 = local_5340;
          fStack_532c = local_5340;
          fStack_5328 = local_5340;
          fStack_5324 = local_5340;
          local_530c = local_5340;
          fStack_52fc = local_5300;
          fStack_52f8 = local_5300;
          fStack_52f4 = local_5300;
          fStack_52f0 = local_5300;
          fStack_52ec = local_5300;
          fStack_52e8 = local_5300;
          fStack_52e4 = local_5300;
          local_52cc = local_5300;
          fStack_52bc = local_52c0;
          fStack_52b8 = local_52c0;
          fStack_52b4 = local_52c0;
          fStack_52b0 = local_52c0;
          fStack_52ac = local_52c0;
          fStack_52a8 = local_52c0;
          fStack_52a4 = local_52c0;
          local_528c = local_52c0;
          fStack_527c = local_5280;
          fStack_5278 = local_5280;
          fStack_5274 = local_5280;
          fStack_5270 = local_5280;
          fStack_526c = local_5280;
          fStack_5268 = local_5280;
          fStack_5264 = local_5280;
          local_524c = local_5280;
          fStack_523c = local_5240;
          fStack_5238 = local_5240;
          fStack_5234 = local_5240;
          fStack_5230 = local_5240;
          fStack_522c = local_5240;
          fStack_5228 = local_5240;
          fStack_5224 = local_5240;
          local_520c = local_5240;
          fStack_51fc = local_5200;
          fStack_51f8 = local_5200;
          fStack_51f4 = local_5200;
          fStack_51f0 = local_5200;
          fStack_51ec = local_5200;
          fStack_51e8 = local_5200;
          fStack_51e4 = local_5200;
          local_51cc = local_5200;
          fStack_51bc = local_51c0;
          fStack_51b8 = local_51c0;
          fStack_51b4 = local_51c0;
          fStack_51b0 = local_51c0;
          fStack_51ac = local_51c0;
          fStack_51a8 = local_51c0;
          fStack_51a4 = local_51c0;
          local_518c = local_51c0;
          fStack_517c = local_5180;
          fStack_5178 = local_5180;
          fStack_5174 = local_5180;
          fStack_5170 = local_5180;
          fStack_516c = local_5180;
          fStack_5168 = local_5180;
          fStack_5164 = local_5180;
          local_514c = local_5180;
          local_3e60 = local_4160;
          uStack_3e58 = uStack_4158;
          uStack_3e50 = uStack_4150;
          uStack_3e48 = uStack_4148;
          local_3e00 = local_4100;
          uStack_3df8 = uStack_40f8;
          uStack_3df0 = uStack_40f0;
          uStack_3de8 = uStack_40e8;
          local_3da0 = local_40a0;
          uStack_3d98 = uStack_4098;
          uStack_3d90 = uStack_4090;
          uStack_3d88 = uStack_4088;
          local_3d40 = local_4040;
          uStack_3d38 = uStack_4038;
          uStack_3d30 = uStack_4030;
          uStack_3d28 = uStack_4028;
          local_3ce0 = local_3fe0;
          uStack_3cd8 = uStack_3fd8;
          uStack_3cd0 = uStack_3fd0;
          uStack_3cc8 = uStack_3fc8;
          local_3c80 = local_3f80;
          uStack_3c78 = uStack_3f78;
          uStack_3c70 = uStack_3f70;
          uStack_3c68 = uStack_3f68;
          local_3c20 = local_3f20;
          uStack_3c18 = uStack_3f18;
          uStack_3c10 = uStack_3f10;
          uStack_3c08 = uStack_3f08;
          local_3bc0 = local_3ec0;
          uStack_3bb8 = uStack_3eb8;
          uStack_3bb0 = uStack_3eb0;
          uStack_3ba8 = uStack_3ea8;
          local_3260 = local_3560;
          uStack_3258 = uStack_3558;
          uStack_3250 = uStack_3550;
          uStack_3248 = uStack_3548;
          local_3200 = local_3500;
          uStack_31f8 = uStack_34f8;
          uStack_31f0 = uStack_34f0;
          uStack_31e8 = uStack_34e8;
          local_31a0 = local_34a0;
          uStack_3198 = uStack_3498;
          uStack_3190 = uStack_3490;
          uStack_3188 = uStack_3488;
          local_3140 = local_3440;
          uStack_3138 = uStack_3438;
          uStack_3130 = uStack_3430;
          uStack_3128 = uStack_3428;
          local_30e0 = local_33e0;
          uStack_30d8 = uStack_33d8;
          uStack_30d0 = uStack_33d0;
          uStack_30c8 = uStack_33c8;
          local_3080 = local_3380;
          uStack_3078 = uStack_3378;
          uStack_3070 = uStack_3370;
          uStack_3068 = uStack_3368;
          local_3020 = local_3320;
          uStack_3018 = uStack_3318;
          uStack_3010 = uStack_3310;
          uStack_3008 = uStack_3308;
          local_2fc0 = local_32c0;
          uStack_2fb8 = uStack_32b8;
          uStack_2fb0 = uStack_32b0;
          uStack_2fa8 = uStack_32a8;
          local_2a88 = pauVar99;
          local_2680 = pauVar99;
          local_2678 = local_2a90;
          local_2670 = local_2a98;
          local_2668 = local_2aa0;
          local_2660 = local_2aa8;
          local_2658 = local_2ab0;
          local_2650 = local_2ab8;
          local_2648 = local_2ac0;
          local_2640 = local_2ac8;
          local_2638 = local_2ad0;
          local_2630 = local_2ad8;
          local_2628 = local_2ae0;
          local_2620 = local_2ae8;
          local_2618 = local_2af0;
          local_2610 = local_2af8;
          local_2608 = local_2b00;
          local_2600 = local_2b08;
          local_25f8 = local_2b10;
          local_25f0 = local_2b18;
          local_25e8 = local_2b20;
          local_25e0 = local_2b28;
          local_25d8 = local_2b30;
          local_25d0 = local_2b38;
          local_25c8 = local_2b40;
          local_25c0 = local_2b48;
          local_25b8 = local_2b50;
          local_25b0 = local_2b58;
          local_25a8 = local_2b60;
          local_25a0 = local_2b68;
          local_2598 = local_2b70;
          local_2590 = local_2b78;
          local_2588 = local_2b80;
          local_2440 = local_2ce0;
          uStack_2438 = uStack_2cd8;
          uStack_2430 = uStack_2cd0;
          uStack_2428 = uStack_2cc8;
          local_2420 = local_2cc0;
          uStack_2418 = uStack_2cb8;
          uStack_2410 = uStack_2cb0;
          uStack_2408 = uStack_2ca8;
          local_23c0 = local_2d20;
          uStack_23b8 = uStack_2d18;
          uStack_23b0 = uStack_2d10;
          uStack_23a8 = uStack_2d08;
          local_2360 = local_2d80;
          uStack_2358 = uStack_2d78;
          uStack_2350 = uStack_2d70;
          uStack_2348 = uStack_2d68;
          local_2300 = local_2de0;
          uStack_22f8 = uStack_2dd8;
          uStack_22f0 = uStack_2dd0;
          uStack_22e8 = uStack_2dc8;
          local_22a0 = local_2e40;
          uStack_2298 = uStack_2e38;
          uStack_2290 = uStack_2e30;
          uStack_2288 = uStack_2e28;
          local_2240 = local_2ea0;
          uStack_2238 = uStack_2e98;
          uStack_2230 = uStack_2e90;
          uStack_2228 = uStack_2e88;
          local_21e0 = local_2f00;
          uStack_21d8 = uStack_2ef8;
          uStack_21d0 = uStack_2ef0;
          uStack_21c8 = uStack_2ee8;
          local_2180 = local_2f60;
          uStack_2178 = uStack_2f58;
          uStack_2170 = uStack_2f50;
          uStack_2168 = uStack_2f48;
          local_2140 = local_2fe0;
          uStack_2138 = uStack_2fd8;
          uStack_2130 = uStack_2fd0;
          uStack_2128 = uStack_2fc8;
          local_2120 = local_32c0;
          uStack_2118 = uStack_32b8;
          uStack_2110 = uStack_32b0;
          uStack_2108 = uStack_32a8;
          local_20c0 = local_3320;
          uStack_20b8 = uStack_3318;
          uStack_20b0 = uStack_3310;
          uStack_20a8 = uStack_3308;
          local_2060 = local_3380;
          uStack_2058 = uStack_3378;
          uStack_2050 = uStack_3370;
          uStack_2048 = uStack_3368;
          local_2000 = local_33e0;
          uStack_1ff8 = uStack_33d8;
          uStack_1ff0 = uStack_33d0;
          uStack_1fe8 = uStack_33c8;
          local_1fa0 = local_3440;
          uStack_1f98 = uStack_3438;
          uStack_1f90 = uStack_3430;
          uStack_1f88 = uStack_3428;
          local_1f40 = local_34a0;
          uStack_1f38 = uStack_3498;
          uStack_1f30 = uStack_3490;
          uStack_1f28 = uStack_3488;
          local_1ee0 = local_3500;
          uStack_1ed8 = uStack_34f8;
          uStack_1ed0 = uStack_34f0;
          uStack_1ec8 = uStack_34e8;
          local_1e80 = local_3560;
          uStack_1e78 = uStack_3558;
          uStack_1e70 = uStack_3550;
          uStack_1e68 = uStack_3548;
          local_1e20 = local_32c0;
          uStack_1e18 = uStack_32b8;
          uStack_1e10 = uStack_32b0;
          uStack_1e08 = uStack_32a8;
          local_1dc0 = local_3320;
          uStack_1db8 = uStack_3318;
          uStack_1db0 = uStack_3310;
          uStack_1da8 = uStack_3308;
          local_1d60 = local_3380;
          uStack_1d58 = uStack_3378;
          uStack_1d50 = uStack_3370;
          uStack_1d48 = uStack_3368;
          local_1d00 = local_33e0;
          uStack_1cf8 = uStack_33d8;
          uStack_1cf0 = uStack_33d0;
          uStack_1ce8 = uStack_33c8;
          local_1ca0 = local_3440;
          uStack_1c98 = uStack_3438;
          uStack_1c90 = uStack_3430;
          uStack_1c88 = uStack_3428;
          local_1c40 = local_34a0;
          uStack_1c38 = uStack_3498;
          uStack_1c30 = uStack_3490;
          uStack_1c28 = uStack_3488;
          local_1be0 = local_3500;
          uStack_1bd8 = uStack_34f8;
          uStack_1bd0 = uStack_34f0;
          uStack_1bc8 = uStack_34e8;
          local_1b80 = local_3560;
          uStack_1b78 = uStack_3558;
          uStack_1b70 = uStack_3550;
          uStack_1b68 = uStack_3548;
          local_1b20 = local_35c0;
          uStack_1b18 = uStack_35b8;
          uStack_1b10 = uStack_35b0;
          uStack_1b08 = uStack_35a8;
          local_1ac0 = local_3620;
          uStack_1ab8 = uStack_3618;
          uStack_1ab0 = uStack_3610;
          uStack_1aa8 = uStack_3608;
          local_1a60 = local_3680;
          uStack_1a58 = uStack_3678;
          uStack_1a50 = uStack_3670;
          uStack_1a48 = uStack_3668;
          local_1a00 = local_36e0;
          uStack_19f8 = uStack_36d8;
          uStack_19f0 = uStack_36d0;
          uStack_19e8 = uStack_36c8;
          local_19a0 = local_3740;
          uStack_1998 = uStack_3738;
          uStack_1990 = uStack_3730;
          uStack_1988 = uStack_3728;
          local_1940 = local_37a0;
          uStack_1938 = uStack_3798;
          uStack_1930 = uStack_3790;
          uStack_1928 = uStack_3788;
          local_18e0 = local_3800;
          uStack_18d8 = uStack_37f8;
          uStack_18d0 = uStack_37f0;
          uStack_18c8 = uStack_37e8;
          local_1880 = local_3860;
          uStack_1878 = uStack_3858;
          uStack_1870 = uStack_3850;
          uStack_1868 = uStack_3848;
          local_1820 = local_38c0;
          uStack_1818 = uStack_38b8;
          uStack_1810 = uStack_38b0;
          uStack_1808 = uStack_38a8;
          local_17c0 = local_3920;
          uStack_17b8 = uStack_3918;
          uStack_17b0 = uStack_3910;
          uStack_17a8 = uStack_3908;
          local_1760 = local_3980;
          uStack_1758 = uStack_3978;
          uStack_1750 = uStack_3970;
          uStack_1748 = uStack_3968;
          local_1700 = local_39e0;
          uStack_16f8 = uStack_39d8;
          uStack_16f0 = uStack_39d0;
          uStack_16e8 = uStack_39c8;
          local_16a0 = local_3a40;
          uStack_1698 = uStack_3a38;
          uStack_1690 = uStack_3a30;
          uStack_1688 = uStack_3a28;
          local_1640 = local_3aa0;
          uStack_1638 = uStack_3a98;
          uStack_1630 = uStack_3a90;
          uStack_1628 = uStack_3a88;
          local_15e0 = local_3b00;
          uStack_15d8 = uStack_3af8;
          uStack_15d0 = uStack_3af0;
          uStack_15c8 = uStack_3ae8;
          local_1580 = local_3b60;
          uStack_1578 = uStack_3b58;
          uStack_1570 = uStack_3b50;
          uStack_1568 = uStack_3b48;
          local_1520 = local_3ec0;
          uStack_1518 = uStack_3eb8;
          uStack_1510 = uStack_3eb0;
          uStack_1508 = uStack_3ea8;
          local_14c0 = local_3f20;
          uStack_14b8 = uStack_3f18;
          uStack_14b0 = uStack_3f10;
          uStack_14a8 = uStack_3f08;
          local_1460 = local_3f80;
          uStack_1458 = uStack_3f78;
          uStack_1450 = uStack_3f70;
          uStack_1448 = uStack_3f68;
          local_1400 = local_3fe0;
          uStack_13f8 = uStack_3fd8;
          uStack_13f0 = uStack_3fd0;
          uStack_13e8 = uStack_3fc8;
          local_13a0 = local_4040;
          uStack_1398 = uStack_4038;
          uStack_1390 = uStack_4030;
          uStack_1388 = uStack_4028;
          local_1340 = local_40a0;
          uStack_1338 = uStack_4098;
          uStack_1330 = uStack_4090;
          uStack_1328 = uStack_4088;
          local_12e0 = local_4100;
          uStack_12d8 = uStack_40f8;
          uStack_12d0 = uStack_40f0;
          uStack_12c8 = uStack_40e8;
          local_1280 = local_4160;
          uStack_1278 = uStack_4158;
          uStack_1270 = uStack_4150;
          uStack_1268 = uStack_4148;
          local_1220 = local_3ec0;
          uStack_1218 = uStack_3eb8;
          uStack_1210 = uStack_3eb0;
          uStack_1208 = uStack_3ea8;
          local_11c0 = local_3f20;
          uStack_11b8 = uStack_3f18;
          uStack_11b0 = uStack_3f10;
          uStack_11a8 = uStack_3f08;
          local_1160 = local_3f80;
          uStack_1158 = uStack_3f78;
          uStack_1150 = uStack_3f70;
          uStack_1148 = uStack_3f68;
          local_1100 = local_3fe0;
          uStack_10f8 = uStack_3fd8;
          uStack_10f0 = uStack_3fd0;
          uStack_10e8 = uStack_3fc8;
          local_10a0 = local_4040;
          uStack_1098 = uStack_4038;
          uStack_1090 = uStack_4030;
          uStack_1088 = uStack_4028;
          local_1040 = local_40a0;
          uStack_1038 = uStack_4098;
          uStack_1030 = uStack_4090;
          uStack_1028 = uStack_4088;
          local_fe0 = local_4100;
          uStack_fd8 = uStack_40f8;
          uStack_fd0 = uStack_40f0;
          uStack_fc8 = uStack_40e8;
          local_f80 = local_4160;
          uStack_f78 = uStack_4158;
          uStack_f70 = uStack_4150;
          uStack_f68 = uStack_4148;
          local_f20 = local_41c0;
          uStack_f18 = uStack_41b8;
          uStack_f10 = uStack_41b0;
          uStack_f08 = uStack_41a8;
          local_ec0 = local_4220;
          uStack_eb8 = uStack_4218;
          uStack_eb0 = uStack_4210;
          uStack_ea8 = uStack_4208;
          local_e60 = local_4280;
          uStack_e58 = uStack_4278;
          uStack_e50 = uStack_4270;
          uStack_e48 = uStack_4268;
          local_e00 = local_42e0;
          uStack_df8 = uStack_42d8;
          uStack_df0 = uStack_42d0;
          uStack_de8 = uStack_42c8;
          local_da0 = local_4340;
          uStack_d98 = uStack_4338;
          uStack_d90 = uStack_4330;
          uStack_d88 = uStack_4328;
          local_d40 = local_43a0;
          uStack_d38 = uStack_4398;
          uStack_d30 = uStack_4390;
          uStack_d28 = uStack_4388;
          local_ce0 = local_4400;
          uStack_cd8 = uStack_43f8;
          uStack_cd0 = uStack_43f0;
          uStack_cc8 = uStack_43e8;
          local_c80 = local_4460;
          uStack_c78 = uStack_4458;
          uStack_c70 = uStack_4450;
          uStack_c68 = uStack_4448;
        }
        for (; _local_8e00 = auVar100, local_66e8 < local_6598; local_66e8 = local_66e8 + 1) {
          local_6560 = local_6638;
          local_44e0 = *(undefined8 *)*local_6638;
          uStack_44d8 = *(undefined8 *)(*local_6638 + 8);
          uStack_44d0 = *(undefined8 *)(*local_6638 + 0x10);
          uStack_44c8 = *(undefined8 *)(*local_6638 + 0x18);
          local_5d48 = local_6688;
          local_5d80 = *local_6688;
          local_44c0 = CONCAT44(local_5d80,local_5d80);
          uStack_44b8 = CONCAT44(local_5d80,local_5d80);
          uStack_44b0 = CONCAT44(local_5d80,local_5d80);
          uStack_44a8 = CONCAT44(local_5d80,local_5d80);
          local_5d88 = local_6688 + 1;
          local_5dc0 = *local_5d88;
          local_4520 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4518 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4510 = CONCAT44(local_5dc0,local_5dc0);
          uStack_4508 = CONCAT44(local_5dc0,local_5dc0);
          local_5dc8 = local_6688 + 2;
          local_5e00 = *local_5dc8;
          local_4580 = CONCAT44(local_5e00,local_5e00);
          uStack_4578 = CONCAT44(local_5e00,local_5e00);
          uStack_4570 = CONCAT44(local_5e00,local_5e00);
          uStack_4568 = CONCAT44(local_5e00,local_5e00);
          local_5e08 = local_6688 + 3;
          local_5e40 = *local_5e08;
          local_45e0 = CONCAT44(local_5e40,local_5e40);
          uStack_45d8 = CONCAT44(local_5e40,local_5e40);
          uStack_45d0 = CONCAT44(local_5e40,local_5e40);
          uStack_45c8 = CONCAT44(local_5e40,local_5e40);
          local_5e48 = local_6688 + 4;
          local_5e80 = *local_5e48;
          local_4640 = CONCAT44(local_5e80,local_5e80);
          uStack_4638 = CONCAT44(local_5e80,local_5e80);
          uStack_4630 = CONCAT44(local_5e80,local_5e80);
          uStack_4628 = CONCAT44(local_5e80,local_5e80);
          local_5e88 = local_6688 + 5;
          local_5ec0 = *local_5e88;
          local_46a0 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4698 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4690 = CONCAT44(local_5ec0,local_5ec0);
          uStack_4688 = CONCAT44(local_5ec0,local_5ec0);
          local_5ec8 = local_6688 + 6;
          local_5f00 = *local_5ec8;
          local_4700 = CONCAT44(local_5f00,local_5f00);
          uStack_46f8 = CONCAT44(local_5f00,local_5f00);
          uStack_46f0 = CONCAT44(local_5f00,local_5f00);
          uStack_46e8 = CONCAT44(local_5f00,local_5f00);
          local_5f08 = local_6688 + 7;
          local_5f40 = *local_5f08;
          local_4760 = CONCAT44(local_5f40,local_5f40);
          uStack_4758 = CONCAT44(local_5f40,local_5f40);
          uStack_4750 = CONCAT44(local_5f40,local_5f40);
          uStack_4748 = CONCAT44(local_5f40,local_5f40);
          local_2880 = vlddqu_avx(*pauVar99);
          auVar100 = vcvtph2ps_f16c(local_2880);
          local_8360 = auVar100._0_8_;
          uStack_8358 = auVar100._8_8_;
          uStack_8350 = auVar100._16_8_;
          uStack_8348 = auVar100._24_8_;
          local_2b90 = pauVar99 + 1;
          local_2870 = vlddqu_avx(*local_2b90);
          auVar1 = vcvtph2ps_f16c(local_2870);
          local_8380 = auVar1._0_8_;
          uStack_8378 = auVar1._8_8_;
          uStack_8370 = auVar1._16_8_;
          uStack_8368 = auVar1._24_8_;
          local_2b98 = pauVar99 + 2;
          local_2860 = vlddqu_avx(*local_2b98);
          auVar2 = vcvtph2ps_f16c(local_2860);
          local_83a0 = auVar2._0_8_;
          uStack_8398 = auVar2._8_8_;
          uStack_8390 = auVar2._16_8_;
          uStack_8388 = auVar2._24_8_;
          local_2ba0 = pauVar99 + 3;
          local_2850 = vlddqu_avx(*local_2ba0);
          auVar3 = vcvtph2ps_f16c(local_2850);
          local_83c0 = auVar3._0_8_;
          uStack_83b8 = auVar3._8_8_;
          uStack_83b0 = auVar3._16_8_;
          uStack_83a8 = auVar3._24_8_;
          local_2ba8 = pauVar99 + 4;
          local_44a0 = local_8360;
          uStack_4498 = uStack_8358;
          uStack_4490 = uStack_8350;
          uStack_4488 = uStack_8348;
          local_c00 = local_8360;
          uStack_bf8 = uStack_8358;
          uStack_bf0 = uStack_8350;
          uStack_be8 = uStack_8348;
          auVar67._8_8_ = uStack_44b8;
          auVar67._0_8_ = local_44c0;
          auVar67._16_8_ = uStack_44b0;
          auVar67._24_8_ = uStack_44a8;
          auVar8 = vfmadd213ps_fma(auVar67,auVar100,*local_6638);
          local_83e0 = auVar8._0_8_;
          uStack_83d8 = auVar8._8_8_;
          local_4500 = local_8380;
          uStack_44f8 = uStack_8378;
          uStack_44f0 = uStack_8370;
          uStack_44e8 = uStack_8368;
          local_4540 = local_83e0;
          uStack_4538 = uStack_83d8;
          uStack_4530 = 0;
          uStack_4528 = 0;
          local_ba0 = local_8380;
          uStack_b98 = uStack_8378;
          uStack_b90 = uStack_8370;
          uStack_b88 = uStack_8368;
          local_be0 = local_83e0;
          uStack_bd8 = uStack_83d8;
          uStack_bd0 = 0;
          uStack_bc8 = 0;
          auVar68._8_8_ = uStack_4518;
          auVar68._0_8_ = local_4520;
          auVar68._16_8_ = uStack_4510;
          auVar68._24_8_ = uStack_4508;
          auVar8 = vfmadd213ps_fma(auVar68,auVar1,ZEXT1632(auVar8));
          local_8400 = auVar8._0_8_;
          uStack_83f8 = auVar8._8_8_;
          local_4560 = local_83a0;
          uStack_4558 = uStack_8398;
          uStack_4550 = uStack_8390;
          uStack_4548 = uStack_8388;
          local_45a0 = local_8400;
          uStack_4598 = uStack_83f8;
          uStack_4590 = 0;
          uStack_4588 = 0;
          local_b40 = local_83a0;
          uStack_b38 = uStack_8398;
          uStack_b30 = uStack_8390;
          uStack_b28 = uStack_8388;
          local_b80 = local_8400;
          uStack_b78 = uStack_83f8;
          uStack_b70 = 0;
          uStack_b68 = 0;
          auVar69._8_8_ = uStack_4578;
          auVar69._0_8_ = local_4580;
          auVar69._16_8_ = uStack_4570;
          auVar69._24_8_ = uStack_4568;
          auVar8 = vfmadd213ps_fma(auVar69,auVar2,ZEXT1632(auVar8));
          local_8420 = auVar8._0_8_;
          uStack_8418 = auVar8._8_8_;
          local_45c0 = local_83c0;
          uStack_45b8 = uStack_83b8;
          uStack_45b0 = uStack_83b0;
          uStack_45a8 = uStack_83a8;
          local_4600 = local_8420;
          uStack_45f8 = uStack_8418;
          uStack_45f0 = 0;
          uStack_45e8 = 0;
          local_ae0 = local_83c0;
          uStack_ad8 = uStack_83b8;
          uStack_ad0 = uStack_83b0;
          uStack_ac8 = uStack_83a8;
          local_b20 = local_8420;
          uStack_b18 = uStack_8418;
          uStack_b10 = 0;
          uStack_b08 = 0;
          auVar70._8_8_ = uStack_45d8;
          auVar70._0_8_ = local_45e0;
          auVar70._16_8_ = uStack_45d0;
          auVar70._24_8_ = uStack_45c8;
          auVar8 = vfmadd213ps_fma(auVar70,auVar3,ZEXT1632(auVar8));
          local_8440 = auVar8._0_8_;
          uStack_8438 = auVar8._8_8_;
          local_2840 = vlddqu_avx(*local_2ba8);
          auVar100 = vcvtph2ps_f16c(local_2840);
          local_8460 = auVar100._0_8_;
          uStack_8458 = auVar100._8_8_;
          uStack_8450 = auVar100._16_8_;
          uStack_8448 = auVar100._24_8_;
          local_2bb0 = pauVar99 + 5;
          local_2830 = vlddqu_avx(*local_2bb0);
          auVar1 = vcvtph2ps_f16c(local_2830);
          local_8480 = auVar1._0_8_;
          uStack_8478 = auVar1._8_8_;
          uStack_8470 = auVar1._16_8_;
          uStack_8468 = auVar1._24_8_;
          local_2bb8 = pauVar99 + 6;
          local_2820 = vlddqu_avx(*local_2bb8);
          auVar2 = vcvtph2ps_f16c(local_2820);
          local_84a0 = auVar2._0_8_;
          uStack_8498 = auVar2._8_8_;
          uStack_8490 = auVar2._16_8_;
          uStack_8488 = auVar2._24_8_;
          local_2bc0 = pauVar99 + 7;
          local_2810 = vlddqu_avx(*local_2bc0);
          auVar3 = vcvtph2ps_f16c(local_2810);
          local_84c0 = auVar3._0_8_;
          uStack_84b8 = auVar3._8_8_;
          uStack_84b0 = auVar3._16_8_;
          uStack_84a8 = auVar3._24_8_;
          local_2bc8 = pauVar99 + 8;
          local_4620 = local_8460;
          uStack_4618 = uStack_8458;
          uStack_4610 = uStack_8450;
          uStack_4608 = uStack_8448;
          local_4660 = local_8440;
          uStack_4658 = uStack_8438;
          uStack_4650 = 0;
          uStack_4648 = 0;
          local_a80 = local_8460;
          uStack_a78 = uStack_8458;
          uStack_a70 = uStack_8450;
          uStack_a68 = uStack_8448;
          local_ac0 = local_8440;
          uStack_ab8 = uStack_8438;
          uStack_ab0 = 0;
          uStack_aa8 = 0;
          auVar71._8_8_ = uStack_4638;
          auVar71._0_8_ = local_4640;
          auVar71._16_8_ = uStack_4630;
          auVar71._24_8_ = uStack_4628;
          auVar8 = vfmadd213ps_fma(auVar71,auVar100,ZEXT1632(auVar8));
          local_84e0 = auVar8._0_8_;
          uStack_84d8 = auVar8._8_8_;
          local_4680 = local_8480;
          uStack_4678 = uStack_8478;
          uStack_4670 = uStack_8470;
          uStack_4668 = uStack_8468;
          local_46c0 = local_84e0;
          uStack_46b8 = uStack_84d8;
          uStack_46b0 = 0;
          uStack_46a8 = 0;
          local_a20 = local_8480;
          uStack_a18 = uStack_8478;
          uStack_a10 = uStack_8470;
          uStack_a08 = uStack_8468;
          local_a60 = local_84e0;
          uStack_a58 = uStack_84d8;
          uStack_a50 = 0;
          uStack_a48 = 0;
          auVar72._8_8_ = uStack_4698;
          auVar72._0_8_ = local_46a0;
          auVar72._16_8_ = uStack_4690;
          auVar72._24_8_ = uStack_4688;
          auVar8 = vfmadd213ps_fma(auVar72,auVar1,ZEXT1632(auVar8));
          local_8500 = auVar8._0_8_;
          uStack_84f8 = auVar8._8_8_;
          local_46e0 = local_84a0;
          uStack_46d8 = uStack_8498;
          uStack_46d0 = uStack_8490;
          uStack_46c8 = uStack_8488;
          local_4720 = local_8500;
          uStack_4718 = uStack_84f8;
          uStack_4710 = 0;
          uStack_4708 = 0;
          local_9c0 = local_84a0;
          uStack_9b8 = uStack_8498;
          uStack_9b0 = uStack_8490;
          uStack_9a8 = uStack_8488;
          local_a00 = local_8500;
          uStack_9f8 = uStack_84f8;
          uStack_9f0 = 0;
          uStack_9e8 = 0;
          auVar73._8_8_ = uStack_46f8;
          auVar73._0_8_ = local_4700;
          auVar73._16_8_ = uStack_46f0;
          auVar73._24_8_ = uStack_46e8;
          auVar8 = vfmadd213ps_fma(auVar73,auVar2,ZEXT1632(auVar8));
          local_8520 = auVar8._0_8_;
          uStack_8518 = auVar8._8_8_;
          local_4740 = local_84c0;
          uStack_4738 = uStack_84b8;
          uStack_4730 = uStack_84b0;
          uStack_4728 = uStack_84a8;
          local_4780 = local_8520;
          uStack_4778 = uStack_8518;
          uStack_4770 = 0;
          uStack_4768 = 0;
          local_960 = local_84c0;
          uStack_958 = uStack_84b8;
          uStack_950 = uStack_84b0;
          uStack_948 = uStack_84a8;
          local_9a0 = local_8520;
          uStack_998 = uStack_8518;
          uStack_990 = 0;
          uStack_988 = 0;
          auVar74._8_8_ = uStack_4758;
          auVar74._0_8_ = local_4760;
          auVar74._16_8_ = uStack_4750;
          auVar74._24_8_ = uStack_4748;
          auVar8 = vfmadd213ps_fma(auVar74,auVar3,ZEXT1632(auVar8));
          local_8540 = auVar8._0_8_;
          uStack_8538 = auVar8._8_8_;
          local_5f48 = local_6688 + 8;
          local_5f80 = *local_5f48;
          local_47c0 = CONCAT44(local_5f80,local_5f80);
          uStack_47b8 = CONCAT44(local_5f80,local_5f80);
          uStack_47b0 = CONCAT44(local_5f80,local_5f80);
          uStack_47a8 = CONCAT44(local_5f80,local_5f80);
          local_5f88 = local_6688 + 9;
          local_5fc0 = *local_5f88;
          local_4820 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4818 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4810 = CONCAT44(local_5fc0,local_5fc0);
          uStack_4808 = CONCAT44(local_5fc0,local_5fc0);
          local_5fc8 = local_6688 + 10;
          local_6000 = *local_5fc8;
          local_4880 = CONCAT44(local_6000,local_6000);
          uStack_4878 = CONCAT44(local_6000,local_6000);
          uStack_4870 = CONCAT44(local_6000,local_6000);
          uStack_4868 = CONCAT44(local_6000,local_6000);
          local_6008 = local_6688 + 0xb;
          local_6040 = *local_6008;
          local_48e0 = CONCAT44(local_6040,local_6040);
          uStack_48d8 = CONCAT44(local_6040,local_6040);
          uStack_48d0 = CONCAT44(local_6040,local_6040);
          uStack_48c8 = CONCAT44(local_6040,local_6040);
          local_6048 = local_6688 + 0xc;
          local_6080 = *local_6048;
          local_4940 = CONCAT44(local_6080,local_6080);
          uStack_4938 = CONCAT44(local_6080,local_6080);
          uStack_4930 = CONCAT44(local_6080,local_6080);
          uStack_4928 = CONCAT44(local_6080,local_6080);
          local_6088 = local_6688 + 0xd;
          local_60c0 = *local_6088;
          local_49a0 = CONCAT44(local_60c0,local_60c0);
          uStack_4998 = CONCAT44(local_60c0,local_60c0);
          uStack_4990 = CONCAT44(local_60c0,local_60c0);
          uStack_4988 = CONCAT44(local_60c0,local_60c0);
          local_60c8 = local_6688 + 0xe;
          local_6100 = *local_60c8;
          local_4a00 = CONCAT44(local_6100,local_6100);
          uStack_49f8 = CONCAT44(local_6100,local_6100);
          uStack_49f0 = CONCAT44(local_6100,local_6100);
          uStack_49e8 = CONCAT44(local_6100,local_6100);
          local_6108 = local_6688 + 0xf;
          local_6140 = *local_6108;
          local_4a60 = CONCAT44(local_6140,local_6140);
          uStack_4a58 = CONCAT44(local_6140,local_6140);
          uStack_4a50 = CONCAT44(local_6140,local_6140);
          uStack_4a48 = CONCAT44(local_6140,local_6140);
          local_2800 = vlddqu_avx(*local_2bc8);
          auVar100 = vcvtph2ps_f16c(local_2800);
          local_8660 = auVar100._0_8_;
          uStack_8658 = auVar100._8_8_;
          uStack_8650 = auVar100._16_8_;
          uStack_8648 = auVar100._24_8_;
          local_2bd0 = pauVar99 + 9;
          local_27f0 = vlddqu_avx(*local_2bd0);
          auVar1 = vcvtph2ps_f16c(local_27f0);
          local_8680 = auVar1._0_8_;
          uStack_8678 = auVar1._8_8_;
          uStack_8670 = auVar1._16_8_;
          uStack_8668 = auVar1._24_8_;
          local_2bd8 = pauVar99 + 10;
          local_27e0 = vlddqu_avx(*local_2bd8);
          auVar2 = vcvtph2ps_f16c(local_27e0);
          local_86a0 = auVar2._0_8_;
          uStack_8698 = auVar2._8_8_;
          uStack_8690 = auVar2._16_8_;
          uStack_8688 = auVar2._24_8_;
          local_2be0 = pauVar99 + 0xb;
          local_27d0 = vlddqu_avx(*local_2be0);
          auVar3 = vcvtph2ps_f16c(local_27d0);
          local_86c0 = auVar3._0_8_;
          uStack_86b8 = auVar3._8_8_;
          uStack_86b0 = auVar3._16_8_;
          uStack_86a8 = auVar3._24_8_;
          local_2be8 = pauVar99 + 0xc;
          local_47a0 = local_8660;
          uStack_4798 = uStack_8658;
          uStack_4790 = uStack_8650;
          uStack_4788 = uStack_8648;
          local_47e0 = local_8540;
          uStack_47d8 = uStack_8538;
          uStack_47d0 = 0;
          uStack_47c8 = 0;
          local_900 = local_8660;
          uStack_8f8 = uStack_8658;
          uStack_8f0 = uStack_8650;
          uStack_8e8 = uStack_8648;
          local_940 = local_8540;
          uStack_938 = uStack_8538;
          uStack_930 = 0;
          uStack_928 = 0;
          auVar75._8_8_ = uStack_47b8;
          auVar75._0_8_ = local_47c0;
          auVar75._16_8_ = uStack_47b0;
          auVar75._24_8_ = uStack_47a8;
          auVar8 = vfmadd213ps_fma(auVar75,auVar100,ZEXT1632(auVar8));
          local_86e0 = auVar8._0_8_;
          uStack_86d8 = auVar8._8_8_;
          local_4800 = local_8680;
          uStack_47f8 = uStack_8678;
          uStack_47f0 = uStack_8670;
          uStack_47e8 = uStack_8668;
          local_4840 = local_86e0;
          uStack_4838 = uStack_86d8;
          uStack_4830 = 0;
          uStack_4828 = 0;
          local_8a0 = local_8680;
          uStack_898 = uStack_8678;
          uStack_890 = uStack_8670;
          uStack_888 = uStack_8668;
          local_8e0 = local_86e0;
          uStack_8d8 = uStack_86d8;
          uStack_8d0 = 0;
          uStack_8c8 = 0;
          auVar76._8_8_ = uStack_4818;
          auVar76._0_8_ = local_4820;
          auVar76._16_8_ = uStack_4810;
          auVar76._24_8_ = uStack_4808;
          auVar8 = vfmadd213ps_fma(auVar76,auVar1,ZEXT1632(auVar8));
          local_8700 = auVar8._0_8_;
          uStack_86f8 = auVar8._8_8_;
          local_4860 = local_86a0;
          uStack_4858 = uStack_8698;
          uStack_4850 = uStack_8690;
          uStack_4848 = uStack_8688;
          local_48a0 = local_8700;
          uStack_4898 = uStack_86f8;
          uStack_4890 = 0;
          uStack_4888 = 0;
          local_840 = local_86a0;
          uStack_838 = uStack_8698;
          uStack_830 = uStack_8690;
          uStack_828 = uStack_8688;
          local_880 = local_8700;
          uStack_878 = uStack_86f8;
          uStack_870 = 0;
          uStack_868 = 0;
          auVar77._8_8_ = uStack_4878;
          auVar77._0_8_ = local_4880;
          auVar77._16_8_ = uStack_4870;
          auVar77._24_8_ = uStack_4868;
          auVar8 = vfmadd213ps_fma(auVar77,auVar2,ZEXT1632(auVar8));
          local_8720 = auVar8._0_8_;
          uStack_8718 = auVar8._8_8_;
          local_48c0 = local_86c0;
          uStack_48b8 = uStack_86b8;
          uStack_48b0 = uStack_86b0;
          uStack_48a8 = uStack_86a8;
          local_4900 = local_8720;
          uStack_48f8 = uStack_8718;
          uStack_48f0 = 0;
          uStack_48e8 = 0;
          local_7e0 = local_86c0;
          uStack_7d8 = uStack_86b8;
          uStack_7d0 = uStack_86b0;
          uStack_7c8 = uStack_86a8;
          local_820 = local_8720;
          uStack_818 = uStack_8718;
          uStack_810 = 0;
          uStack_808 = 0;
          auVar78._8_8_ = uStack_48d8;
          auVar78._0_8_ = local_48e0;
          auVar78._16_8_ = uStack_48d0;
          auVar78._24_8_ = uStack_48c8;
          auVar8 = vfmadd213ps_fma(auVar78,auVar3,ZEXT1632(auVar8));
          local_8740 = auVar8._0_8_;
          uStack_8738 = auVar8._8_8_;
          local_27c0 = vlddqu_avx(*local_2be8);
          auVar100 = vcvtph2ps_f16c(local_27c0);
          local_8760 = auVar100._0_8_;
          uStack_8758 = auVar100._8_8_;
          uStack_8750 = auVar100._16_8_;
          uStack_8748 = auVar100._24_8_;
          local_2bf0 = pauVar99 + 0xd;
          local_27b0 = vlddqu_avx(*local_2bf0);
          auVar1 = vcvtph2ps_f16c(local_27b0);
          local_8780 = auVar1._0_8_;
          uStack_8778 = auVar1._8_8_;
          uStack_8770 = auVar1._16_8_;
          uStack_8768 = auVar1._24_8_;
          local_2bf8 = pauVar99 + 0xe;
          local_27a0 = vlddqu_avx(*local_2bf8);
          auVar2 = vcvtph2ps_f16c(local_27a0);
          local_87a0 = auVar2._0_8_;
          uStack_8798 = auVar2._8_8_;
          uStack_8790 = auVar2._16_8_;
          uStack_8788 = auVar2._24_8_;
          local_2c00 = pauVar99 + 0xf;
          local_2790 = vlddqu_avx(*local_2c00);
          auVar3 = vcvtph2ps_f16c(local_2790);
          local_87c0 = auVar3._0_8_;
          uStack_87b8 = auVar3._8_8_;
          uStack_87b0 = auVar3._16_8_;
          uStack_87a8 = auVar3._24_8_;
          local_2c08 = pauVar99 + 0x10;
          local_4920 = local_8760;
          uStack_4918 = uStack_8758;
          uStack_4910 = uStack_8750;
          uStack_4908 = uStack_8748;
          local_4960 = local_8740;
          uStack_4958 = uStack_8738;
          uStack_4950 = 0;
          uStack_4948 = 0;
          local_780 = local_8760;
          uStack_778 = uStack_8758;
          uStack_770 = uStack_8750;
          uStack_768 = uStack_8748;
          local_7c0 = local_8740;
          uStack_7b8 = uStack_8738;
          uStack_7b0 = 0;
          uStack_7a8 = 0;
          auVar79._8_8_ = uStack_4938;
          auVar79._0_8_ = local_4940;
          auVar79._16_8_ = uStack_4930;
          auVar79._24_8_ = uStack_4928;
          auVar8 = vfmadd213ps_fma(auVar79,auVar100,ZEXT1632(auVar8));
          local_87e0 = auVar8._0_8_;
          uStack_87d8 = auVar8._8_8_;
          local_4980 = local_8780;
          uStack_4978 = uStack_8778;
          uStack_4970 = uStack_8770;
          uStack_4968 = uStack_8768;
          local_49c0 = local_87e0;
          uStack_49b8 = uStack_87d8;
          uStack_49b0 = 0;
          uStack_49a8 = 0;
          local_720 = local_8780;
          uStack_718 = uStack_8778;
          uStack_710 = uStack_8770;
          uStack_708 = uStack_8768;
          local_760 = local_87e0;
          uStack_758 = uStack_87d8;
          uStack_750 = 0;
          uStack_748 = 0;
          auVar80._8_8_ = uStack_4998;
          auVar80._0_8_ = local_49a0;
          auVar80._16_8_ = uStack_4990;
          auVar80._24_8_ = uStack_4988;
          auVar8 = vfmadd213ps_fma(auVar80,auVar1,ZEXT1632(auVar8));
          local_8800 = auVar8._0_8_;
          uStack_87f8 = auVar8._8_8_;
          local_49e0 = local_87a0;
          uStack_49d8 = uStack_8798;
          uStack_49d0 = uStack_8790;
          uStack_49c8 = uStack_8788;
          local_4a20 = local_8800;
          uStack_4a18 = uStack_87f8;
          uStack_4a10 = 0;
          uStack_4a08 = 0;
          local_6c0 = local_87a0;
          uStack_6b8 = uStack_8798;
          uStack_6b0 = uStack_8790;
          uStack_6a8 = uStack_8788;
          local_700 = local_8800;
          uStack_6f8 = uStack_87f8;
          uStack_6f0 = 0;
          uStack_6e8 = 0;
          auVar81._8_8_ = uStack_49f8;
          auVar81._0_8_ = local_4a00;
          auVar81._16_8_ = uStack_49f0;
          auVar81._24_8_ = uStack_49e8;
          auVar8 = vfmadd213ps_fma(auVar81,auVar2,ZEXT1632(auVar8));
          local_8820 = auVar8._0_8_;
          uStack_8818 = auVar8._8_8_;
          local_4a40 = local_87c0;
          uStack_4a38 = uStack_87b8;
          uStack_4a30 = uStack_87b0;
          uStack_4a28 = uStack_87a8;
          local_4a80 = local_8820;
          uStack_4a78 = uStack_8818;
          uStack_4a70 = 0;
          uStack_4a68 = 0;
          local_660 = local_87c0;
          uStack_658 = uStack_87b8;
          uStack_650 = uStack_87b0;
          uStack_648 = uStack_87a8;
          local_6a0 = local_8820;
          uStack_698 = uStack_8818;
          uStack_690 = 0;
          uStack_688 = 0;
          auVar82._8_8_ = uStack_4a58;
          auVar82._0_8_ = local_4a60;
          auVar82._16_8_ = uStack_4a50;
          auVar82._24_8_ = uStack_4a48;
          auVar8 = vfmadd213ps_fma(auVar82,auVar3,ZEXT1632(auVar8));
          local_8840 = auVar8._0_8_;
          uStack_8838 = auVar8._8_8_;
          local_6148 = local_6690;
          local_6180 = *local_6690;
          local_4ac0 = CONCAT44(local_6180,local_6180);
          uStack_4ab8 = CONCAT44(local_6180,local_6180);
          uStack_4ab0 = CONCAT44(local_6180,local_6180);
          uStack_4aa8 = CONCAT44(local_6180,local_6180);
          local_6188 = local_6690 + 1;
          local_61c0 = *local_6188;
          local_4b20 = CONCAT44(local_61c0,local_61c0);
          uStack_4b18 = CONCAT44(local_61c0,local_61c0);
          uStack_4b10 = CONCAT44(local_61c0,local_61c0);
          uStack_4b08 = CONCAT44(local_61c0,local_61c0);
          local_61c8 = local_6690 + 2;
          local_6200 = *local_61c8;
          local_4b80 = CONCAT44(local_6200,local_6200);
          uStack_4b78 = CONCAT44(local_6200,local_6200);
          uStack_4b70 = CONCAT44(local_6200,local_6200);
          uStack_4b68 = CONCAT44(local_6200,local_6200);
          local_6208 = local_6690 + 3;
          local_6240 = *local_6208;
          local_4be0 = CONCAT44(local_6240,local_6240);
          uStack_4bd8 = CONCAT44(local_6240,local_6240);
          uStack_4bd0 = CONCAT44(local_6240,local_6240);
          uStack_4bc8 = CONCAT44(local_6240,local_6240);
          local_6248 = local_6690 + 4;
          local_6280 = *local_6248;
          local_4c40 = CONCAT44(local_6280,local_6280);
          uStack_4c38 = CONCAT44(local_6280,local_6280);
          uStack_4c30 = CONCAT44(local_6280,local_6280);
          uStack_4c28 = CONCAT44(local_6280,local_6280);
          local_6288 = local_6690 + 5;
          local_62c0 = *local_6288;
          local_4ca0 = CONCAT44(local_62c0,local_62c0);
          uStack_4c98 = CONCAT44(local_62c0,local_62c0);
          uStack_4c90 = CONCAT44(local_62c0,local_62c0);
          uStack_4c88 = CONCAT44(local_62c0,local_62c0);
          local_62c8 = local_6690 + 6;
          local_6300 = *local_62c8;
          local_4d00 = CONCAT44(local_6300,local_6300);
          uStack_4cf8 = CONCAT44(local_6300,local_6300);
          uStack_4cf0 = CONCAT44(local_6300,local_6300);
          uStack_4ce8 = CONCAT44(local_6300,local_6300);
          local_6308 = local_6690 + 7;
          local_6340 = *local_6308;
          local_4d60 = CONCAT44(local_6340,local_6340);
          uStack_4d58 = CONCAT44(local_6340,local_6340);
          uStack_4d50 = CONCAT44(local_6340,local_6340);
          uStack_4d48 = CONCAT44(local_6340,local_6340);
          local_2780 = vlddqu_avx(*local_2c08);
          auVar100 = vcvtph2ps_f16c(local_2780);
          local_8960 = auVar100._0_8_;
          uStack_8958 = auVar100._8_8_;
          uStack_8950 = auVar100._16_8_;
          uStack_8948 = auVar100._24_8_;
          local_2c10 = pauVar99 + 0x11;
          local_2770 = vlddqu_avx(*local_2c10);
          auVar1 = vcvtph2ps_f16c(local_2770);
          local_8980 = auVar1._0_8_;
          uStack_8978 = auVar1._8_8_;
          uStack_8970 = auVar1._16_8_;
          uStack_8968 = auVar1._24_8_;
          local_2c18 = pauVar99 + 0x12;
          local_2760 = vlddqu_avx(*local_2c18);
          auVar2 = vcvtph2ps_f16c(local_2760);
          local_89a0 = auVar2._0_8_;
          uStack_8998 = auVar2._8_8_;
          uStack_8990 = auVar2._16_8_;
          uStack_8988 = auVar2._24_8_;
          local_2c20 = pauVar99 + 0x13;
          local_2750 = vlddqu_avx(*local_2c20);
          auVar3 = vcvtph2ps_f16c(local_2750);
          local_89c0 = auVar3._0_8_;
          uStack_89b8 = auVar3._8_8_;
          uStack_89b0 = auVar3._16_8_;
          uStack_89a8 = auVar3._24_8_;
          local_2c28 = pauVar99 + 0x14;
          local_4aa0 = local_8960;
          uStack_4a98 = uStack_8958;
          uStack_4a90 = uStack_8950;
          uStack_4a88 = uStack_8948;
          local_4ae0 = local_8840;
          uStack_4ad8 = uStack_8838;
          uStack_4ad0 = 0;
          uStack_4ac8 = 0;
          local_600 = local_8960;
          uStack_5f8 = uStack_8958;
          uStack_5f0 = uStack_8950;
          uStack_5e8 = uStack_8948;
          local_640 = local_8840;
          uStack_638 = uStack_8838;
          uStack_630 = 0;
          uStack_628 = 0;
          auVar83._8_8_ = uStack_4ab8;
          auVar83._0_8_ = local_4ac0;
          auVar83._16_8_ = uStack_4ab0;
          auVar83._24_8_ = uStack_4aa8;
          auVar8 = vfmadd213ps_fma(auVar83,auVar100,ZEXT1632(auVar8));
          local_89e0 = auVar8._0_8_;
          uStack_89d8 = auVar8._8_8_;
          local_4b00 = local_8980;
          uStack_4af8 = uStack_8978;
          uStack_4af0 = uStack_8970;
          uStack_4ae8 = uStack_8968;
          local_4b40 = local_89e0;
          uStack_4b38 = uStack_89d8;
          uStack_4b30 = 0;
          uStack_4b28 = 0;
          local_5a0 = local_8980;
          uStack_598 = uStack_8978;
          uStack_590 = uStack_8970;
          uStack_588 = uStack_8968;
          local_5e0 = local_89e0;
          uStack_5d8 = uStack_89d8;
          uStack_5d0 = 0;
          uStack_5c8 = 0;
          auVar84._8_8_ = uStack_4b18;
          auVar84._0_8_ = local_4b20;
          auVar84._16_8_ = uStack_4b10;
          auVar84._24_8_ = uStack_4b08;
          auVar8 = vfmadd213ps_fma(auVar84,auVar1,ZEXT1632(auVar8));
          local_8a00 = auVar8._0_8_;
          uStack_89f8 = auVar8._8_8_;
          local_4b60 = local_89a0;
          uStack_4b58 = uStack_8998;
          uStack_4b50 = uStack_8990;
          uStack_4b48 = uStack_8988;
          local_4ba0 = local_8a00;
          uStack_4b98 = uStack_89f8;
          uStack_4b90 = 0;
          uStack_4b88 = 0;
          local_540 = local_89a0;
          uStack_538 = uStack_8998;
          uStack_530 = uStack_8990;
          uStack_528 = uStack_8988;
          local_580 = local_8a00;
          uStack_578 = uStack_89f8;
          uStack_570 = 0;
          uStack_568 = 0;
          auVar85._8_8_ = uStack_4b78;
          auVar85._0_8_ = local_4b80;
          auVar85._16_8_ = uStack_4b70;
          auVar85._24_8_ = uStack_4b68;
          auVar8 = vfmadd213ps_fma(auVar85,auVar2,ZEXT1632(auVar8));
          local_8a20 = auVar8._0_8_;
          uStack_8a18 = auVar8._8_8_;
          local_4bc0 = local_89c0;
          uStack_4bb8 = uStack_89b8;
          uStack_4bb0 = uStack_89b0;
          uStack_4ba8 = uStack_89a8;
          local_4c00 = local_8a20;
          uStack_4bf8 = uStack_8a18;
          uStack_4bf0 = 0;
          uStack_4be8 = 0;
          local_4e0 = local_89c0;
          uStack_4d8 = uStack_89b8;
          uStack_4d0 = uStack_89b0;
          uStack_4c8 = uStack_89a8;
          local_520 = local_8a20;
          uStack_518 = uStack_8a18;
          uStack_510 = 0;
          uStack_508 = 0;
          auVar86._8_8_ = uStack_4bd8;
          auVar86._0_8_ = local_4be0;
          auVar86._16_8_ = uStack_4bd0;
          auVar86._24_8_ = uStack_4bc8;
          auVar8 = vfmadd213ps_fma(auVar86,auVar3,ZEXT1632(auVar8));
          local_8a40 = auVar8._0_8_;
          uStack_8a38 = auVar8._8_8_;
          local_2740 = vlddqu_avx(*local_2c28);
          auVar100 = vcvtph2ps_f16c(local_2740);
          local_8a60 = auVar100._0_8_;
          uStack_8a58 = auVar100._8_8_;
          uStack_8a50 = auVar100._16_8_;
          uStack_8a48 = auVar100._24_8_;
          local_2c30 = pauVar99 + 0x15;
          local_2730 = vlddqu_avx(*local_2c30);
          auVar1 = vcvtph2ps_f16c(local_2730);
          local_8a80 = auVar1._0_8_;
          uStack_8a78 = auVar1._8_8_;
          uStack_8a70 = auVar1._16_8_;
          uStack_8a68 = auVar1._24_8_;
          local_2c38 = pauVar99 + 0x16;
          local_2720 = vlddqu_avx(*local_2c38);
          auVar2 = vcvtph2ps_f16c(local_2720);
          local_8aa0 = auVar2._0_8_;
          uStack_8a98 = auVar2._8_8_;
          uStack_8a90 = auVar2._16_8_;
          uStack_8a88 = auVar2._24_8_;
          local_2c40 = pauVar99 + 0x17;
          local_2710 = vlddqu_avx(*local_2c40);
          auVar3 = vcvtph2ps_f16c(local_2710);
          local_8ac0 = auVar3._0_8_;
          uStack_8ab8 = auVar3._8_8_;
          uStack_8ab0 = auVar3._16_8_;
          uStack_8aa8 = auVar3._24_8_;
          local_2c48 = pauVar99 + 0x18;
          local_4c20 = local_8a60;
          uStack_4c18 = uStack_8a58;
          uStack_4c10 = uStack_8a50;
          uStack_4c08 = uStack_8a48;
          local_4c60 = local_8a40;
          uStack_4c58 = uStack_8a38;
          uStack_4c50 = 0;
          uStack_4c48 = 0;
          local_480 = local_8a60;
          uStack_478 = uStack_8a58;
          uStack_470 = uStack_8a50;
          uStack_468 = uStack_8a48;
          local_4c0 = local_8a40;
          uStack_4b8 = uStack_8a38;
          uStack_4b0 = 0;
          uStack_4a8 = 0;
          auVar87._8_8_ = uStack_4c38;
          auVar87._0_8_ = local_4c40;
          auVar87._16_8_ = uStack_4c30;
          auVar87._24_8_ = uStack_4c28;
          auVar8 = vfmadd213ps_fma(auVar87,auVar100,ZEXT1632(auVar8));
          local_8ae0 = auVar8._0_8_;
          uStack_8ad8 = auVar8._8_8_;
          local_4c80 = local_8a80;
          uStack_4c78 = uStack_8a78;
          uStack_4c70 = uStack_8a70;
          uStack_4c68 = uStack_8a68;
          local_4cc0 = local_8ae0;
          uStack_4cb8 = uStack_8ad8;
          uStack_4cb0 = 0;
          uStack_4ca8 = 0;
          local_420 = local_8a80;
          uStack_418 = uStack_8a78;
          uStack_410 = uStack_8a70;
          uStack_408 = uStack_8a68;
          local_460 = local_8ae0;
          uStack_458 = uStack_8ad8;
          uStack_450 = 0;
          uStack_448 = 0;
          auVar88._8_8_ = uStack_4c98;
          auVar88._0_8_ = local_4ca0;
          auVar88._16_8_ = uStack_4c90;
          auVar88._24_8_ = uStack_4c88;
          auVar8 = vfmadd213ps_fma(auVar88,auVar1,ZEXT1632(auVar8));
          local_8b00 = auVar8._0_8_;
          uStack_8af8 = auVar8._8_8_;
          local_4ce0 = local_8aa0;
          uStack_4cd8 = uStack_8a98;
          uStack_4cd0 = uStack_8a90;
          uStack_4cc8 = uStack_8a88;
          local_4d20 = local_8b00;
          uStack_4d18 = uStack_8af8;
          uStack_4d10 = 0;
          uStack_4d08 = 0;
          local_3c0 = local_8aa0;
          uStack_3b8 = uStack_8a98;
          uStack_3b0 = uStack_8a90;
          uStack_3a8 = uStack_8a88;
          local_400 = local_8b00;
          uStack_3f8 = uStack_8af8;
          uStack_3f0 = 0;
          uStack_3e8 = 0;
          auVar89._8_8_ = uStack_4cf8;
          auVar89._0_8_ = local_4d00;
          auVar89._16_8_ = uStack_4cf0;
          auVar89._24_8_ = uStack_4ce8;
          auVar8 = vfmadd213ps_fma(auVar89,auVar2,ZEXT1632(auVar8));
          local_8b20 = auVar8._0_8_;
          uStack_8b18 = auVar8._8_8_;
          local_4d40 = local_8ac0;
          uStack_4d38 = uStack_8ab8;
          uStack_4d30 = uStack_8ab0;
          uStack_4d28 = uStack_8aa8;
          local_4d80 = local_8b20;
          uStack_4d78 = uStack_8b18;
          uStack_4d70 = 0;
          uStack_4d68 = 0;
          local_360 = local_8ac0;
          uStack_358 = uStack_8ab8;
          uStack_350 = uStack_8ab0;
          uStack_348 = uStack_8aa8;
          local_3a0 = local_8b20;
          uStack_398 = uStack_8b18;
          uStack_390 = 0;
          uStack_388 = 0;
          auVar90._8_8_ = uStack_4d58;
          auVar90._0_8_ = local_4d60;
          auVar90._16_8_ = uStack_4d50;
          auVar90._24_8_ = uStack_4d48;
          auVar8 = vfmadd213ps_fma(auVar90,auVar3,ZEXT1632(auVar8));
          local_8b40 = auVar8._0_8_;
          uStack_8b38 = auVar8._8_8_;
          local_6348 = local_6690 + 8;
          local_6380 = *local_6348;
          local_4dc0 = CONCAT44(local_6380,local_6380);
          uStack_4db8 = CONCAT44(local_6380,local_6380);
          uStack_4db0 = CONCAT44(local_6380,local_6380);
          uStack_4da8 = CONCAT44(local_6380,local_6380);
          local_6388 = local_6690 + 9;
          local_63c0 = *local_6388;
          local_4e20 = CONCAT44(local_63c0,local_63c0);
          uStack_4e18 = CONCAT44(local_63c0,local_63c0);
          uStack_4e10 = CONCAT44(local_63c0,local_63c0);
          uStack_4e08 = CONCAT44(local_63c0,local_63c0);
          local_63c8 = local_6690 + 10;
          local_6400 = *local_63c8;
          local_4e80 = CONCAT44(local_6400,local_6400);
          uStack_4e78 = CONCAT44(local_6400,local_6400);
          uStack_4e70 = CONCAT44(local_6400,local_6400);
          uStack_4e68 = CONCAT44(local_6400,local_6400);
          local_6408 = local_6690 + 0xb;
          local_6440 = *local_6408;
          local_4ee0 = CONCAT44(local_6440,local_6440);
          uStack_4ed8 = CONCAT44(local_6440,local_6440);
          uStack_4ed0 = CONCAT44(local_6440,local_6440);
          uStack_4ec8 = CONCAT44(local_6440,local_6440);
          local_6448 = local_6690 + 0xc;
          local_6480 = *local_6448;
          local_4f40 = CONCAT44(local_6480,local_6480);
          uStack_4f38 = CONCAT44(local_6480,local_6480);
          uStack_4f30 = CONCAT44(local_6480,local_6480);
          uStack_4f28 = CONCAT44(local_6480,local_6480);
          local_6488 = local_6690 + 0xd;
          local_64c0 = *local_6488;
          local_4fa0 = CONCAT44(local_64c0,local_64c0);
          uStack_4f98 = CONCAT44(local_64c0,local_64c0);
          uStack_4f90 = CONCAT44(local_64c0,local_64c0);
          uStack_4f88 = CONCAT44(local_64c0,local_64c0);
          local_64c8 = local_6690 + 0xe;
          local_6500 = *local_64c8;
          local_5000 = CONCAT44(local_6500,local_6500);
          uStack_4ff8 = CONCAT44(local_6500,local_6500);
          uStack_4ff0 = CONCAT44(local_6500,local_6500);
          uStack_4fe8 = CONCAT44(local_6500,local_6500);
          local_6508 = local_6690 + 0xf;
          local_6540 = *local_6508;
          local_5060 = CONCAT44(local_6540,local_6540);
          uStack_5058 = CONCAT44(local_6540,local_6540);
          uStack_5050 = CONCAT44(local_6540,local_6540);
          uStack_5048 = CONCAT44(local_6540,local_6540);
          local_2700 = vlddqu_avx(*local_2c48);
          auVar100 = vcvtph2ps_f16c(local_2700);
          local_8c60 = auVar100._0_8_;
          uStack_8c58 = auVar100._8_8_;
          uStack_8c50 = auVar100._16_8_;
          uStack_8c48 = auVar100._24_8_;
          local_2c50 = pauVar99 + 0x19;
          local_26f0 = vlddqu_avx(*local_2c50);
          auVar1 = vcvtph2ps_f16c(local_26f0);
          local_8c80 = auVar1._0_8_;
          uStack_8c78 = auVar1._8_8_;
          uStack_8c70 = auVar1._16_8_;
          uStack_8c68 = auVar1._24_8_;
          local_2c58 = pauVar99 + 0x1a;
          local_26e0 = vlddqu_avx(*local_2c58);
          auVar2 = vcvtph2ps_f16c(local_26e0);
          local_8ca0 = auVar2._0_8_;
          uStack_8c98 = auVar2._8_8_;
          uStack_8c90 = auVar2._16_8_;
          uStack_8c88 = auVar2._24_8_;
          local_2c60 = pauVar99 + 0x1b;
          local_26d0 = vlddqu_avx(*local_2c60);
          auVar3 = vcvtph2ps_f16c(local_26d0);
          local_8cc0 = auVar3._0_8_;
          uStack_8cb8 = auVar3._8_8_;
          uStack_8cb0 = auVar3._16_8_;
          uStack_8ca8 = auVar3._24_8_;
          local_2c68 = pauVar99 + 0x1c;
          local_4da0 = local_8c60;
          uStack_4d98 = uStack_8c58;
          uStack_4d90 = uStack_8c50;
          uStack_4d88 = uStack_8c48;
          local_4de0 = local_8b40;
          uStack_4dd8 = uStack_8b38;
          uStack_4dd0 = 0;
          uStack_4dc8 = 0;
          local_300 = local_8c60;
          uStack_2f8 = uStack_8c58;
          uStack_2f0 = uStack_8c50;
          uStack_2e8 = uStack_8c48;
          local_340 = local_8b40;
          uStack_338 = uStack_8b38;
          uStack_330 = 0;
          uStack_328 = 0;
          auVar91._8_8_ = uStack_4db8;
          auVar91._0_8_ = local_4dc0;
          auVar91._16_8_ = uStack_4db0;
          auVar91._24_8_ = uStack_4da8;
          auVar8 = vfmadd213ps_fma(auVar91,auVar100,ZEXT1632(auVar8));
          local_8ce0 = auVar8._0_8_;
          uStack_8cd8 = auVar8._8_8_;
          local_4e00 = local_8c80;
          uStack_4df8 = uStack_8c78;
          uStack_4df0 = uStack_8c70;
          uStack_4de8 = uStack_8c68;
          local_4e40 = local_8ce0;
          uStack_4e38 = uStack_8cd8;
          uStack_4e30 = 0;
          uStack_4e28 = 0;
          local_2a0 = local_8c80;
          uStack_298 = uStack_8c78;
          uStack_290 = uStack_8c70;
          uStack_288 = uStack_8c68;
          local_2e0 = local_8ce0;
          uStack_2d8 = uStack_8cd8;
          uStack_2d0 = 0;
          uStack_2c8 = 0;
          auVar92._8_8_ = uStack_4e18;
          auVar92._0_8_ = local_4e20;
          auVar92._16_8_ = uStack_4e10;
          auVar92._24_8_ = uStack_4e08;
          auVar8 = vfmadd213ps_fma(auVar92,auVar1,ZEXT1632(auVar8));
          local_8d00 = auVar8._0_8_;
          uStack_8cf8 = auVar8._8_8_;
          local_4e60 = local_8ca0;
          uStack_4e58 = uStack_8c98;
          uStack_4e50 = uStack_8c90;
          uStack_4e48 = uStack_8c88;
          local_4ea0 = local_8d00;
          uStack_4e98 = uStack_8cf8;
          uStack_4e90 = 0;
          uStack_4e88 = 0;
          local_240 = local_8ca0;
          uStack_238 = uStack_8c98;
          uStack_230 = uStack_8c90;
          uStack_228 = uStack_8c88;
          local_280 = local_8d00;
          uStack_278 = uStack_8cf8;
          uStack_270 = 0;
          uStack_268 = 0;
          auVar93._8_8_ = uStack_4e78;
          auVar93._0_8_ = local_4e80;
          auVar93._16_8_ = uStack_4e70;
          auVar93._24_8_ = uStack_4e68;
          auVar8 = vfmadd213ps_fma(auVar93,auVar2,ZEXT1632(auVar8));
          local_8d20 = auVar8._0_8_;
          uStack_8d18 = auVar8._8_8_;
          local_4ec0 = local_8cc0;
          uStack_4eb8 = uStack_8cb8;
          uStack_4eb0 = uStack_8cb0;
          uStack_4ea8 = uStack_8ca8;
          local_4f00 = local_8d20;
          uStack_4ef8 = uStack_8d18;
          uStack_4ef0 = 0;
          uStack_4ee8 = 0;
          local_1e0 = local_8cc0;
          uStack_1d8 = uStack_8cb8;
          uStack_1d0 = uStack_8cb0;
          uStack_1c8 = uStack_8ca8;
          local_220 = local_8d20;
          uStack_218 = uStack_8d18;
          uStack_210 = 0;
          uStack_208 = 0;
          auVar94._8_8_ = uStack_4ed8;
          auVar94._0_8_ = local_4ee0;
          auVar94._16_8_ = uStack_4ed0;
          auVar94._24_8_ = uStack_4ec8;
          auVar8 = vfmadd213ps_fma(auVar94,auVar3,ZEXT1632(auVar8));
          local_8d40 = auVar8._0_8_;
          uStack_8d38 = auVar8._8_8_;
          local_26c0 = vlddqu_avx(*local_2c68);
          auVar100 = vcvtph2ps_f16c(local_26c0);
          local_8d60 = auVar100._0_8_;
          uStack_8d58 = auVar100._8_8_;
          uStack_8d50 = auVar100._16_8_;
          uStack_8d48 = auVar100._24_8_;
          local_2c70 = pauVar99 + 0x1d;
          local_26b0 = vlddqu_avx(*local_2c70);
          auVar1 = vcvtph2ps_f16c(local_26b0);
          local_8d80 = auVar1._0_8_;
          uStack_8d78 = auVar1._8_8_;
          uStack_8d70 = auVar1._16_8_;
          uStack_8d68 = auVar1._24_8_;
          local_2c78 = pauVar99 + 0x1e;
          local_26a0 = vlddqu_avx(*local_2c78);
          auVar2 = vcvtph2ps_f16c(local_26a0);
          local_8da0 = auVar2._0_8_;
          uStack_8d98 = auVar2._8_8_;
          uStack_8d90 = auVar2._16_8_;
          uStack_8d88 = auVar2._24_8_;
          local_2c80 = pauVar99 + 0x1f;
          local_2690 = vlddqu_avx(*local_2c80);
          auVar3 = vcvtph2ps_f16c(local_2690);
          local_8dc0 = auVar3._0_8_;
          uStack_8db8 = auVar3._8_8_;
          uStack_8db0 = auVar3._16_8_;
          uStack_8da8 = auVar3._24_8_;
          local_4f20 = local_8d60;
          uStack_4f18 = uStack_8d58;
          uStack_4f10 = uStack_8d50;
          uStack_4f08 = uStack_8d48;
          local_4f60 = local_8d40;
          uStack_4f58 = uStack_8d38;
          uStack_4f50 = 0;
          uStack_4f48 = 0;
          local_180 = local_8d60;
          uStack_178 = uStack_8d58;
          uStack_170 = uStack_8d50;
          uStack_168 = uStack_8d48;
          local_1c0 = local_8d40;
          uStack_1b8 = uStack_8d38;
          uStack_1b0 = 0;
          uStack_1a8 = 0;
          auVar95._8_8_ = uStack_4f38;
          auVar95._0_8_ = local_4f40;
          auVar95._16_8_ = uStack_4f30;
          auVar95._24_8_ = uStack_4f28;
          auVar8 = vfmadd213ps_fma(auVar95,auVar100,ZEXT1632(auVar8));
          local_8de0 = auVar8._0_8_;
          uStack_8dd8 = auVar8._8_8_;
          local_4f80 = local_8d80;
          uStack_4f78 = uStack_8d78;
          uStack_4f70 = uStack_8d70;
          uStack_4f68 = uStack_8d68;
          local_4fc0 = local_8de0;
          uStack_4fb8 = uStack_8dd8;
          uStack_4fb0 = 0;
          uStack_4fa8 = 0;
          local_120 = local_8d80;
          uStack_118 = uStack_8d78;
          uStack_110 = uStack_8d70;
          uStack_108 = uStack_8d68;
          local_160 = local_8de0;
          uStack_158 = uStack_8dd8;
          uStack_150 = 0;
          uStack_148 = 0;
          auVar96._8_8_ = uStack_4f98;
          auVar96._0_8_ = local_4fa0;
          auVar96._16_8_ = uStack_4f90;
          auVar96._24_8_ = uStack_4f88;
          auVar8 = vfmadd213ps_fma(auVar96,auVar1,ZEXT1632(auVar8));
          local_8e00 = auVar8._0_8_;
          uStack_8df8 = auVar8._8_8_;
          this = (Mat *)0x0;
          local_4fe0 = local_8da0;
          uStack_4fd8 = uStack_8d98;
          uStack_4fd0 = uStack_8d90;
          uStack_4fc8 = uStack_8d88;
          local_5020 = local_8e00;
          uStack_5018 = uStack_8df8;
          uStack_5008 = 0;
          local_c0 = local_8da0;
          uStack_b8 = uStack_8d98;
          uStack_b0 = uStack_8d90;
          uStack_a8 = uStack_8d88;
          local_100 = local_8e00;
          uStack_f8 = uStack_8df8;
          uStack_e8 = 0;
          auVar97._8_8_ = uStack_4ff8;
          auVar97._0_8_ = local_5000;
          auVar97._16_8_ = uStack_4ff0;
          auVar97._24_8_ = uStack_4fe8;
          auVar9 = vfmadd213ps_fma(auVar97,auVar2,ZEXT1632(auVar8));
          in_stack_ffffffffffff71e0 = auVar9._0_8_;
          in_stack_ffffffffffff71e8 = auVar9._8_4_;
          in_stack_ffffffffffff71ec = auVar9._12_4_;
          in_stack_ffffffffffff71f0 = (Mat *)0x0;
          uStack_5078 = auVar9._8_8_;
          local_5040 = local_8dc0;
          uStack_5038 = uStack_8db8;
          uStack_5030 = uStack_8db0;
          uStack_5028 = uStack_8da8;
          uStack_5070 = 0;
          uStack_5068 = 0;
          local_60 = local_8dc0;
          uStack_58 = uStack_8db8;
          uStack_50 = uStack_8db0;
          uStack_48 = uStack_8da8;
          uStack_90 = 0;
          uStack_88 = 0;
          auVar98._8_8_ = uStack_5058;
          auVar98._0_8_ = local_5060;
          auVar98._16_8_ = uStack_5050;
          auVar98._24_8_ = uStack_5048;
          auVar9 = vfmadd213ps_fma(auVar98,auVar3,ZEXT1632(auVar9));
          local_8e40 = auVar9._0_8_;
          uStack_8e38 = auVar9._8_8_;
          in_stack_ffffffffffff71d8 = 0;
          local_5108 = local_6638;
          local_5140 = local_8e40;
          uStack_5138 = uStack_8e38;
          uStack_5130 = 0;
          uStack_5128 = 0;
          *local_6638 = ZEXT1632(auVar9);
          local_6638 = local_6638 + 1;
          auVar100 = ZEXT1632(auVar8);
          local_6690 = local_6348;
          local_6688 = local_5f48;
          fStack_653c = local_6540;
          fStack_6538 = local_6540;
          fStack_6534 = local_6540;
          fStack_6530 = local_6540;
          fStack_652c = local_6540;
          fStack_6528 = local_6540;
          fStack_6524 = local_6540;
          local_650c = local_6540;
          fStack_64fc = local_6500;
          fStack_64f8 = local_6500;
          fStack_64f4 = local_6500;
          fStack_64f0 = local_6500;
          fStack_64ec = local_6500;
          fStack_64e8 = local_6500;
          fStack_64e4 = local_6500;
          local_64cc = local_6500;
          fStack_64bc = local_64c0;
          fStack_64b8 = local_64c0;
          fStack_64b4 = local_64c0;
          fStack_64b0 = local_64c0;
          fStack_64ac = local_64c0;
          fStack_64a8 = local_64c0;
          fStack_64a4 = local_64c0;
          local_648c = local_64c0;
          fStack_647c = local_6480;
          fStack_6478 = local_6480;
          fStack_6474 = local_6480;
          fStack_6470 = local_6480;
          fStack_646c = local_6480;
          fStack_6468 = local_6480;
          fStack_6464 = local_6480;
          local_644c = local_6480;
          fStack_643c = local_6440;
          fStack_6438 = local_6440;
          fStack_6434 = local_6440;
          fStack_6430 = local_6440;
          fStack_642c = local_6440;
          fStack_6428 = local_6440;
          fStack_6424 = local_6440;
          local_640c = local_6440;
          fStack_63fc = local_6400;
          fStack_63f8 = local_6400;
          fStack_63f4 = local_6400;
          fStack_63f0 = local_6400;
          fStack_63ec = local_6400;
          fStack_63e8 = local_6400;
          fStack_63e4 = local_6400;
          local_63cc = local_6400;
          fStack_63bc = local_63c0;
          fStack_63b8 = local_63c0;
          fStack_63b4 = local_63c0;
          fStack_63b0 = local_63c0;
          fStack_63ac = local_63c0;
          fStack_63a8 = local_63c0;
          fStack_63a4 = local_63c0;
          local_638c = local_63c0;
          fStack_637c = local_6380;
          fStack_6378 = local_6380;
          fStack_6374 = local_6380;
          fStack_6370 = local_6380;
          fStack_636c = local_6380;
          fStack_6368 = local_6380;
          fStack_6364 = local_6380;
          local_634c = local_6380;
          fStack_633c = local_6340;
          fStack_6338 = local_6340;
          fStack_6334 = local_6340;
          fStack_6330 = local_6340;
          fStack_632c = local_6340;
          fStack_6328 = local_6340;
          fStack_6324 = local_6340;
          local_630c = local_6340;
          fStack_62fc = local_6300;
          fStack_62f8 = local_6300;
          fStack_62f4 = local_6300;
          fStack_62f0 = local_6300;
          fStack_62ec = local_6300;
          fStack_62e8 = local_6300;
          fStack_62e4 = local_6300;
          local_62cc = local_6300;
          fStack_62bc = local_62c0;
          fStack_62b8 = local_62c0;
          fStack_62b4 = local_62c0;
          fStack_62b0 = local_62c0;
          fStack_62ac = local_62c0;
          fStack_62a8 = local_62c0;
          fStack_62a4 = local_62c0;
          local_628c = local_62c0;
          fStack_627c = local_6280;
          fStack_6278 = local_6280;
          fStack_6274 = local_6280;
          fStack_6270 = local_6280;
          fStack_626c = local_6280;
          fStack_6268 = local_6280;
          fStack_6264 = local_6280;
          local_624c = local_6280;
          fStack_623c = local_6240;
          fStack_6238 = local_6240;
          fStack_6234 = local_6240;
          fStack_6230 = local_6240;
          fStack_622c = local_6240;
          fStack_6228 = local_6240;
          fStack_6224 = local_6240;
          local_620c = local_6240;
          fStack_61fc = local_6200;
          fStack_61f8 = local_6200;
          fStack_61f4 = local_6200;
          fStack_61f0 = local_6200;
          fStack_61ec = local_6200;
          fStack_61e8 = local_6200;
          fStack_61e4 = local_6200;
          local_61cc = local_6200;
          fStack_61bc = local_61c0;
          fStack_61b8 = local_61c0;
          fStack_61b4 = local_61c0;
          fStack_61b0 = local_61c0;
          fStack_61ac = local_61c0;
          fStack_61a8 = local_61c0;
          fStack_61a4 = local_61c0;
          local_618c = local_61c0;
          fStack_617c = local_6180;
          fStack_6178 = local_6180;
          fStack_6174 = local_6180;
          fStack_6170 = local_6180;
          fStack_616c = local_6180;
          fStack_6168 = local_6180;
          fStack_6164 = local_6180;
          local_614c = local_6180;
          fStack_613c = local_6140;
          fStack_6138 = local_6140;
          fStack_6134 = local_6140;
          fStack_6130 = local_6140;
          fStack_612c = local_6140;
          fStack_6128 = local_6140;
          fStack_6124 = local_6140;
          local_610c = local_6140;
          fStack_60fc = local_6100;
          fStack_60f8 = local_6100;
          fStack_60f4 = local_6100;
          fStack_60f0 = local_6100;
          fStack_60ec = local_6100;
          fStack_60e8 = local_6100;
          fStack_60e4 = local_6100;
          local_60cc = local_6100;
          fStack_60bc = local_60c0;
          fStack_60b8 = local_60c0;
          fStack_60b4 = local_60c0;
          fStack_60b0 = local_60c0;
          fStack_60ac = local_60c0;
          fStack_60a8 = local_60c0;
          fStack_60a4 = local_60c0;
          local_608c = local_60c0;
          fStack_607c = local_6080;
          fStack_6078 = local_6080;
          fStack_6074 = local_6080;
          fStack_6070 = local_6080;
          fStack_606c = local_6080;
          fStack_6068 = local_6080;
          fStack_6064 = local_6080;
          local_604c = local_6080;
          fStack_603c = local_6040;
          fStack_6038 = local_6040;
          fStack_6034 = local_6040;
          fStack_6030 = local_6040;
          fStack_602c = local_6040;
          fStack_6028 = local_6040;
          fStack_6024 = local_6040;
          local_600c = local_6040;
          fStack_5ffc = local_6000;
          fStack_5ff8 = local_6000;
          fStack_5ff4 = local_6000;
          fStack_5ff0 = local_6000;
          fStack_5fec = local_6000;
          fStack_5fe8 = local_6000;
          fStack_5fe4 = local_6000;
          local_5fcc = local_6000;
          fStack_5fbc = local_5fc0;
          fStack_5fb8 = local_5fc0;
          fStack_5fb4 = local_5fc0;
          fStack_5fb0 = local_5fc0;
          fStack_5fac = local_5fc0;
          fStack_5fa8 = local_5fc0;
          fStack_5fa4 = local_5fc0;
          local_5f8c = local_5fc0;
          fStack_5f7c = local_5f80;
          fStack_5f78 = local_5f80;
          fStack_5f74 = local_5f80;
          fStack_5f70 = local_5f80;
          fStack_5f6c = local_5f80;
          fStack_5f68 = local_5f80;
          fStack_5f64 = local_5f80;
          local_5f4c = local_5f80;
          fStack_5f3c = local_5f40;
          fStack_5f38 = local_5f40;
          fStack_5f34 = local_5f40;
          fStack_5f30 = local_5f40;
          fStack_5f2c = local_5f40;
          fStack_5f28 = local_5f40;
          fStack_5f24 = local_5f40;
          local_5f0c = local_5f40;
          fStack_5efc = local_5f00;
          fStack_5ef8 = local_5f00;
          fStack_5ef4 = local_5f00;
          fStack_5ef0 = local_5f00;
          fStack_5eec = local_5f00;
          fStack_5ee8 = local_5f00;
          fStack_5ee4 = local_5f00;
          local_5ecc = local_5f00;
          fStack_5ebc = local_5ec0;
          fStack_5eb8 = local_5ec0;
          fStack_5eb4 = local_5ec0;
          fStack_5eb0 = local_5ec0;
          fStack_5eac = local_5ec0;
          fStack_5ea8 = local_5ec0;
          fStack_5ea4 = local_5ec0;
          local_5e8c = local_5ec0;
          fStack_5e7c = local_5e80;
          fStack_5e78 = local_5e80;
          fStack_5e74 = local_5e80;
          fStack_5e70 = local_5e80;
          fStack_5e6c = local_5e80;
          fStack_5e68 = local_5e80;
          fStack_5e64 = local_5e80;
          local_5e4c = local_5e80;
          fStack_5e3c = local_5e40;
          fStack_5e38 = local_5e40;
          fStack_5e34 = local_5e40;
          fStack_5e30 = local_5e40;
          fStack_5e2c = local_5e40;
          fStack_5e28 = local_5e40;
          fStack_5e24 = local_5e40;
          local_5e0c = local_5e40;
          fStack_5dfc = local_5e00;
          fStack_5df8 = local_5e00;
          fStack_5df4 = local_5e00;
          fStack_5df0 = local_5e00;
          fStack_5dec = local_5e00;
          fStack_5de8 = local_5e00;
          fStack_5de4 = local_5e00;
          local_5dcc = local_5e00;
          fStack_5dbc = local_5dc0;
          fStack_5db8 = local_5dc0;
          fStack_5db4 = local_5dc0;
          fStack_5db0 = local_5dc0;
          fStack_5dac = local_5dc0;
          fStack_5da8 = local_5dc0;
          fStack_5da4 = local_5dc0;
          local_5d8c = local_5dc0;
          fStack_5d7c = local_5d80;
          fStack_5d78 = local_5d80;
          fStack_5d74 = local_5d80;
          fStack_5d70 = local_5d80;
          fStack_5d6c = local_5d80;
          fStack_5d68 = local_5d80;
          fStack_5d64 = local_5d80;
          local_5d4c = local_5d80;
          local_5080 = in_stack_ffffffffffff71e0;
          uStack_5010 = this;
          local_2b88 = pauVar99;
          local_2580 = pauVar99;
          local_2578 = local_2b90;
          local_2570 = local_2b98;
          local_2568 = local_2ba0;
          local_2560 = local_2ba8;
          local_2558 = local_2bb0;
          local_2550 = local_2bb8;
          local_2548 = local_2bc0;
          local_2540 = local_2bc8;
          local_2538 = local_2bd0;
          local_2530 = local_2bd8;
          local_2528 = local_2be0;
          local_2520 = local_2be8;
          local_2518 = local_2bf0;
          local_2510 = local_2bf8;
          local_2508 = local_2c00;
          local_2500 = local_2c08;
          local_24f8 = local_2c10;
          local_24f0 = local_2c18;
          local_24e8 = local_2c20;
          local_24e0 = local_2c28;
          local_24d8 = local_2c30;
          local_24d0 = local_2c38;
          local_24c8 = local_2c40;
          local_24c0 = local_2c48;
          local_24b8 = local_2c50;
          local_24b0 = local_2c58;
          local_24a8 = local_2c60;
          local_24a0 = local_2c68;
          local_2498 = local_2c70;
          local_2490 = local_2c78;
          local_2488 = local_2c80;
          local_c40 = local_44e0;
          uStack_c38 = uStack_44d8;
          uStack_c30 = uStack_44d0;
          uStack_c28 = uStack_44c8;
          local_c20 = local_44c0;
          uStack_c18 = uStack_44b8;
          uStack_c10 = uStack_44b0;
          uStack_c08 = uStack_44a8;
          local_bc0 = local_4520;
          uStack_bb8 = uStack_4518;
          uStack_bb0 = uStack_4510;
          uStack_ba8 = uStack_4508;
          local_b60 = local_4580;
          uStack_b58 = uStack_4578;
          uStack_b50 = uStack_4570;
          uStack_b48 = uStack_4568;
          local_b00 = local_45e0;
          uStack_af8 = uStack_45d8;
          uStack_af0 = uStack_45d0;
          uStack_ae8 = uStack_45c8;
          local_aa0 = local_4640;
          uStack_a98 = uStack_4638;
          uStack_a90 = uStack_4630;
          uStack_a88 = uStack_4628;
          local_a40 = local_46a0;
          uStack_a38 = uStack_4698;
          uStack_a30 = uStack_4690;
          uStack_a28 = uStack_4688;
          local_9e0 = local_4700;
          uStack_9d8 = uStack_46f8;
          uStack_9d0 = uStack_46f0;
          uStack_9c8 = uStack_46e8;
          local_980 = local_4760;
          uStack_978 = uStack_4758;
          uStack_970 = uStack_4750;
          uStack_968 = uStack_4748;
          local_920 = local_47c0;
          uStack_918 = uStack_47b8;
          uStack_910 = uStack_47b0;
          uStack_908 = uStack_47a8;
          local_8c0 = local_4820;
          uStack_8b8 = uStack_4818;
          uStack_8b0 = uStack_4810;
          uStack_8a8 = uStack_4808;
          local_860 = local_4880;
          uStack_858 = uStack_4878;
          uStack_850 = uStack_4870;
          uStack_848 = uStack_4868;
          local_800 = local_48e0;
          uStack_7f8 = uStack_48d8;
          uStack_7f0 = uStack_48d0;
          uStack_7e8 = uStack_48c8;
          local_7a0 = local_4940;
          uStack_798 = uStack_4938;
          uStack_790 = uStack_4930;
          uStack_788 = uStack_4928;
          local_740 = local_49a0;
          uStack_738 = uStack_4998;
          uStack_730 = uStack_4990;
          uStack_728 = uStack_4988;
          local_6e0 = local_4a00;
          uStack_6d8 = uStack_49f8;
          uStack_6d0 = uStack_49f0;
          uStack_6c8 = uStack_49e8;
          local_680 = local_4a60;
          uStack_678 = uStack_4a58;
          uStack_670 = uStack_4a50;
          uStack_668 = uStack_4a48;
          local_620 = local_4ac0;
          uStack_618 = uStack_4ab8;
          uStack_610 = uStack_4ab0;
          uStack_608 = uStack_4aa8;
          local_5c0 = local_4b20;
          uStack_5b8 = uStack_4b18;
          uStack_5b0 = uStack_4b10;
          uStack_5a8 = uStack_4b08;
          local_560 = local_4b80;
          uStack_558 = uStack_4b78;
          uStack_550 = uStack_4b70;
          uStack_548 = uStack_4b68;
          local_500 = local_4be0;
          uStack_4f8 = uStack_4bd8;
          uStack_4f0 = uStack_4bd0;
          uStack_4e8 = uStack_4bc8;
          local_4a0 = local_4c40;
          uStack_498 = uStack_4c38;
          uStack_490 = uStack_4c30;
          uStack_488 = uStack_4c28;
          local_440 = local_4ca0;
          uStack_438 = uStack_4c98;
          uStack_430 = uStack_4c90;
          uStack_428 = uStack_4c88;
          local_3e0 = local_4d00;
          uStack_3d8 = uStack_4cf8;
          uStack_3d0 = uStack_4cf0;
          uStack_3c8 = uStack_4ce8;
          local_380 = local_4d60;
          uStack_378 = uStack_4d58;
          uStack_370 = uStack_4d50;
          uStack_368 = uStack_4d48;
          local_320 = local_4dc0;
          uStack_318 = uStack_4db8;
          uStack_310 = uStack_4db0;
          uStack_308 = uStack_4da8;
          local_2c0 = local_4e20;
          uStack_2b8 = uStack_4e18;
          uStack_2b0 = uStack_4e10;
          uStack_2a8 = uStack_4e08;
          local_260 = local_4e80;
          uStack_258 = uStack_4e78;
          uStack_250 = uStack_4e70;
          uStack_248 = uStack_4e68;
          local_200 = local_4ee0;
          uStack_1f8 = uStack_4ed8;
          uStack_1f0 = uStack_4ed0;
          uStack_1e8 = uStack_4ec8;
          local_1a0 = local_4f40;
          uStack_198 = uStack_4f38;
          uStack_190 = uStack_4f30;
          uStack_188 = uStack_4f28;
          local_140 = local_4fa0;
          uStack_138 = uStack_4f98;
          uStack_130 = uStack_4f90;
          uStack_128 = uStack_4f88;
          uStack_f0 = this;
          local_e0 = local_5000;
          uStack_d8 = uStack_4ff8;
          uStack_d0 = uStack_4ff0;
          uStack_c8 = uStack_4fe8;
          local_a0 = in_stack_ffffffffffff71e0;
          uStack_98 = uStack_5078;
          local_80 = local_5060;
          uStack_78 = uStack_5058;
          uStack_70 = uStack_5050;
          uStack_68 = uStack_5048;
        }
        local_6688 = local_6688 + 8;
        local_6690 = local_6690 + 8;
      }
      local_6698 = pauVar99;
      Mat::~Mat((Mat *)0x254e30);
    }
    Mat::~Mat((Mat *)0x254e65);
  }
  return;
}

Assistant:

static void conv2x2s1_fp16_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const unsigned short* kptr = (const unsigned short*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = loadfp16(kptr);
                    __m256 _k01 = loadfp16(kptr + 8);
                    __m256 _k02 = loadfp16(kptr + 16);
                    __m256 _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = loadfp16(kptr);
                    __m256 _k05 = loadfp16(kptr + 8);
                    __m256 _k06 = loadfp16(kptr + 16);
                    __m256 _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = loadfp16(kptr);
                    _k01 = loadfp16(kptr + 8);
                    _k02 = loadfp16(kptr + 16);
                    _k03 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = loadfp16(kptr);
                    _k05 = loadfp16(kptr + 8);
                    _k06 = loadfp16(kptr + 16);
                    _k07 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = loadfp16(kptr);
                    __m256 _k11 = loadfp16(kptr + 8);
                    __m256 _k12 = loadfp16(kptr + 16);
                    __m256 _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = loadfp16(kptr);
                    __m256 _k15 = loadfp16(kptr + 8);
                    __m256 _k16 = loadfp16(kptr + 16);
                    __m256 _k17 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = loadfp16(kptr);
                    _k11 = loadfp16(kptr + 8);
                    _k12 = loadfp16(kptr + 16);
                    _k13 = loadfp16(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = loadfp16(kptr);
                    _k15 = loadfp16(kptr + 8);
                    _k16 = loadfp16(kptr + 16);
                    _k17 = loadfp16(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}